

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [32];
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  uint uVar18;
  _func_int *p_Var19;
  int *piVar20;
  _func_int **pp_Var21;
  Layer *pLVar22;
  void *pvVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  _func_int **pp_Var28;
  _func_int **pp_Var29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined4 uVar45;
  undefined4 uVar46;
  Mat *pMVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  Allocator *pAVar54;
  long lVar55;
  ulong uVar56;
  int iVar57;
  int iVar58;
  ulong uVar59;
  int y_1;
  int iVar60;
  int iVar61;
  float *pfVar62;
  float *pfVar63;
  int w_2;
  ulong uVar64;
  undefined1 (*pauVar65) [32];
  undefined1 (*pauVar66) [16];
  Allocator *pAVar67;
  void *pvVar68;
  int iVar69;
  long lVar70;
  ulong uVar71;
  long lVar72;
  int y_3;
  uint uVar73;
  uint uVar74;
  int y;
  int iVar75;
  long lVar76;
  ulong uVar77;
  int iVar78;
  ulong uVar79;
  void *pvVar80;
  undefined1 auVar83 [16];
  float fVar81;
  float fVar82;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar157 [32];
  float fVar170;
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [28];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar250 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 in_ZMM5 [64];
  __m128 one;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [64];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [64];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [64];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [16];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar475 [16];
  undefined1 auVar479 [64];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [64];
  undefined1 auVar486 [64];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  float fVar512;
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 auVar506 [32];
  undefined1 auVar507 [32];
  undefined1 auVar508 [32];
  undefined1 auVar509 [32];
  undefined1 auVar510 [32];
  undefined1 auVar511 [64];
  int size;
  int h_2;
  int h;
  int outw;
  int outh;
  int outh_2;
  Option opt_b;
  long local_270;
  ulong local_250;
  void *local_248;
  int local_230;
  Allocator *local_228;
  long local_1e8;
  Allocator *local_1d0;
  Mat local_1a8;
  ulong local_160;
  int local_154;
  int local_150;
  int local_14c;
  _func_int **local_148;
  Option *local_140;
  Allocator *local_138;
  long local_130;
  Mat *local_128;
  long local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined8 local_d8;
  void *local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  int local_b0;
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 auVar154 [32];
  undefined1 auVar160 [32];
  undefined1 auVar165 [32];
  undefined1 auVar239 [32];
  undefined1 auVar272 [32];
  
  auVar246 = in_ZMM5._0_16_;
  iVar13 = bottom_blob->w;
  iVar14 = bottom_blob->h;
  uVar59 = bottom_blob->elemsize;
  local_160 = (ulong)bottom_blob->elempack;
  p_Var19 = this->_vptr_Deconvolution_x86_fma[-3];
  uVar73 = 1;
  if (opt->use_packing_layout == true) {
    uVar73 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)p_Var19) & 7) != 0) {
      uVar73 = (uint)((*(uint *)(&this->field_0xd0 + (long)p_Var19) & 3) == 0) * 3 + 1;
    }
  }
  iVar78 = *(int *)(&this->field_0xd4 + (long)p_Var19);
  local_150 = *(int *)(&this->field_0xdc + (long)p_Var19);
  iVar57 = *(int *)(&this->field_0xe4 + (long)p_Var19);
  local_14c = (*(int *)(&this->field_0xd8 + (long)p_Var19) + -1) *
              *(int *)(&this->field_0xe0 + (long)p_Var19);
  iVar58 = *(int *)(&this->field_0xe8 + (long)p_Var19);
  iVar60 = *(int *)(&this->field_0xfc + (long)p_Var19);
  iVar69 = *(int *)(&this->field_0x100 + (long)p_Var19);
  uVar77 = (long)*(int *)(&this->field_0xd0 + (long)p_Var19) / (long)(int)uVar73;
  iVar75 = (int)uVar77;
  local_1a8.cstep = 0;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize._0_4_ = 0;
  local_1a8.elempack = 0;
  p_Var19 = this->_vptr_Deconvolution_x86_fma[-3];
  lVar76 = 0x10;
  local_1a8.elemsize._4_4_ = (int)local_1a8.refcount;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8.h = (int)local_1a8.elemsize;
  local_1a8.d = (int)local_1a8.refcount;
  local_1a8.c = local_1a8.elempack;
  if ((((((*(int *)(&this->field_0xec + (long)p_Var19) < 1) &&
         (*(int *)(&this->field_0xf0 + (long)p_Var19) < 1)) &&
        (*(int *)(&this->field_0xf4 + (long)p_Var19) < 1)) &&
       (*(int *)(&this->field_0xf8 + (long)p_Var19) < 1)) &&
      ((*(int *)(&this->field_0x104 + (long)p_Var19) < 1 ||
       (*(int *)(&this->field_0x108 + (long)p_Var19) < 1)))) && (lVar76 = 8, &local_1a8 != top_blob)
     ) {
    piVar20 = top_blob->refcount;
    if (piVar20 != (int *)0x0) {
      LOCK();
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    local_1a8.data = top_blob->data;
    local_1a8.refcount._0_4_ = (int)top_blob->refcount;
    local_1a8.refcount._4_4_ = (uint)((ulong)top_blob->refcount >> 0x20);
    local_1a8.elemsize._0_4_ = (int)top_blob->elemsize;
    local_1a8.elemsize._4_4_ = (int)(top_blob->elemsize >> 0x20);
    local_1a8.elempack = top_blob->elempack;
    local_1a8.allocator = top_blob->allocator;
    uVar2 = top_blob->dims;
    uVar3 = top_blob->w;
    uVar4 = top_blob->h;
    uVar5 = top_blob->d;
    local_1a8.c = top_blob->c;
    local_1a8.cstep = top_blob->cstep;
    local_1a8.dims = uVar2;
    local_1a8.w = uVar3;
    local_1a8.h = uVar4;
    local_1a8.d = uVar5;
  }
  local_150 = (iVar78 + -1) * local_150;
  iVar60 = (iVar13 + -1) * iVar57 + local_150 + iVar60 + 1;
  local_140 = opt;
  local_128 = top_blob;
  Mat::create(&local_1a8,iVar60,iVar69 + (iVar14 + -1) * iVar58 + local_14c + 1,iVar75,
              (uVar59 / local_160) * (ulong)uVar73,uVar73,*(Allocator **)(&opt->lightmode + lVar76))
  ;
  iVar57 = local_1a8.h;
  iVar78 = local_1a8.w;
  iVar58 = -100;
  if (((Allocator *)local_1a8.data != (Allocator *)0x0) &&
     ((long)local_1a8.c * local_1a8.cstep != 0)) {
    local_148 = this->_vptr_Deconvolution_x86_fma;
    p_Var19 = local_148[-3];
    uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
    uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
    local_154 = uVar16 * uVar15;
    if (local_140->use_sgemm_convolution == true) {
      piVar20 = bottom_blob->refcount;
      local_c8 = bottom_blob->data;
      uStack_c0 = SUB84(bottom_blob->refcount,0);
      uStack_bc = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
      local_b8 = (undefined4)bottom_blob->elemsize;
      uStack_b4 = (undefined4)(bottom_blob->elemsize >> 0x20);
      local_b0 = bottom_blob->elempack;
      local_a8 = bottom_blob->allocator;
      uVar45 = bottom_blob->dims;
      uVar46 = bottom_blob->d;
      local_90 = bottom_blob->c;
      local_88 = bottom_blob->cstep;
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + 1;
        UNLOCK();
      }
      local_a0 = CONCAT44(bottom_blob->h * bottom_blob->w,uVar45);
      uStack_98 = CONCAT44(uVar46,1);
      local_d8 = 0;
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_100 = 0;
      uStack_e8 = 0;
      auVar6[0] = local_140->lightmode;
      auVar6._1_3_ = *(undefined3 *)&local_140->field_0x1;
      auVar6._4_4_ = local_140->num_threads;
      auVar6._8_8_ = local_140->blob_allocator;
      uVar7 = local_140->workspace_allocator;
      uVar8 = local_140->openmp_blocktime;
      uVar9 = local_140->use_winograd_convolution;
      uVar10 = local_140->use_sgemm_convolution;
      uVar11 = local_140->use_int8_inference;
      uVar12 = local_140->use_vulkan_compute;
      auVar6[0x1f] = uVar12;
      auVar6[0x1e] = uVar11;
      auVar6[0x1d] = uVar10;
      auVar6[0x1c] = uVar9;
      auVar6._24_4_ = uVar8;
      auVar6._16_8_ = uVar7;
      local_58._0_1_ = local_140->use_bf16_storage;
      local_58._1_1_ = local_140->use_fp16_packed;
      local_58._2_1_ = local_140->use_fp16_storage;
      local_58._3_1_ = local_140->use_fp16_arithmetic;
      local_58._4_1_ = local_140->use_int8_packed;
      local_58._5_1_ = local_140->use_int8_storage;
      local_58._6_1_ = local_140->use_int8_arithmetic;
      local_58._7_1_ = local_140->use_packing_layout;
      uStack_50._0_1_ = local_140->use_shader_pack8;
      uStack_50._1_1_ = local_140->use_subgroup_basic;
      uStack_50._2_1_ = local_140->use_subgroup_vote;
      uStack_50._3_1_ = local_140->use_subgroup_ballot;
      uStack_50._4_1_ = local_140->use_subgroup_shuffle;
      uStack_50._5_1_ = local_140->use_image_storage;
      uStack_50._6_1_ = local_140->use_tensor_storage;
      uStack_50._7_1_ = local_140->use_reserved_0;
      uStack_48._0_4_ = local_140->flush_denormals;
      uStack_48._4_1_ = local_140->use_local_pool_allocator;
      uStack_48._5_1_ = local_140->use_shader_local_memory;
      uStack_48._6_1_ = local_140->use_cooperative_matrix;
      uStack_48._7_1_ = local_140->use_winograd23_convolution;
      uStack_40._0_1_ = local_140->use_winograd43_convolution;
      uStack_40._1_1_ = local_140->use_winograd63_convolution;
      uStack_40._2_1_ = local_140->use_a53_a55_optimized_kernel;
      uStack_40._3_1_ = local_140->use_reserved_7;
      uStack_40._4_1_ = local_140->use_reserved_8;
      uStack_40._5_1_ = local_140->use_reserved_9;
      uStack_40._6_1_ = local_140->use_reserved_10;
      uStack_40._7_1_ = local_140->use_reserved_11;
      local_78 = auVar6._0_8_;
      pAStack_70 = local_1a8.allocator;
      auStack_68 = auVar6._16_16_;
      uStack_104 = uStack_110;
      local_f8 = local_118;
      uStack_f0 = uStack_110;
      iStack_ec = iStack_10c;
      local_e0 = uStack_100;
      (*this->gemm->_vptr_Layer[7])(this->gemm,&local_c8,&local_118);
      auVar482 = _DAT_00594ae0;
      auVar163 = _DAT_00594ac0;
      iVar78 = (iVar60 * *(int *)(&this->field_0xe8 + (long)this->_vptr_Deconvolution_x86_fma[-3]) -
               *(int *)(&this->field_0xe4 + (long)this->_vptr_Deconvolution_x86_fma[-3]) * iVar13) *
               uVar73;
      if (uVar73 == 1) {
        if (0 < iVar75) {
          uVar79 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
          uVar71 = (long)local_1a8.h * (long)local_1a8.w;
          local_250 = 0;
          uVar59 = (uVar79 * uVar71 + 0xf & 0xfffffffffffffff0) / uVar79;
          if (local_1a8.dims == 4) {
            uVar59 = uVar71;
          }
          pp_Var21 = this->_vptr_Deconvolution_x86_fma;
          uVar73 = (int)uVar59 * local_1a8.d;
          uVar59 = 1;
          if (1 < iVar75) {
            uVar59 = uVar77 & 0xffffffff;
          }
          auVar84._8_8_ = 0;
          auVar84._0_8_ = (ulong)uVar73 - 1;
          auVar423 = vpshufd_avx(auVar84,0x44);
          uVar77 = auVar423._0_8_;
          auVar281._0_8_ = uVar77 ^ 0x8000000000000000;
          auVar281._8_4_ = auVar423._8_4_;
          uVar15 = auVar423._12_4_;
          auVar281._12_4_ = uVar15 ^ 0x80000000;
          auVar246 = vpcmpeqd_avx(auVar246,auVar246);
          pAVar67 = (Allocator *)local_1a8.data;
          do {
            p_Var19 = pp_Var21[-3];
            auVar423 = ZEXT816(0) << 0x40;
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var19) != 0) &&
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var19) *
                *(long *)(&this->field_0x1e8 + (long)p_Var19) != 0)) {
              auVar423 = ZEXT416(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var19) +
                                          local_250 * 4));
            }
            if (0 < (int)uVar73) {
              auVar423 = vshufps_avx(auVar423,auVar423,0);
              auVar356._16_16_ = auVar423;
              auVar356._0_16_ = auVar423;
              uVar71 = 0;
              do {
                auVar359._8_8_ = 0;
                auVar359._0_8_ = uVar71;
                auVar423 = vpshufd_avx(auVar359,0x44);
                auVar364._16_16_ = auVar423;
                auVar364._0_16_ = auVar423;
                auVar157 = vorps_avx(auVar364,auVar163);
                auVar159 = vorps_avx(auVar364,auVar482);
                auVar411._0_8_ = auVar159._16_8_ ^ 0x8000000000000000;
                auVar411._8_4_ = auVar159._24_4_;
                auVar411._12_4_ = auVar159._28_4_ ^ 0x80000000;
                auVar423 = vpcmpgtq_avx(auVar411,auVar281);
                auVar421._0_8_ = uVar77 ^ 0x8000000000000000;
                auVar421._8_4_ = auVar281._8_4_;
                auVar421._12_4_ = uVar15 ^ 0x80000000;
                auVar360._0_8_ = auVar159._0_8_ ^ 0x8000000000000000;
                auVar360._8_4_ = auVar159._8_4_;
                auVar360._12_4_ = auVar159._12_4_ ^ 0x80000000;
                auVar372 = vpcmpgtq_avx(auVar360,auVar421);
                auVar423 = vpackssdw_avx(auVar372,auVar423);
                auVar412._0_8_ = auVar157._16_8_ ^ 0x8000000000000000;
                auVar412._8_4_ = auVar157._24_4_;
                auVar412._12_4_ = auVar157._28_4_ ^ 0x80000000;
                auVar372 = vpcmpgtq_avx(auVar412,auVar281);
                auVar422._0_8_ = uVar77 ^ 0x8000000000000000;
                auVar422._8_4_ = auVar281._8_4_;
                auVar422._12_4_ = uVar15 ^ 0x80000000;
                auVar368._0_8_ = auVar157._0_8_ ^ 0x8000000000000000;
                auVar368._8_4_ = auVar157._8_4_;
                auVar368._12_4_ = auVar157._12_4_ ^ 0x80000000;
                auVar143 = vpcmpgtq_avx(auVar368,auVar422);
                auVar372 = vpackssdw_avx(auVar143,auVar372);
                auVar423 = vpackssdw_avx(auVar372 ^ auVar246,auVar423 ^ auVar246);
                auVar372 = vpmovsxwd_avx(auVar423);
                auVar423 = vpunpckhwd_avx(auVar423,auVar423);
                auVar365._16_16_ = auVar423;
                auVar365._0_16_ = auVar372;
                auVar157 = vmaskmovps_avx(auVar365,auVar356);
                *(undefined1 (*) [32])((long)&pAVar67->_vptr_Allocator + uVar71 * 4) = auVar157;
                uVar71 = uVar71 + 8;
              } while ((uVar73 + 7 & 0xfffffff8) != uVar71);
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
              pfVar62 = (float *)(local_250 *
                                  (long)local_154 * (long)iStack_ec * CONCAT44(uStack_104,local_108)
                                 + (long)local_118);
              iVar57 = 0;
              do {
                p_Var19 = pp_Var21[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
                  iVar58 = 0;
                  do {
                    if (0 < iVar14) {
                      pfVar63 = (float *)((long)(_func_int ***)local_1a8.data +
                                         (long)iVar58 *
                                         (long)*(int *)(&this->field_0xdc + (long)p_Var19) * 4 +
                                         (long)iVar57 *
                                         (long)*(int *)(&this->field_0xe0 + (long)p_Var19) *
                                         uVar79 * (long)local_1a8.w +
                                         local_1a8.cstep * uVar79 * local_250);
                      iVar60 = 0;
                      do {
                        iVar69 = iVar13;
                        if (0 < iVar13) {
                          do {
                            *pfVar63 = *pfVar63 + *pfVar62;
                            pfVar63 = pfVar63 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3]);
                            pfVar62 = pfVar62 + 1;
                            iVar69 = iVar69 + -1;
                          } while (iVar69 != 0);
                        }
                        pfVar63 = pfVar63 + iVar78;
                        iVar60 = iVar60 + 1;
                      } while (iVar60 != iVar14);
                    }
                    iVar58 = iVar58 + 1;
                    p_Var19 = pp_Var21[-3];
                  } while (iVar58 < *(int *)(&this->field_0xd4 + (long)p_Var19));
                }
                iVar57 = iVar57 + 1;
              } while (iVar57 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
            }
            local_250 = local_250 + 1;
            pAVar67 = (Allocator *)((long)&pAVar67->_vptr_Allocator + local_1a8.cstep * uVar79);
          } while (local_250 != uVar59);
        }
      }
      else if (uVar73 == 4) {
        if (0 < iVar75) {
          pp_Var21 = this->_vptr_Deconvolution_x86_fma;
          lVar76 = (long)local_154;
          uVar59 = 0;
          do {
            pfVar62 = (float *)((long)iStack_ec * uVar59 * lVar76 * CONCAT44(uStack_104,local_108) +
                               (long)local_118);
            lVar70 = (long)local_1a8.w;
            uVar79 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data + local_1a8.cstep * uVar59 * uVar79);
            uVar64 = local_1a8.h * lVar70;
            uVar71 = (uVar79 * uVar64 + 0xf & 0xfffffffffffffff0) / uVar79;
            if (local_1a8.dims == 4) {
              uVar71 = uVar64;
            }
            p_Var19 = pp_Var21[-3];
            if ((*(long *)(&this->field_0x1a8 + (long)p_Var19) == 0) ||
               ((long)*(int *)(&this->field_0x1e0 + (long)p_Var19) *
                *(long *)(&this->field_0x1e8 + (long)p_Var19) == 0)) {
              uVar73 = local_1a8.d * (int)uVar71;
              if (0 < (int)uVar73) {
                memset(pAVar67,0,(ulong)uVar73 << 4);
              }
            }
            else {
              iVar57 = local_1a8.d * (int)uVar71;
              if (0 < iVar57) {
                auVar246 = *(undefined1 (*) [16])
                            (*(long *)(&this->field_0x1a8 + (long)p_Var19) + uVar59 * 0x10);
                pAVar54 = pAVar67;
                do {
                  *(undefined1 (*) [16])pAVar54 = auVar246;
                  pAVar54 = pAVar54 + 2;
                  iVar57 = iVar57 + -1;
                } while (iVar57 != 0);
              }
            }
            if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
              iVar57 = 0;
              do {
                p_Var19 = pp_Var21[-3];
                if (0 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
                  iVar58 = 0;
                  do {
                    if (0 < iVar14) {
                      pauVar66 = (undefined1 (*) [16])
                                 ((long)&pAVar67->_vptr_Allocator +
                                 (long)(*(int *)(&this->field_0xdc + (long)p_Var19) * iVar58 * 4) *
                                 4 + (long)*(int *)(&this->field_0xe0 + (long)p_Var19) *
                                     (long)iVar57 * uVar79 * lVar70);
                      iVar60 = 0;
                      do {
                        iVar69 = iVar13;
                        if (0 < iVar13) {
                          do {
                            auVar83._0_4_ = *pfVar62 + *(float *)*pauVar66;
                            auVar83._4_4_ = pfVar62[1] + *(float *)(*pauVar66 + 4);
                            auVar83._8_4_ = pfVar62[2] + *(float *)(*pauVar66 + 8);
                            auVar83._12_4_ = pfVar62[3] + *(float *)(*pauVar66 + 0xc);
                            *pauVar66 = auVar83;
                            pauVar66 = pauVar66 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3]);
                            pfVar62 = pfVar62 + 4;
                            iVar69 = iVar69 + -1;
                          } while (iVar69 != 0);
                        }
                        pauVar66 = (undefined1 (*) [16])(*pauVar66 + (long)iVar78 * 4);
                        iVar60 = iVar60 + 1;
                      } while (iVar60 != iVar14);
                    }
                    iVar58 = iVar58 + 1;
                    p_Var19 = pp_Var21[-3];
                  } while (iVar58 < *(int *)(&this->field_0xd4 + (long)p_Var19));
                }
                iVar57 = iVar57 + 1;
              } while (iVar57 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
            }
            uVar59 = uVar59 + 1;
          } while (uVar59 != (uVar77 & 0xffffffff));
        }
      }
      else if ((uVar73 == 8) && (0 < iVar75)) {
        pp_Var21 = this->_vptr_Deconvolution_x86_fma;
        lVar76 = (long)local_154;
        uVar59 = 0;
        do {
          pfVar62 = (float *)((long)iStack_ec * uVar59 * lVar76 * CONCAT44(uStack_104,local_108) +
                             (long)local_118);
          lVar70 = (long)local_1a8.w;
          uVar79 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
          pAVar67 = (Allocator *)
                    ((long)(_func_int ***)local_1a8.data + local_1a8.cstep * uVar59 * uVar79);
          uVar64 = local_1a8.h * lVar70;
          uVar71 = (uVar79 * uVar64 + 0xf & 0xfffffffffffffff0) / uVar79;
          if (local_1a8.dims == 4) {
            uVar71 = uVar64;
          }
          p_Var19 = pp_Var21[-3];
          if ((*(long *)(&this->field_0x1a8 + (long)p_Var19) == 0) ||
             ((long)*(int *)(&this->field_0x1e0 + (long)p_Var19) *
              *(long *)(&this->field_0x1e8 + (long)p_Var19) == 0)) {
            uVar73 = local_1a8.d * (int)uVar71;
            if (0 < (int)uVar73) {
              memset(pAVar67,0,(ulong)uVar73 << 5);
            }
          }
          else {
            iVar57 = local_1a8.d * (int)uVar71;
            if (0 < iVar57) {
              auVar163 = *(undefined1 (*) [32])
                          (*(long *)(&this->field_0x1a8 + (long)p_Var19) + uVar59 * 0x20);
              pAVar54 = pAVar67;
              do {
                *(undefined1 (*) [32])pAVar54 = auVar163;
                pAVar54 = pAVar54 + 4;
                iVar57 = iVar57 + -1;
              } while (iVar57 != 0);
            }
          }
          if (0 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3])) {
            iVar57 = 0;
            do {
              p_Var19 = pp_Var21[-3];
              if (0 < *(int *)(&this->field_0xd4 + (long)p_Var19)) {
                iVar58 = 0;
                do {
                  if (0 < iVar14) {
                    pauVar65 = (undefined1 (*) [32])
                               ((long)&pAVar67->_vptr_Allocator +
                               (long)(*(int *)(&this->field_0xdc + (long)p_Var19) * iVar58 * 8) * 4
                               + (long)*(int *)(&this->field_0xe0 + (long)p_Var19) * (long)iVar57 *
                                 uVar79 * lVar70);
                    iVar60 = 0;
                    do {
                      iVar69 = iVar13;
                      if (0 < iVar13) {
                        do {
                          auVar104._0_4_ = *pfVar62 + *(float *)*pauVar65;
                          auVar104._4_4_ = pfVar62[1] + *(float *)(*pauVar65 + 4);
                          auVar104._8_4_ = pfVar62[2] + *(float *)(*pauVar65 + 8);
                          auVar104._12_4_ = pfVar62[3] + *(float *)(*pauVar65 + 0xc);
                          auVar104._16_4_ = pfVar62[4] + *(float *)(*pauVar65 + 0x10);
                          auVar104._20_4_ = pfVar62[5] + *(float *)(*pauVar65 + 0x14);
                          auVar104._24_4_ = pfVar62[6] + *(float *)(*pauVar65 + 0x18);
                          auVar104._28_4_ = pfVar62[7] + *(float *)(*pauVar65 + 0x1c);
                          *pauVar65 = auVar104;
                          pauVar65 = pauVar65 + *(int *)(&this->field_0xe4 + (long)pp_Var21[-3]);
                          pfVar62 = pfVar62 + 8;
                          iVar69 = iVar69 + -1;
                        } while (iVar69 != 0);
                      }
                      pauVar65 = (undefined1 (*) [32])(*pauVar65 + (long)iVar78 * 4);
                      iVar60 = iVar60 + 1;
                    } while (iVar60 != iVar14);
                  }
                  iVar58 = iVar58 + 1;
                  p_Var19 = pp_Var21[-3];
                } while (iVar58 < *(int *)(&this->field_0xd4 + (long)p_Var19));
              }
              iVar57 = iVar57 + 1;
            } while (iVar57 < *(int *)(&this->field_0xd8 + (long)pp_Var21[-3]));
          }
          uVar59 = uVar59 + 1;
        } while (uVar59 != (uVar77 & 0xffffffff));
      }
      pLVar22 = this->activation;
      if (pLVar22 != (Layer *)0x0) {
        (*pLVar22->_vptr_Layer[9])(pLVar22,&local_1a8,local_140);
      }
      piVar20 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (long *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      local_d8 = 0;
      local_118 = (long *)0x0;
      uStack_110 = 0;
      iStack_10c = 0;
      local_108 = 0;
      uStack_104 = 0;
      uStack_100 = 0;
      uStack_f0 = 0;
      iStack_ec = 0;
      uStack_e8 = 0;
      local_e0 = 0;
      piVar20 = (int *)CONCAT44(uStack_bc,uStack_c0);
      if (piVar20 != (int *)0x0) {
        LOCK();
        *piVar20 = *piVar20 + -1;
        UNLOCK();
        if (*piVar20 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
      local_88 = 0;
      local_c8 = (void *)0x0;
      uStack_c0 = 0;
      uStack_bc = 0;
      local_b8 = 0;
      uStack_b4 = 0;
      local_b0 = 0;
      local_a0 = 0;
      uStack_98 = 0;
      local_90 = 0;
    }
    else {
      if ((((int)local_160 == 8) && (uVar73 == 8)) && (0 < (long)local_1a8.c)) {
        iVar13 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        local_270 = 0;
        auVar410 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar420 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar358 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar482._8_4_ = 0x3d2aa9c1;
        auVar482._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar482._12_4_ = 0x3d2aa9c1;
        auVar482._16_4_ = 0x3d2aa9c1;
        auVar482._20_4_ = 0x3d2aa9c1;
        auVar482._24_4_ = 0x3d2aa9c1;
        auVar482._28_4_ = 0x3d2aa9c1;
        auVar163._8_4_ = 0xbf800000;
        auVar163._0_8_ = 0xbf800000bf800000;
        auVar163._12_4_ = 0xbf800000;
        auVar163._16_4_ = 0xbf800000;
        auVar163._20_4_ = 0xbf800000;
        auVar163._24_4_ = 0xbf800000;
        auVar163._28_4_ = 0xbf800000;
        do {
          if (0 < local_1a8.h) {
            iVar69 = bottom_blob->w;
            iVar75 = bottom_blob->h;
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar18 = bottom_blob->c;
            iVar61 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar74 = 0;
                iVar50 = (1 - uVar15) * iVar13;
                do {
                  if (lVar76 == 0) {
                    auVar168 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar168 = ZEXT3264(*(undefined1 (*) [32])(lVar76 + local_270 * 0x20));
                  }
                  if (0 < (int)uVar18) {
                    pvVar80 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar23 = bottom_blob->data;
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar48 = (((int)uVar77 - uVar16) + 1) * iVar14 + iVar61;
                          if (((-1 < iVar48) && (iVar49 = iVar48 / iVar60, iVar48 % iVar60 == 0)) &&
                             ((0 < (int)uVar15 && (iVar49 < iVar75)))) {
                            lVar70 = (long)iVar49 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                            uVar71 = uVar79;
                            uVar64 = (ulong)uVar15;
                            iVar48 = iVar50;
                            do {
                              if (((-1 < iVar48) && (iVar49 = iVar48 / iVar58, iVar48 % iVar58 == 0)
                                  ) && (iVar49 < iVar69)) {
                                lVar55 = (long)(iVar49 << 3);
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70);
                                auVar157._4_4_ = uVar1;
                                auVar157._0_4_ = uVar1;
                                auVar157._8_4_ = uVar1;
                                auVar157._12_4_ = uVar1;
                                auVar157._16_4_ = uVar1;
                                auVar157._20_4_ = uVar1;
                                auVar157._24_4_ = uVar1;
                                auVar157._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 4);
                                auVar159._4_4_ = uVar1;
                                auVar159._0_4_ = uVar1;
                                auVar159._8_4_ = uVar1;
                                auVar159._12_4_ = uVar1;
                                auVar159._16_4_ = uVar1;
                                auVar159._20_4_ = uVar1;
                                auVar159._24_4_ = uVar1;
                                auVar159._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 8);
                                auVar153._4_4_ = uVar1;
                                auVar153._0_4_ = uVar1;
                                auVar153._8_4_ = uVar1;
                                auVar153._12_4_ = uVar1;
                                auVar153._16_4_ = uVar1;
                                auVar153._20_4_ = uVar1;
                                auVar153._24_4_ = uVar1;
                                auVar153._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0xc);
                                auVar235._4_4_ = uVar1;
                                auVar235._0_4_ = uVar1;
                                auVar235._8_4_ = uVar1;
                                auVar235._12_4_ = uVar1;
                                auVar235._16_4_ = uVar1;
                                auVar235._20_4_ = uVar1;
                                auVar235._24_4_ = uVar1;
                                auVar235._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x10);
                                auVar224._4_4_ = uVar1;
                                auVar224._0_4_ = uVar1;
                                auVar224._8_4_ = uVar1;
                                auVar224._12_4_ = uVar1;
                                auVar224._16_4_ = uVar1;
                                auVar224._20_4_ = uVar1;
                                auVar224._24_4_ = uVar1;
                                auVar224._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x14);
                                auVar502._4_4_ = uVar1;
                                auVar502._0_4_ = uVar1;
                                auVar502._8_4_ = uVar1;
                                auVar502._12_4_ = uVar1;
                                auVar502._16_4_ = uVar1;
                                auVar502._20_4_ = uVar1;
                                auVar502._24_4_ = uVar1;
                                auVar502._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x18);
                                auVar471._4_4_ = uVar1;
                                auVar471._0_4_ = uVar1;
                                auVar471._8_4_ = uVar1;
                                auVar471._12_4_ = uVar1;
                                auVar471._16_4_ = uVar1;
                                auVar471._20_4_ = uVar1;
                                auVar471._24_4_ = uVar1;
                                auVar471._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x1c);
                                auVar476._4_4_ = uVar1;
                                auVar476._0_4_ = uVar1;
                                auVar476._8_4_ = uVar1;
                                auVar476._12_4_ = uVar1;
                                auVar476._16_4_ = uVar1;
                                auVar476._20_4_ = uVar1;
                                auVar476._24_4_ = uVar1;
                                auVar476._28_4_ = uVar1;
                                uVar56 = uVar71 & 0xffffffff;
                                auVar246 = vfmadd231ps_fma(auVar168._0_32_,auVar157,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar159,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x20));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar153,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x40));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar235,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x60));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar224,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x80));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar502,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0xa0));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar471,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0xc0));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar476,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0xe0));
                                auVar168 = ZEXT1664(auVar246);
                              }
                              uVar71 = uVar71 + 0x40;
                              iVar48 = iVar48 + iVar13;
                              uVar64 = uVar64 - 1;
                            } while (uVar64 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 0x40;
                        } while (uVar77 != uVar16);
                      }
                      pvVar80 = (void *)((long)pvVar80 + (long)(int)(uVar15 * uVar16 * 0x40) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar157 = auVar168._0_32_;
                  auVar153 = auVar410._0_32_;
                  auVar159 = auVar358._0_32_;
                  auVar235 = auVar420._0_32_;
                  fVar82 = auVar358._0_4_;
                  fVar81 = auVar358._4_4_;
                  fVar512 = auVar358._8_4_;
                  fVar244 = auVar358._12_4_;
                  fVar245 = auVar358._16_4_;
                  fVar30 = auVar358._20_4_;
                  fVar170 = auVar358._24_4_;
                  fVar31 = auVar358._28_4_;
                  auVar485._28_36_ = auVar168._28_36_;
                  switch(uVar17) {
                  case 1:
                    auVar157 = vmaxps_avx(auVar153,auVar157);
                    break;
                  case 2:
                    auVar159 = vmaxps_avx(auVar153,auVar157);
                    auVar157 = vminps_avx(auVar153,auVar157);
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar156._4_4_ = uVar1;
                    auVar156._0_4_ = uVar1;
                    auVar156._8_4_ = uVar1;
                    auVar156._12_4_ = uVar1;
                    auVar156._16_4_ = uVar1;
                    auVar156._20_4_ = uVar1;
                    auVar156._24_4_ = uVar1;
                    auVar156._28_4_ = uVar1;
                    auVar246 = vfmadd213ps_fma(auVar156,auVar157,auVar159);
                    auVar157 = ZEXT1632(auVar246);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar217._4_4_ = uVar1;
                    auVar217._0_4_ = uVar1;
                    auVar217._8_4_ = uVar1;
                    auVar217._12_4_ = uVar1;
                    auVar217._16_4_ = uVar1;
                    auVar217._20_4_ = uVar1;
                    auVar217._24_4_ = uVar1;
                    auVar217._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar505._4_4_ = uVar1;
                    auVar505._0_4_ = uVar1;
                    auVar505._8_4_ = uVar1;
                    auVar505._12_4_ = uVar1;
                    auVar505._16_4_ = uVar1;
                    auVar505._20_4_ = uVar1;
                    auVar505._24_4_ = uVar1;
                    auVar505._28_4_ = uVar1;
                    auVar157 = vmaxps_avx(auVar157,auVar217);
                    auVar157 = vminps_avx(auVar505,auVar157);
                    break;
                  case 4:
                    auVar152._0_8_ = auVar168._0_8_ ^ 0x8000000080000000;
                    auVar152._8_4_ = -auVar168._8_4_;
                    auVar152._12_4_ = -auVar168._12_4_;
                    auVar152._16_4_ = -auVar168._16_4_;
                    auVar152._20_4_ = -auVar168._20_4_;
                    auVar152._24_4_ = -auVar168._24_4_;
                    auVar152._28_4_ = auVar168._28_4_ ^ 0x80000000;
                    auVar218._8_4_ = 0x42b0c0a5;
                    auVar218._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar218._12_4_ = 0x42b0c0a5;
                    auVar218._16_4_ = 0x42b0c0a5;
                    auVar218._20_4_ = 0x42b0c0a5;
                    auVar218._24_4_ = 0x42b0c0a5;
                    auVar218._28_4_ = 0x42b0c0a5;
                    auVar157 = vminps_avx(auVar152,auVar218);
                    auVar219._8_4_ = 0xc2b0c0a5;
                    auVar219._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar219._12_4_ = 0xc2b0c0a5;
                    auVar219._16_4_ = 0xc2b0c0a5;
                    auVar219._20_4_ = 0xc2b0c0a5;
                    auVar219._24_4_ = 0xc2b0c0a5;
                    auVar219._28_4_ = 0xc2b0c0a5;
                    auVar153 = vmaxps_avx(auVar157,auVar219);
                    auVar220._8_4_ = 0x3fb8aa3b;
                    auVar220._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar220._12_4_ = 0x3fb8aa3b;
                    auVar220._16_4_ = 0x3fb8aa3b;
                    auVar220._20_4_ = 0x3fb8aa3b;
                    auVar220._24_4_ = 0x3fb8aa3b;
                    auVar220._28_4_ = 0x3fb8aa3b;
                    auVar246 = vfmadd213ps_fma(auVar220,auVar153,auVar235);
                    auVar224 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar157 = vcmpps_avx(ZEXT1632(auVar246),auVar224,1);
                    auVar157 = vandps_avx(auVar157,auVar159);
                    auVar157 = vsubps_avx(auVar224,auVar157);
                    auVar105._8_4_ = 0x3f318000;
                    auVar105._0_8_ = 0x3f3180003f318000;
                    auVar105._12_4_ = 0x3f318000;
                    auVar105._16_4_ = 0x3f318000;
                    auVar105._20_4_ = 0x3f318000;
                    auVar105._24_4_ = 0x3f318000;
                    auVar105._28_4_ = 0x3f318000;
                    auVar246 = vfmsub231ps_fma(auVar153,auVar157,auVar105);
                    auVar260._8_4_ = 0x395e8083;
                    auVar260._0_8_ = 0x395e8083395e8083;
                    auVar260._12_4_ = 0x395e8083;
                    auVar260._16_4_ = 0x395e8083;
                    auVar260._20_4_ = 0x395e8083;
                    auVar260._24_4_ = 0x395e8083;
                    auVar260._28_4_ = 0x395e8083;
                    auVar423 = vfmsub231ps_fma(ZEXT1632(auVar246),auVar157,auVar260);
                    auVar153 = ZEXT1632(auVar423);
                    auVar35._28_4_ = auVar224._28_4_;
                    auVar35._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar439._8_4_ = 0x39506967;
                    auVar439._0_8_ = 0x3950696739506967;
                    auVar439._12_4_ = 0x39506967;
                    auVar439._16_4_ = 0x39506967;
                    auVar439._20_4_ = 0x39506967;
                    auVar439._24_4_ = 0x39506967;
                    auVar439._28_4_ = 0x39506967;
                    auVar261._8_4_ = 0x3ab743ce;
                    auVar261._0_8_ = 0x3ab743ce3ab743ce;
                    auVar261._12_4_ = 0x3ab743ce;
                    auVar261._16_4_ = 0x3ab743ce;
                    auVar261._20_4_ = 0x3ab743ce;
                    auVar261._24_4_ = 0x3ab743ce;
                    auVar261._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar439,auVar153,auVar261);
                    auVar106._8_4_ = 0x3c088908;
                    auVar106._0_8_ = 0x3c0889083c088908;
                    auVar106._12_4_ = 0x3c088908;
                    auVar106._16_4_ = 0x3c088908;
                    auVar106._20_4_ = 0x3c088908;
                    auVar106._24_4_ = 0x3c088908;
                    auVar106._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar106);
                    auVar107._8_4_ = 0x3d2aa9c1;
                    auVar107._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar107._12_4_ = 0x3d2aa9c1;
                    auVar107._16_4_ = 0x3d2aa9c1;
                    auVar107._20_4_ = 0x3d2aa9c1;
                    auVar107._24_4_ = 0x3d2aa9c1;
                    auVar107._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar107);
                    auVar108._8_4_ = 0x3e2aaaaa;
                    auVar108._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar108._12_4_ = 0x3e2aaaaa;
                    auVar108._16_4_ = 0x3e2aaaaa;
                    auVar108._20_4_ = 0x3e2aaaaa;
                    auVar108._24_4_ = 0x3e2aaaaa;
                    auVar108._28_4_ = 0x3e2aaaaa;
                    auVar153 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar108);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar235);
                    auVar372 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar35,auVar153);
                    auVar127._0_4_ = (int)auVar157._0_4_;
                    auVar127._4_4_ = (int)auVar157._4_4_;
                    auVar127._8_4_ = (int)auVar157._8_4_;
                    auVar127._12_4_ = (int)auVar157._12_4_;
                    auVar154._16_4_ = (int)auVar157._16_4_;
                    auVar154._0_16_ = auVar127;
                    auVar154._20_4_ = (int)auVar157._20_4_;
                    auVar154._24_4_ = (int)auVar157._24_4_;
                    auVar154._28_4_ = (int)auVar157._28_4_;
                    auVar423 = vpslld_avx(auVar127,0x17);
                    auVar246 = vpslld_avx(auVar154._16_16_,0x17);
                    auVar85._8_4_ = 0x3f800000;
                    auVar85._0_8_ = 0x3f8000003f800000;
                    auVar85._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar246,auVar85);
                    auVar423 = vpaddd_avx(auVar423,auVar85);
                    auVar155._16_16_ = auVar246;
                    auVar155._0_16_ = auVar423;
                    auVar221._0_4_ = auVar372._0_4_ + fVar82;
                    auVar221._4_4_ = auVar372._4_4_ + fVar81;
                    auVar221._8_4_ = auVar372._8_4_ + fVar512;
                    auVar221._12_4_ = auVar372._12_4_ + fVar244;
                    auVar221._16_4_ = fVar245 + 0.0;
                    auVar221._20_4_ = fVar30 + 0.0;
                    auVar221._24_4_ = fVar170 + 0.0;
                    auVar221._28_4_ = fVar31 + 0.0;
                    auVar246 = vfmadd213ps_fma(auVar155,auVar221,auVar159);
                    auVar157 = vrcpps_avx(ZEXT1632(auVar246));
                    auVar246 = vfmsub213ps_fma(ZEXT1632(auVar246),auVar157,auVar159);
                    auVar246 = vfnmadd132ps_fma(ZEXT1632(auVar246),auVar157,auVar157);
                    auVar157 = ZEXT1632(auVar246);
                    break;
                  case 5:
                    auVar472._8_4_ = 0x42b0c0a5;
                    auVar472._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar472._12_4_ = 0x42b0c0a5;
                    auVar472._16_4_ = 0x42b0c0a5;
                    auVar472._20_4_ = 0x42b0c0a5;
                    auVar472._24_4_ = 0x42b0c0a5;
                    auVar472._28_4_ = 0x42b0c0a5;
                    auVar157 = vminps_avx(auVar472,auVar157);
                    auVar477._8_4_ = 0xc2b0c0a5;
                    auVar477._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar477._12_4_ = 0xc2b0c0a5;
                    auVar477._16_4_ = 0xc2b0c0a5;
                    auVar477._20_4_ = 0xc2b0c0a5;
                    auVar477._24_4_ = 0xc2b0c0a5;
                    auVar477._28_4_ = 0xc2b0c0a5;
                    auVar153 = vmaxps_avx(auVar477,auVar157);
                    auVar435._8_4_ = 0x3fb8aa3b;
                    auVar435._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar435._12_4_ = 0x3fb8aa3b;
                    auVar435._16_4_ = 0x3fb8aa3b;
                    auVar435._20_4_ = 0x3fb8aa3b;
                    auVar435._24_4_ = 0x3fb8aa3b;
                    auVar435._28_4_ = 0x3fb8aa3b;
                    auVar246 = vfmadd213ps_fma(auVar435,auVar153,auVar235);
                    auVar224 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar157 = vcmpps_avx(ZEXT1632(auVar246),auVar224,1);
                    auVar157 = vandps_avx(auVar157,auVar159);
                    auVar157 = vsubps_avx(auVar224,auVar157);
                    auVar389._8_4_ = 0x3f318000;
                    auVar389._0_8_ = 0x3f3180003f318000;
                    auVar389._12_4_ = 0x3f318000;
                    auVar389._16_4_ = 0x3f318000;
                    auVar389._20_4_ = 0x3f318000;
                    auVar389._24_4_ = 0x3f318000;
                    auVar389._28_4_ = 0x3f318000;
                    auVar246 = vfmsub231ps_fma(auVar153,auVar157,auVar389);
                    auVar473._8_4_ = 0xb95e8083;
                    auVar473._0_8_ = 0xb95e8083b95e8083;
                    auVar473._12_4_ = 0xb95e8083;
                    auVar473._16_4_ = 0xb95e8083;
                    auVar473._20_4_ = 0xb95e8083;
                    auVar473._24_4_ = 0xb95e8083;
                    auVar473._28_4_ = 0xb95e8083;
                    auVar423 = vfnmsub231ps_fma(ZEXT1632(auVar246),auVar157,auVar473);
                    auVar153 = ZEXT1632(auVar423);
                    auVar32._28_4_ = auVar224._28_4_;
                    auVar32._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar252._8_4_ = 0x39506967;
                    auVar252._0_8_ = 0x3950696739506967;
                    auVar252._12_4_ = 0x39506967;
                    auVar252._16_4_ = 0x39506967;
                    auVar252._20_4_ = 0x39506967;
                    auVar252._24_4_ = 0x39506967;
                    auVar252._28_4_ = 0x39506967;
                    auVar418._8_4_ = 0x3ab743ce;
                    auVar418._0_8_ = 0x3ab743ce3ab743ce;
                    auVar418._12_4_ = 0x3ab743ce;
                    auVar418._16_4_ = 0x3ab743ce;
                    auVar418._20_4_ = 0x3ab743ce;
                    auVar418._24_4_ = 0x3ab743ce;
                    auVar418._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar252,auVar153,auVar418);
                    auVar478._8_4_ = 0x3c088908;
                    auVar478._0_8_ = 0x3c0889083c088908;
                    auVar478._12_4_ = 0x3c088908;
                    auVar478._16_4_ = 0x3c088908;
                    auVar478._20_4_ = 0x3c088908;
                    auVar478._24_4_ = 0x3c088908;
                    auVar478._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar478);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar482);
                    auVar419._8_4_ = 0x3e2aaaaa;
                    auVar419._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar419._12_4_ = 0x3e2aaaaa;
                    auVar419._16_4_ = 0x3e2aaaaa;
                    auVar419._20_4_ = 0x3e2aaaaa;
                    auVar419._24_4_ = 0x3e2aaaaa;
                    auVar419._28_4_ = 0x3e2aaaaa;
                    auVar153 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar419);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar235);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar32,auVar153);
                    auVar211._0_4_ = auVar246._0_4_ + fVar82;
                    auVar211._4_4_ = auVar246._4_4_ + fVar81;
                    auVar211._8_4_ = auVar246._8_4_ + fVar512;
                    auVar211._12_4_ = auVar246._12_4_ + fVar244;
                    auVar211._16_4_ = fVar245 + 0.0;
                    auVar211._20_4_ = fVar30 + 0.0;
                    auVar211._24_4_ = fVar170 + 0.0;
                    auVar211._28_4_ = fVar31 + 0.0;
                    auVar423._0_4_ = (int)auVar157._0_4_;
                    auVar423._4_4_ = (int)auVar157._4_4_;
                    auVar423._8_4_ = (int)auVar157._8_4_;
                    auVar423._12_4_ = (int)auVar157._12_4_;
                    auVar253._16_4_ = (int)auVar157._16_4_;
                    auVar253._0_16_ = auVar423;
                    auVar253._20_4_ = (int)auVar157._20_4_;
                    auVar253._24_4_ = (int)auVar157._24_4_;
                    auVar253._28_4_ = (int)auVar157._28_4_;
                    auVar423 = vpslld_avx(auVar423,0x17);
                    auVar246 = vpslld_avx(auVar253._16_16_,0x17);
                    auVar143._8_4_ = 0x3f800000;
                    auVar143._0_8_ = 0x3f8000003f800000;
                    auVar143._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar246,auVar143);
                    auVar423 = vpaddd_avx(auVar423,auVar143);
                    auVar503._16_16_ = auVar246;
                    auVar503._0_16_ = auVar423;
                    auVar372 = vfmadd213ps_fma(auVar503,auVar211,auVar159);
                    auVar212._8_4_ = 0x800000;
                    auVar212._0_8_ = 0x80000000800000;
                    auVar212._12_4_ = 0x800000;
                    auVar212._16_4_ = 0x800000;
                    auVar212._20_4_ = 0x800000;
                    auVar212._24_4_ = 0x800000;
                    auVar212._28_4_ = 0x800000;
                    auVar157 = vmaxps_avx(ZEXT1632(auVar372),auVar212);
                    auVar423 = vpsrld_avx(auVar157._0_16_,0x17);
                    auVar246 = vpsrld_avx(auVar157._16_16_,0x17);
                    auVar350._8_4_ = 0x807fffff;
                    auVar350._0_8_ = 0x807fffff807fffff;
                    auVar350._12_4_ = 0x807fffff;
                    auVar350._16_4_ = 0x807fffff;
                    auVar350._20_4_ = 0x807fffff;
                    auVar350._24_4_ = 0x807fffff;
                    auVar350._28_4_ = 0x807fffff;
                    auVar157 = vandps_avx(auVar157,auVar350);
                    auVar224 = vorps_avx(auVar157,auVar235);
                    auVar351._8_4_ = 0x3f3504f3;
                    auVar351._0_8_ = 0x3f3504f33f3504f3;
                    auVar351._12_4_ = 0x3f3504f3;
                    auVar351._16_4_ = 0x3f3504f3;
                    auVar351._20_4_ = 0x3f3504f3;
                    auVar351._24_4_ = 0x3f3504f3;
                    auVar351._28_4_ = 0x3f3504f3;
                    auVar153 = vcmpps_avx(auVar351,auVar224,2);
                    auVar157 = vandnps_avx(auVar153,auVar224);
                    auVar213._0_4_ = auVar157._0_4_ + auVar224._0_4_ + -1.0;
                    auVar213._4_4_ = auVar157._4_4_ + auVar224._4_4_ + -1.0;
                    auVar213._8_4_ = auVar157._8_4_ + auVar224._8_4_ + -1.0;
                    auVar213._12_4_ = auVar157._12_4_ + auVar224._12_4_ + -1.0;
                    auVar213._16_4_ = auVar157._16_4_ + auVar224._16_4_ + -1.0;
                    auVar213._20_4_ = auVar157._20_4_ + auVar224._20_4_ + -1.0;
                    auVar213._24_4_ = auVar157._24_4_ + auVar224._24_4_ + -1.0;
                    auVar213._28_4_ = auVar157._28_4_ + auVar224._28_4_ + -1.0;
                    auVar246 = vpsubd_avx(auVar246,auVar153._16_16_);
                    auVar445._8_4_ = 0xffffff81;
                    auVar445._0_8_ = 0xffffff81ffffff81;
                    auVar445._12_4_ = 0xffffff81;
                    auVar246 = vpaddd_avx(auVar246,auVar445);
                    auVar423 = vpsubd_avx(auVar423,auVar153._0_16_);
                    auVar423 = vpaddd_avx(auVar445,auVar423);
                    auVar254._16_16_ = auVar246;
                    auVar254._0_16_ = auVar423;
                    auVar33._4_4_ = auVar213._4_4_ * auVar213._4_4_;
                    auVar33._0_4_ = auVar213._0_4_ * auVar213._0_4_;
                    auVar33._8_4_ = auVar213._8_4_ * auVar213._8_4_;
                    auVar33._12_4_ = auVar213._12_4_ * auVar213._12_4_;
                    auVar33._16_4_ = auVar213._16_4_ * auVar213._16_4_;
                    auVar33._20_4_ = auVar213._20_4_ * auVar213._20_4_;
                    auVar33._24_4_ = auVar213._24_4_ * auVar213._24_4_;
                    auVar33._28_4_ = auVar153._28_4_;
                    auVar436._8_4_ = 0x3d9021bb;
                    auVar436._0_8_ = 0x3d9021bb3d9021bb;
                    auVar436._12_4_ = 0x3d9021bb;
                    auVar436._16_4_ = 0x3d9021bb;
                    auVar436._20_4_ = 0x3d9021bb;
                    auVar436._24_4_ = 0x3d9021bb;
                    auVar436._28_4_ = 0x3d9021bb;
                    auVar453._8_4_ = 0xbdebd1b8;
                    auVar453._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar453._12_4_ = 0xbdebd1b8;
                    auVar453._16_4_ = 0xbdebd1b8;
                    auVar453._20_4_ = 0xbdebd1b8;
                    auVar453._24_4_ = 0xbdebd1b8;
                    auVar453._28_4_ = 0xbdebd1b8;
                    auVar246 = vfmadd213ps_fma(auVar436,auVar213,auVar453);
                    auVar454._8_4_ = 0x3def251a;
                    auVar454._0_8_ = 0x3def251a3def251a;
                    auVar454._12_4_ = 0x3def251a;
                    auVar454._16_4_ = 0x3def251a;
                    auVar454._20_4_ = 0x3def251a;
                    auVar454._24_4_ = 0x3def251a;
                    auVar454._28_4_ = 0x3def251a;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar454);
                    auVar455._8_4_ = 0xbdfe5d4f;
                    auVar455._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar455._12_4_ = 0xbdfe5d4f;
                    auVar455._16_4_ = 0xbdfe5d4f;
                    auVar455._20_4_ = 0xbdfe5d4f;
                    auVar455._24_4_ = 0xbdfe5d4f;
                    auVar455._28_4_ = 0xbdfe5d4f;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar455);
                    auVar456._8_4_ = 0x3e11e9bf;
                    auVar456._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar456._12_4_ = 0x3e11e9bf;
                    auVar456._16_4_ = 0x3e11e9bf;
                    auVar456._20_4_ = 0x3e11e9bf;
                    auVar456._24_4_ = 0x3e11e9bf;
                    auVar456._28_4_ = 0x3e11e9bf;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar456);
                    auVar457._8_4_ = 0xbe2aae50;
                    auVar457._0_8_ = 0xbe2aae50be2aae50;
                    auVar457._12_4_ = 0xbe2aae50;
                    auVar457._16_4_ = 0xbe2aae50;
                    auVar457._20_4_ = 0xbe2aae50;
                    auVar457._24_4_ = 0xbe2aae50;
                    auVar457._28_4_ = 0xbe2aae50;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar457);
                    auVar458._8_4_ = 0x3e4cceac;
                    auVar458._0_8_ = 0x3e4cceac3e4cceac;
                    auVar458._12_4_ = 0x3e4cceac;
                    auVar458._16_4_ = 0x3e4cceac;
                    auVar458._20_4_ = 0x3e4cceac;
                    auVar458._24_4_ = 0x3e4cceac;
                    auVar458._28_4_ = 0x3e4cceac;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar458);
                    auVar459._8_4_ = 0xbe7ffffc;
                    auVar459._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar459._12_4_ = 0xbe7ffffc;
                    auVar459._16_4_ = 0xbe7ffffc;
                    auVar459._20_4_ = 0xbe7ffffc;
                    auVar459._24_4_ = 0xbe7ffffc;
                    auVar459._28_4_ = 0xbe7ffffc;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar459);
                    auVar460._8_4_ = 0x3eaaaaaa;
                    auVar460._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar460._12_4_ = 0x3eaaaaaa;
                    auVar460._16_4_ = 0x3eaaaaaa;
                    auVar460._20_4_ = 0x3eaaaaaa;
                    auVar460._24_4_ = 0x3eaaaaaa;
                    auVar460._28_4_ = 0x3eaaaaaa;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar213,auVar460);
                    auVar437._0_4_ =
                         auVar213._0_4_ * auVar213._0_4_ * auVar213._0_4_ * auVar246._0_4_;
                    auVar437._4_4_ =
                         auVar213._4_4_ * auVar213._4_4_ * auVar213._4_4_ * auVar246._4_4_;
                    auVar437._8_4_ =
                         auVar213._8_4_ * auVar213._8_4_ * auVar213._8_4_ * auVar246._8_4_;
                    auVar437._12_4_ =
                         auVar213._12_4_ * auVar213._12_4_ * auVar213._12_4_ * auVar246._12_4_;
                    auVar437._16_4_ = auVar213._16_4_ * auVar213._16_4_ * auVar213._16_4_ * 0.0;
                    auVar437._20_4_ = auVar213._20_4_ * auVar213._20_4_ * auVar213._20_4_ * 0.0;
                    auVar437._24_4_ = auVar213._24_4_ * auVar213._24_4_ * auVar213._24_4_ * 0.0;
                    auVar437._28_4_ = 0;
                    auVar153 = vcvtdq2ps_avx(auVar254);
                    auVar246 = vfmadd231ps_fma(auVar437,auVar153,auVar473);
                    auVar246 = vfmsub231ps_fma(ZEXT1632(auVar246),auVar235,auVar33);
                    auVar157 = vcmpps_avx(ZEXT1632(auVar372),_DAT_00596c20,2);
                    auVar224 = vsubps_avx(ZEXT1632(auVar246),auVar213);
                    auVar246 = vfmsub231ps_fma(auVar224,auVar389,auVar153);
                    auVar504._8_4_ = 0xc0000000;
                    auVar504._0_8_ = 0xc0000000c0000000;
                    auVar504._12_4_ = 0xc0000000;
                    auVar504._16_4_ = 0xc0000000;
                    auVar504._20_4_ = 0xc0000000;
                    auVar504._24_4_ = 0xc0000000;
                    auVar504._28_4_ = 0xc0000000;
                    auVar214._0_4_ = auVar246._0_4_ * -2.0;
                    auVar214._4_4_ = auVar246._4_4_ * -2.0;
                    auVar214._8_4_ = auVar246._8_4_ * -2.0;
                    auVar214._12_4_ = auVar246._12_4_ * -2.0;
                    auVar214._16_4_ = 0x80000000;
                    auVar214._20_4_ = 0x80000000;
                    auVar214._24_4_ = 0x80000000;
                    auVar214._28_4_ = 0;
                    auVar255._8_4_ = 0x7fffffff;
                    auVar255._0_8_ = 0x7fffffff7fffffff;
                    auVar255._12_4_ = 0x7fffffff;
                    auVar255._16_4_ = 0x7fffffff;
                    auVar255._20_4_ = 0x7fffffff;
                    auVar255._24_4_ = 0x7fffffff;
                    auVar255._28_4_ = 0x7fffffff;
                    auVar157 = vblendvps_avx(auVar214,auVar255,auVar157);
                    auVar256._8_4_ = 0x42b0c0a5;
                    auVar256._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar256._12_4_ = 0x42b0c0a5;
                    auVar256._16_4_ = 0x42b0c0a5;
                    auVar256._20_4_ = 0x42b0c0a5;
                    auVar256._24_4_ = 0x42b0c0a5;
                    auVar256._28_4_ = 0x42b0c0a5;
                    auVar157 = vminps_avx(auVar157,auVar256);
                    auVar257._8_4_ = 0xc2b0c0a5;
                    auVar257._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar257._12_4_ = 0xc2b0c0a5;
                    auVar257._16_4_ = 0xc2b0c0a5;
                    auVar257._20_4_ = 0xc2b0c0a5;
                    auVar257._24_4_ = 0xc2b0c0a5;
                    auVar257._28_4_ = 0xc2b0c0a5;
                    auVar153 = vmaxps_avx(auVar157,auVar257);
                    auVar258._8_4_ = 0x3fb8aa3b;
                    auVar258._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar258._12_4_ = 0x3fb8aa3b;
                    auVar258._16_4_ = 0x3fb8aa3b;
                    auVar258._20_4_ = 0x3fb8aa3b;
                    auVar258._24_4_ = 0x3fb8aa3b;
                    auVar258._28_4_ = 0x3fb8aa3b;
                    auVar246 = vfmadd213ps_fma(auVar258,auVar153,auVar235);
                    auVar224 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar157 = vcmpps_avx(ZEXT1632(auVar246),auVar224,1);
                    auVar157 = vandps_avx(auVar157,auVar159);
                    auVar157 = vsubps_avx(auVar224,auVar157);
                    auVar246 = vfmsub231ps_fma(auVar153,auVar157,auVar389);
                    auVar423 = vfnmsub231ps_fma(ZEXT1632(auVar246),auVar157,auVar473);
                    auVar153 = ZEXT1632(auVar423);
                    auVar34._28_4_ = auVar224._28_4_;
                    auVar34._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar438._8_4_ = 0x39506967;
                    auVar438._0_8_ = 0x3950696739506967;
                    auVar438._12_4_ = 0x39506967;
                    auVar438._16_4_ = 0x39506967;
                    auVar438._20_4_ = 0x39506967;
                    auVar438._24_4_ = 0x39506967;
                    auVar438._28_4_ = 0x39506967;
                    auVar410 = ZEXT864(0) << 0x20;
                    auVar461._8_4_ = 0x3ab743ce;
                    auVar461._0_8_ = 0x3ab743ce3ab743ce;
                    auVar461._12_4_ = 0x3ab743ce;
                    auVar461._16_4_ = 0x3ab743ce;
                    auVar461._20_4_ = 0x3ab743ce;
                    auVar461._24_4_ = 0x3ab743ce;
                    auVar461._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar438,auVar153,auVar461);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar478);
                    auVar358 = ZEXT3264(auVar159);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar482);
                    auVar153 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar419);
                    auVar420 = ZEXT3264(auVar235);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar153,auVar235);
                    auVar372 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar34,auVar153);
                    auVar246._0_4_ = (int)auVar157._0_4_;
                    auVar246._4_4_ = (int)auVar157._4_4_;
                    auVar246._8_4_ = (int)auVar157._8_4_;
                    auVar246._12_4_ = (int)auVar157._12_4_;
                    auVar215._16_4_ = (int)auVar157._16_4_;
                    auVar215._0_16_ = auVar246;
                    auVar215._20_4_ = (int)auVar157._20_4_;
                    auVar215._24_4_ = (int)auVar157._24_4_;
                    auVar215._28_4_ = (int)auVar157._28_4_;
                    auVar423 = vpslld_avx(auVar246,0x17);
                    auVar246 = vpslld_avx(auVar215._16_16_,0x17);
                    auVar246 = vpaddd_avx(auVar246,auVar143);
                    auVar423 = vpaddd_avx(auVar423,auVar143);
                    auVar216._16_16_ = auVar246;
                    auVar216._0_16_ = auVar423;
                    auVar259._0_4_ = auVar372._0_4_ + fVar82;
                    auVar259._4_4_ = auVar372._4_4_ + fVar81;
                    auVar259._8_4_ = auVar372._8_4_ + fVar512;
                    auVar259._12_4_ = auVar372._12_4_ + fVar244;
                    auVar259._16_4_ = fVar245 + 0.0;
                    auVar259._20_4_ = fVar30 + 0.0;
                    auVar259._24_4_ = fVar170 + 0.0;
                    auVar259._28_4_ = fVar31 + 0.0;
                    auVar246 = vfmadd213ps_fma(auVar216,auVar259,auVar159);
                    auVar157 = vrcpps_avx(ZEXT1632(auVar246));
                    auVar246 = vfmsub213ps_fma(ZEXT1632(auVar246),auVar157,auVar159);
                    auVar246 = vfnmadd132ps_fma(ZEXT1632(auVar246),auVar157,auVar157);
                    auVar246 = vfnmadd213ps_fma(ZEXT1632(auVar246),auVar504,auVar163);
                    auVar210 = ZEXT1628(auVar246);
                    goto LAB_00291908;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar222._4_4_ = uVar1;
                    auVar222._0_4_ = uVar1;
                    auVar222._8_4_ = uVar1;
                    auVar222._12_4_ = uVar1;
                    auVar222._16_4_ = uVar1;
                    auVar222._20_4_ = uVar1;
                    auVar222._24_4_ = uVar1;
                    auVar222._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar262._4_4_ = uVar1;
                    auVar262._0_4_ = uVar1;
                    auVar262._8_4_ = uVar1;
                    auVar262._12_4_ = uVar1;
                    auVar262._16_4_ = uVar1;
                    auVar262._20_4_ = uVar1;
                    auVar262._24_4_ = uVar1;
                    auVar262._28_4_ = uVar1;
                    auVar246 = vfmadd231ps_fma(auVar262,auVar157,auVar222);
                    auVar157 = vmaxps_avx(auVar153,ZEXT1632(auVar246));
                    auVar157 = vminps_avx(auVar157,auVar159);
                    auVar210 = auVar157._0_28_;
LAB_00291908:
                    auVar485._0_4_ = auVar210._0_4_ * auVar168._0_4_;
                    auVar485._4_4_ = auVar210._4_4_ * auVar168._4_4_;
                    auVar485._8_4_ = auVar210._8_4_ * auVar168._8_4_;
                    auVar485._12_4_ = auVar210._12_4_ * auVar168._12_4_;
                    auVar485._16_4_ = auVar210._16_4_ * auVar168._16_4_;
                    auVar485._20_4_ = auVar210._20_4_ * auVar168._20_4_;
                    auVar485._24_4_ = auVar210._24_4_ * auVar168._24_4_;
                    auVar157 = auVar485._0_32_;
                  }
                  *(undefined1 (*) [32])pAVar67 = auVar157;
                  pAVar67 = pAVar67 + 4;
                  uVar74 = uVar74 + 1;
                  iVar50 = iVar50 + 1;
                } while (uVar74 != local_1a8.w);
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 4) && (uVar73 == 8)) && (0 < (long)local_1a8.c)) {
        p_Var19 = local_148[-3];
        iVar13 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_270 = 0;
        auVar420 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar358 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar168 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar410 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar485 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        do {
          if (0 < local_1a8.h) {
            iVar69 = bottom_blob->w;
            iVar75 = bottom_blob->h;
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar18 = bottom_blob->c;
            iVar61 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar74 = 0;
                iVar50 = (1 - uVar15) * iVar13;
                do {
                  if (lVar76 == 0) {
                    auVar169 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar169 = ZEXT3264(*(undefined1 (*) [32])(lVar76 + local_270 * 0x20));
                  }
                  if (0 < (int)uVar18) {
                    pvVar80 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar23 = bottom_blob->data;
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar48 = (((int)uVar77 - uVar16) + 1) * iVar14 + iVar61;
                          if (((-1 < iVar48) && (iVar49 = iVar48 / iVar60, iVar48 % iVar60 == 0)) &&
                             ((0 < (int)uVar15 && (iVar49 < iVar75)))) {
                            lVar70 = (long)iVar49 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                            uVar71 = uVar79;
                            uVar64 = (ulong)uVar15;
                            iVar48 = iVar50;
                            do {
                              if (((-1 < iVar48) && (iVar49 = iVar48 / iVar58, iVar48 % iVar58 == 0)
                                  ) && (iVar49 < iVar69)) {
                                lVar55 = (long)(iVar49 << 2);
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70);
                                auVar223._4_4_ = uVar1;
                                auVar223._0_4_ = uVar1;
                                auVar223._8_4_ = uVar1;
                                auVar223._12_4_ = uVar1;
                                auVar223._16_4_ = uVar1;
                                auVar223._20_4_ = uVar1;
                                auVar223._24_4_ = uVar1;
                                auVar223._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 4);
                                auVar263._4_4_ = uVar1;
                                auVar263._0_4_ = uVar1;
                                auVar263._8_4_ = uVar1;
                                auVar263._12_4_ = uVar1;
                                auVar263._16_4_ = uVar1;
                                auVar263._20_4_ = uVar1;
                                auVar263._24_4_ = uVar1;
                                auVar263._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 8);
                                auVar352._4_4_ = uVar1;
                                auVar352._0_4_ = uVar1;
                                auVar352._8_4_ = uVar1;
                                auVar352._12_4_ = uVar1;
                                auVar352._16_4_ = uVar1;
                                auVar352._20_4_ = uVar1;
                                auVar352._24_4_ = uVar1;
                                auVar352._28_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0xc);
                                auVar440._4_4_ = uVar1;
                                auVar440._0_4_ = uVar1;
                                auVar440._8_4_ = uVar1;
                                auVar440._12_4_ = uVar1;
                                auVar440._16_4_ = uVar1;
                                auVar440._20_4_ = uVar1;
                                auVar440._24_4_ = uVar1;
                                auVar440._28_4_ = uVar1;
                                uVar56 = uVar71 & 0xffffffff;
                                auVar246 = vfmadd231ps_fma(auVar169._0_32_,auVar223,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar263,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x20));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar352,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x40));
                                auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar440,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x60));
                                auVar169 = ZEXT1664(auVar246);
                              }
                              uVar71 = uVar71 + 0x20;
                              iVar48 = iVar48 + iVar13;
                              uVar64 = uVar64 - 1;
                            } while (uVar64 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 0x20;
                        } while (uVar77 != uVar16);
                      }
                      pvVar80 = (void *)((long)pvVar80 + (long)(int)(uVar15 * uVar16 * 0x20) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar163 = auVar169._0_32_;
                  auVar157 = auVar410._0_32_;
                  auVar235 = auVar485._0_32_;
                  auVar482 = auVar358._0_32_;
                  auVar159 = auVar420._0_32_;
                  auVar153 = auVar168._0_32_;
                  auVar479._28_36_ = auVar169._28_36_;
                  fVar82 = auVar410._0_4_;
                  fVar81 = auVar410._4_4_;
                  fVar512 = auVar410._8_4_;
                  fVar244 = auVar410._12_4_;
                  fVar245 = auVar410._16_4_;
                  fVar30 = auVar410._20_4_;
                  fVar170 = auVar410._24_4_;
                  fVar31 = auVar410._28_4_;
                  switch(uVar17) {
                  case 1:
                    auVar163 = vmaxps_avx(auVar163,_DAT_00596c20);
                    break;
                  case 2:
                    auVar482 = vmaxps_avx(auVar163,ZEXT1632(ZEXT816(0) << 0x40));
                    auVar163 = vminps_avx(auVar163,ZEXT1632(ZEXT816(0) << 0x40));
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar162._4_4_ = uVar1;
                    auVar162._0_4_ = uVar1;
                    auVar162._8_4_ = uVar1;
                    auVar162._12_4_ = uVar1;
                    auVar162._16_4_ = uVar1;
                    auVar162._20_4_ = uVar1;
                    auVar162._24_4_ = uVar1;
                    auVar162._28_4_ = uVar1;
                    auVar246 = vfmadd213ps_fma(auVar162,auVar163,auVar482);
                    auVar163 = ZEXT1632(auVar246);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar231._4_4_ = uVar1;
                    auVar231._0_4_ = uVar1;
                    auVar231._8_4_ = uVar1;
                    auVar231._12_4_ = uVar1;
                    auVar231._16_4_ = uVar1;
                    auVar231._20_4_ = uVar1;
                    auVar231._24_4_ = uVar1;
                    auVar231._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar507._4_4_ = uVar1;
                    auVar507._0_4_ = uVar1;
                    auVar507._8_4_ = uVar1;
                    auVar507._12_4_ = uVar1;
                    auVar507._16_4_ = uVar1;
                    auVar507._20_4_ = uVar1;
                    auVar507._24_4_ = uVar1;
                    auVar507._28_4_ = uVar1;
                    auVar163 = vmaxps_avx(auVar163,auVar231);
                    auVar163 = vminps_avx(auVar507,auVar163);
                    break;
                  case 4:
                    auVar158._0_8_ = auVar169._0_8_ ^ 0x8000000080000000;
                    auVar158._8_4_ = -auVar169._8_4_;
                    auVar158._12_4_ = -auVar169._12_4_;
                    auVar158._16_4_ = -auVar169._16_4_;
                    auVar158._20_4_ = -auVar169._20_4_;
                    auVar158._24_4_ = -auVar169._24_4_;
                    auVar158._28_4_ = auVar169._28_4_ ^ 0x80000000;
                    auVar112._8_4_ = 0x42b0c0a5;
                    auVar112._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar112._12_4_ = 0x42b0c0a5;
                    auVar112._16_4_ = 0x42b0c0a5;
                    auVar112._20_4_ = 0x42b0c0a5;
                    auVar112._24_4_ = 0x42b0c0a5;
                    auVar112._28_4_ = 0x42b0c0a5;
                    auVar163 = vminps_avx(auVar158,auVar112);
                    auVar159 = vmaxps_avx(auVar159,auVar163);
                    auVar246 = vfmadd213ps_fma(auVar153,auVar159,auVar482);
                    auVar153 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar246),auVar153,1);
                    auVar163 = vandps_avx(auVar163,auVar157);
                    auVar163 = vsubps_avx(auVar153,auVar163);
                    auVar113._8_4_ = 0x3f318000;
                    auVar113._0_8_ = 0x3f3180003f318000;
                    auVar113._12_4_ = 0x3f318000;
                    auVar113._16_4_ = 0x3f318000;
                    auVar113._20_4_ = 0x3f318000;
                    auVar113._24_4_ = 0x3f318000;
                    auVar113._28_4_ = 0x3f318000;
                    auVar246 = vfmsub231ps_fma(auVar159,auVar163,auVar113);
                    auVar268._8_4_ = 0x395e8083;
                    auVar268._0_8_ = 0x395e8083395e8083;
                    auVar268._12_4_ = 0x395e8083;
                    auVar268._16_4_ = 0x395e8083;
                    auVar268._20_4_ = 0x395e8083;
                    auVar268._24_4_ = 0x395e8083;
                    auVar268._28_4_ = 0x395e8083;
                    auVar423 = vfmsub231ps_fma(ZEXT1632(auVar246),auVar163,auVar268);
                    auVar159 = ZEXT1632(auVar423);
                    auVar39._28_4_ = auVar153._28_4_;
                    auVar39._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar114._8_4_ = 0x3ab743ce;
                    auVar114._0_8_ = 0x3ab743ce3ab743ce;
                    auVar114._12_4_ = 0x3ab743ce;
                    auVar114._16_4_ = 0x3ab743ce;
                    auVar114._20_4_ = 0x3ab743ce;
                    auVar114._24_4_ = 0x3ab743ce;
                    auVar114._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar235,auVar159,auVar114);
                    auVar269._8_4_ = 0x3c088908;
                    auVar269._0_8_ = 0x3c0889083c088908;
                    auVar269._12_4_ = 0x3c088908;
                    auVar269._16_4_ = 0x3c088908;
                    auVar269._20_4_ = 0x3c088908;
                    auVar269._24_4_ = 0x3c088908;
                    auVar269._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar269);
                    auVar270._8_4_ = 0x3d2aa9c1;
                    auVar270._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar270._12_4_ = 0x3d2aa9c1;
                    auVar270._16_4_ = 0x3d2aa9c1;
                    auVar270._20_4_ = 0x3d2aa9c1;
                    auVar270._24_4_ = 0x3d2aa9c1;
                    auVar270._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar270);
                    auVar115._8_4_ = 0x3e2aaaaa;
                    auVar115._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar115._12_4_ = 0x3e2aaaaa;
                    auVar115._16_4_ = 0x3e2aaaaa;
                    auVar115._20_4_ = 0x3e2aaaaa;
                    auVar115._24_4_ = 0x3e2aaaaa;
                    auVar115._28_4_ = 0x3e2aaaaa;
                    auVar159 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar115);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar482);
                    auVar372 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar39,auVar159);
                    auVar128._0_4_ = (int)auVar163._0_4_;
                    auVar128._4_4_ = (int)auVar163._4_4_;
                    auVar128._8_4_ = (int)auVar163._8_4_;
                    auVar128._12_4_ = (int)auVar163._12_4_;
                    auVar160._16_4_ = (int)auVar163._16_4_;
                    auVar160._0_16_ = auVar128;
                    auVar160._20_4_ = (int)auVar163._20_4_;
                    auVar160._24_4_ = (int)auVar163._24_4_;
                    auVar160._28_4_ = (int)auVar163._28_4_;
                    auVar423 = vpslld_avx(auVar128,0x17);
                    auVar246 = vpslld_avx(auVar160._16_16_,0x17);
                    auVar87._8_4_ = 0x3f800000;
                    auVar87._0_8_ = 0x3f8000003f800000;
                    auVar87._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar246,auVar87);
                    auVar423 = vpaddd_avx(auVar423,auVar87);
                    auVar161._16_16_ = auVar246;
                    auVar161._0_16_ = auVar423;
                    auVar232._0_4_ = auVar372._0_4_ + fVar82;
                    auVar232._4_4_ = auVar372._4_4_ + fVar81;
                    auVar232._8_4_ = auVar372._8_4_ + fVar512;
                    auVar232._12_4_ = auVar372._12_4_ + fVar244;
                    auVar232._16_4_ = fVar245 + 0.0;
                    auVar232._20_4_ = fVar30 + 0.0;
                    auVar232._24_4_ = fVar170 + 0.0;
                    auVar232._28_4_ = fVar31 + 0.0;
                    auVar246 = vfmadd213ps_fma(auVar161,auVar232,auVar157);
                    auVar163 = vrcpps_avx(ZEXT1632(auVar246));
                    auVar246 = vfmsub213ps_fma(ZEXT1632(auVar246),auVar163,auVar157);
                    auVar246 = vfnmadd132ps_fma(ZEXT1632(auVar246),auVar163,auVar163);
                    auVar163 = ZEXT1632(auVar246);
                    break;
                  case 5:
                    auVar462._8_4_ = 0x42b0c0a5;
                    auVar462._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar462._12_4_ = 0x42b0c0a5;
                    auVar462._16_4_ = 0x42b0c0a5;
                    auVar462._20_4_ = 0x42b0c0a5;
                    auVar462._24_4_ = 0x42b0c0a5;
                    auVar462._28_4_ = 0x42b0c0a5;
                    auVar163 = vminps_avx(auVar462,auVar163);
                    auVar224 = vmaxps_avx(auVar159,auVar163);
                    auVar246 = vfmadd213ps_fma(auVar153,auVar224,auVar482);
                    auVar471 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar246),auVar471,1);
                    auVar163 = vandps_avx(auVar163,auVar157);
                    auVar163 = vsubps_avx(auVar471,auVar163);
                    auVar366._8_4_ = 0x3f318000;
                    auVar366._0_8_ = 0x3f3180003f318000;
                    auVar366._12_4_ = 0x3f318000;
                    auVar366._16_4_ = 0x3f318000;
                    auVar366._20_4_ = 0x3f318000;
                    auVar366._24_4_ = 0x3f318000;
                    auVar366._28_4_ = 0x3f318000;
                    auVar246 = vfmsub231ps_fma(auVar224,auVar163,auVar366);
                    auVar109._8_4_ = 0xb95e8083;
                    auVar109._0_8_ = 0xb95e8083b95e8083;
                    auVar109._12_4_ = 0xb95e8083;
                    auVar109._16_4_ = 0xb95e8083;
                    auVar109._20_4_ = 0xb95e8083;
                    auVar109._24_4_ = 0xb95e8083;
                    auVar109._28_4_ = 0xb95e8083;
                    auVar423 = vfnmsub231ps_fma(ZEXT1632(auVar246),auVar163,auVar109);
                    auVar224 = ZEXT1632(auVar423);
                    auVar36._28_4_ = auVar471._28_4_;
                    auVar36._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar483._8_4_ = 0x3ab743ce;
                    auVar483._0_8_ = 0x3ab743ce3ab743ce;
                    auVar483._12_4_ = 0x3ab743ce;
                    auVar483._16_4_ = 0x3ab743ce;
                    auVar483._20_4_ = 0x3ab743ce;
                    auVar483._24_4_ = 0x3ab743ce;
                    auVar483._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar235,auVar224,auVar483);
                    auVar390._8_4_ = 0x3c088908;
                    auVar390._0_8_ = 0x3c0889083c088908;
                    auVar390._12_4_ = 0x3c088908;
                    auVar390._16_4_ = 0x3c088908;
                    auVar390._20_4_ = 0x3c088908;
                    auVar390._24_4_ = 0x3c088908;
                    auVar390._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar224,auVar390);
                    auVar335._8_4_ = 0x3d2aa9c1;
                    auVar335._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar335._12_4_ = 0x3d2aa9c1;
                    auVar335._16_4_ = 0x3d2aa9c1;
                    auVar335._20_4_ = 0x3d2aa9c1;
                    auVar335._24_4_ = 0x3d2aa9c1;
                    auVar335._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar224,auVar335);
                    auVar336._8_4_ = 0x3e2aaaaa;
                    auVar336._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar336._12_4_ = 0x3e2aaaaa;
                    auVar336._16_4_ = 0x3e2aaaaa;
                    auVar336._20_4_ = 0x3e2aaaaa;
                    auVar336._24_4_ = 0x3e2aaaaa;
                    auVar336._28_4_ = 0x3e2aaaaa;
                    auVar224 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar224,auVar336);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar224,auVar482);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar36,auVar224);
                    auVar225._0_4_ = auVar246._0_4_ + fVar82;
                    auVar225._4_4_ = auVar246._4_4_ + fVar81;
                    auVar225._8_4_ = auVar246._8_4_ + fVar512;
                    auVar225._12_4_ = auVar246._12_4_ + fVar244;
                    auVar225._16_4_ = fVar245 + 0.0;
                    auVar225._20_4_ = fVar30 + 0.0;
                    auVar225._24_4_ = fVar170 + 0.0;
                    auVar225._28_4_ = fVar31 + 0.0;
                    auVar372._0_4_ = (int)auVar163._0_4_;
                    auVar372._4_4_ = (int)auVar163._4_4_;
                    auVar372._8_4_ = (int)auVar163._8_4_;
                    auVar372._12_4_ = (int)auVar163._12_4_;
                    auVar264._16_4_ = (int)auVar163._16_4_;
                    auVar264._0_16_ = auVar372;
                    auVar264._20_4_ = (int)auVar163._20_4_;
                    auVar264._24_4_ = (int)auVar163._24_4_;
                    auVar264._28_4_ = (int)auVar163._28_4_;
                    auVar423 = vpslld_avx(auVar372,0x17);
                    auVar246 = vpslld_avx(auVar264._16_16_,0x17);
                    auVar369._8_4_ = 0x3f800000;
                    auVar369._0_8_ = 0x3f8000003f800000;
                    auVar369._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar369,auVar246);
                    auVar423 = vpaddd_avx(auVar423,auVar369);
                    auVar506._16_16_ = auVar246;
                    auVar506._0_16_ = auVar423;
                    auVar372 = vfmadd213ps_fma(auVar506,auVar225,auVar157);
                    auVar226._8_4_ = 0x800000;
                    auVar226._0_8_ = 0x80000000800000;
                    auVar226._12_4_ = 0x800000;
                    auVar226._16_4_ = 0x800000;
                    auVar226._20_4_ = 0x800000;
                    auVar226._24_4_ = 0x800000;
                    auVar226._28_4_ = 0x800000;
                    auVar163 = vmaxps_avx(ZEXT1632(auVar372),auVar226);
                    auVar423 = vpsrld_avx(auVar163._0_16_,0x17);
                    auVar246 = vpsrld_avx(auVar163._16_16_,0x17);
                    auVar337._8_4_ = 0x807fffff;
                    auVar337._0_8_ = 0x807fffff807fffff;
                    auVar337._12_4_ = 0x807fffff;
                    auVar337._16_4_ = 0x807fffff;
                    auVar337._20_4_ = 0x807fffff;
                    auVar337._24_4_ = 0x807fffff;
                    auVar337._28_4_ = 0x807fffff;
                    auVar163 = vandps_avx(auVar163,auVar337);
                    auVar471 = vorps_avx(auVar163,auVar482);
                    auVar338._8_4_ = 0x3f3504f3;
                    auVar338._0_8_ = 0x3f3504f33f3504f3;
                    auVar338._12_4_ = 0x3f3504f3;
                    auVar338._16_4_ = 0x3f3504f3;
                    auVar338._20_4_ = 0x3f3504f3;
                    auVar338._24_4_ = 0x3f3504f3;
                    auVar338._28_4_ = 0x3f3504f3;
                    auVar224 = vcmpps_avx(auVar338,auVar471,2);
                    auVar163 = vandnps_avx(auVar224,auVar471);
                    auVar227._0_4_ = auVar163._0_4_ + auVar471._0_4_ + -1.0;
                    auVar227._4_4_ = auVar163._4_4_ + auVar471._4_4_ + -1.0;
                    auVar227._8_4_ = auVar163._8_4_ + auVar471._8_4_ + -1.0;
                    auVar227._12_4_ = auVar163._12_4_ + auVar471._12_4_ + -1.0;
                    auVar227._16_4_ = auVar163._16_4_ + auVar471._16_4_ + -1.0;
                    auVar227._20_4_ = auVar163._20_4_ + auVar471._20_4_ + -1.0;
                    auVar227._24_4_ = auVar163._24_4_ + auVar471._24_4_ + -1.0;
                    auVar227._28_4_ = auVar163._28_4_ + auVar471._28_4_ + -1.0;
                    auVar246 = vpsubd_avx(auVar246,auVar224._16_16_);
                    auVar446._8_4_ = 0xffffff81;
                    auVar446._0_8_ = 0xffffff81ffffff81;
                    auVar446._12_4_ = 0xffffff81;
                    auVar246 = vpaddd_avx(auVar246,auVar446);
                    auVar423 = vpsubd_avx(auVar423,auVar224._0_16_);
                    auVar423 = vpaddd_avx(auVar446,auVar423);
                    auVar265._16_16_ = auVar246;
                    auVar265._0_16_ = auVar423;
                    auVar37._4_4_ = auVar227._4_4_ * auVar227._4_4_;
                    auVar37._0_4_ = auVar227._0_4_ * auVar227._0_4_;
                    auVar37._8_4_ = auVar227._8_4_ * auVar227._8_4_;
                    auVar37._12_4_ = auVar227._12_4_ * auVar227._12_4_;
                    auVar37._16_4_ = auVar227._16_4_ * auVar227._16_4_;
                    auVar37._20_4_ = auVar227._20_4_ * auVar227._20_4_;
                    auVar37._24_4_ = auVar227._24_4_ * auVar227._24_4_;
                    auVar37._28_4_ = auVar224._28_4_;
                    auVar441._8_4_ = 0x3d9021bb;
                    auVar441._0_8_ = 0x3d9021bb3d9021bb;
                    auVar441._12_4_ = 0x3d9021bb;
                    auVar441._16_4_ = 0x3d9021bb;
                    auVar441._20_4_ = 0x3d9021bb;
                    auVar441._24_4_ = 0x3d9021bb;
                    auVar441._28_4_ = 0x3d9021bb;
                    auVar391._8_4_ = 0xbdebd1b8;
                    auVar391._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar391._12_4_ = 0xbdebd1b8;
                    auVar391._16_4_ = 0xbdebd1b8;
                    auVar391._20_4_ = 0xbdebd1b8;
                    auVar391._24_4_ = 0xbdebd1b8;
                    auVar391._28_4_ = 0xbdebd1b8;
                    auVar246 = vfmadd213ps_fma(auVar441,auVar227,auVar391);
                    auVar392._8_4_ = 0x3def251a;
                    auVar392._0_8_ = 0x3def251a3def251a;
                    auVar392._12_4_ = 0x3def251a;
                    auVar392._16_4_ = 0x3def251a;
                    auVar392._20_4_ = 0x3def251a;
                    auVar392._24_4_ = 0x3def251a;
                    auVar392._28_4_ = 0x3def251a;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar392);
                    auVar393._8_4_ = 0xbdfe5d4f;
                    auVar393._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar393._12_4_ = 0xbdfe5d4f;
                    auVar393._16_4_ = 0xbdfe5d4f;
                    auVar393._20_4_ = 0xbdfe5d4f;
                    auVar393._24_4_ = 0xbdfe5d4f;
                    auVar393._28_4_ = 0xbdfe5d4f;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar393);
                    auVar394._8_4_ = 0x3e11e9bf;
                    auVar394._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar394._12_4_ = 0x3e11e9bf;
                    auVar394._16_4_ = 0x3e11e9bf;
                    auVar394._20_4_ = 0x3e11e9bf;
                    auVar394._24_4_ = 0x3e11e9bf;
                    auVar394._28_4_ = 0x3e11e9bf;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar394);
                    auVar395._8_4_ = 0xbe2aae50;
                    auVar395._0_8_ = 0xbe2aae50be2aae50;
                    auVar395._12_4_ = 0xbe2aae50;
                    auVar395._16_4_ = 0xbe2aae50;
                    auVar395._20_4_ = 0xbe2aae50;
                    auVar395._24_4_ = 0xbe2aae50;
                    auVar395._28_4_ = 0xbe2aae50;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar395);
                    auVar396._8_4_ = 0x3e4cceac;
                    auVar396._0_8_ = 0x3e4cceac3e4cceac;
                    auVar396._12_4_ = 0x3e4cceac;
                    auVar396._16_4_ = 0x3e4cceac;
                    auVar396._20_4_ = 0x3e4cceac;
                    auVar396._24_4_ = 0x3e4cceac;
                    auVar396._28_4_ = 0x3e4cceac;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar396);
                    auVar397._8_4_ = 0xbe7ffffc;
                    auVar397._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar397._12_4_ = 0xbe7ffffc;
                    auVar397._16_4_ = 0xbe7ffffc;
                    auVar397._20_4_ = 0xbe7ffffc;
                    auVar397._24_4_ = 0xbe7ffffc;
                    auVar397._28_4_ = 0xbe7ffffc;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar397);
                    auVar398._8_4_ = 0x3eaaaaaa;
                    auVar398._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar398._12_4_ = 0x3eaaaaaa;
                    auVar398._16_4_ = 0x3eaaaaaa;
                    auVar398._20_4_ = 0x3eaaaaaa;
                    auVar398._24_4_ = 0x3eaaaaaa;
                    auVar398._28_4_ = 0x3eaaaaaa;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar227,auVar398);
                    auVar442._0_4_ =
                         auVar227._0_4_ * auVar227._0_4_ * auVar227._0_4_ * auVar246._0_4_;
                    auVar442._4_4_ =
                         auVar227._4_4_ * auVar227._4_4_ * auVar227._4_4_ * auVar246._4_4_;
                    auVar442._8_4_ =
                         auVar227._8_4_ * auVar227._8_4_ * auVar227._8_4_ * auVar246._8_4_;
                    auVar442._12_4_ =
                         auVar227._12_4_ * auVar227._12_4_ * auVar227._12_4_ * auVar246._12_4_;
                    auVar442._16_4_ = auVar227._16_4_ * auVar227._16_4_ * auVar227._16_4_ * 0.0;
                    auVar442._20_4_ = auVar227._20_4_ * auVar227._20_4_ * auVar227._20_4_ * 0.0;
                    auVar442._24_4_ = auVar227._24_4_ * auVar227._24_4_ * auVar227._24_4_ * 0.0;
                    auVar442._28_4_ = 0;
                    auVar224 = vcvtdq2ps_avx(auVar265);
                    auVar463._8_4_ = 0xb95e8083;
                    auVar463._0_8_ = 0xb95e8083b95e8083;
                    auVar463._12_4_ = 0xb95e8083;
                    auVar463._16_4_ = 0xb95e8083;
                    auVar463._20_4_ = 0xb95e8083;
                    auVar463._24_4_ = 0xb95e8083;
                    auVar463._28_4_ = 0xb95e8083;
                    auVar246 = vfmadd231ps_fma(auVar442,auVar224,auVar463);
                    auVar246 = vfmsub231ps_fma(ZEXT1632(auVar246),auVar482,auVar37);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar372),ZEXT832(0) << 0x20,2);
                    auVar471 = vsubps_avx(ZEXT1632(auVar246),auVar227);
                    auVar246 = vfmsub231ps_fma(auVar471,auVar366,auVar224);
                    auVar399._8_4_ = 0xc0000000;
                    auVar399._0_8_ = 0xc0000000c0000000;
                    auVar399._12_4_ = 0xc0000000;
                    auVar399._16_4_ = 0xc0000000;
                    auVar399._20_4_ = 0xc0000000;
                    auVar399._24_4_ = 0xc0000000;
                    auVar399._28_4_ = 0xc0000000;
                    auVar228._0_4_ = auVar246._0_4_ * -2.0;
                    auVar228._4_4_ = auVar246._4_4_ * -2.0;
                    auVar228._8_4_ = auVar246._8_4_ * -2.0;
                    auVar228._12_4_ = auVar246._12_4_ * -2.0;
                    auVar228._16_4_ = 0x80000000;
                    auVar228._20_4_ = 0x80000000;
                    auVar228._24_4_ = 0x80000000;
                    auVar228._28_4_ = 0;
                    auVar266._8_4_ = 0x7fffffff;
                    auVar266._0_8_ = 0x7fffffff7fffffff;
                    auVar266._12_4_ = 0x7fffffff;
                    auVar266._16_4_ = 0x7fffffff;
                    auVar266._20_4_ = 0x7fffffff;
                    auVar266._24_4_ = 0x7fffffff;
                    auVar266._28_4_ = 0x7fffffff;
                    auVar163 = vblendvps_avx(auVar228,auVar266,auVar163);
                    auVar163 = vminps_avx(auVar462,auVar163);
                    auVar420 = ZEXT3264(auVar159);
                    auVar159 = vmaxps_avx(auVar159,auVar163);
                    auVar168 = ZEXT3264(auVar153);
                    auVar246 = vfmadd213ps_fma(auVar153,auVar159,auVar482);
                    auVar153 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar246),auVar153,1);
                    auVar163 = vandps_avx(auVar163,auVar157);
                    auVar163 = vsubps_avx(auVar153,auVar163);
                    auVar246 = vfmsub231ps_fma(auVar159,auVar163,auVar366);
                    auVar423 = vfnmsub231ps_fma(ZEXT1632(auVar246),auVar163,auVar463);
                    auVar159 = ZEXT1632(auVar423);
                    auVar38._28_4_ = auVar153._28_4_;
                    auVar38._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar485 = ZEXT3264(auVar235);
                    auVar246 = vfmadd213ps_fma(auVar235,auVar159,auVar483);
                    auVar339._8_4_ = 0x3c088908;
                    auVar339._0_8_ = 0x3c0889083c088908;
                    auVar339._12_4_ = 0x3c088908;
                    auVar339._16_4_ = 0x3c088908;
                    auVar339._20_4_ = 0x3c088908;
                    auVar339._24_4_ = 0x3c088908;
                    auVar339._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar339);
                    auVar340._8_4_ = 0x3d2aa9c1;
                    auVar340._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar340._12_4_ = 0x3d2aa9c1;
                    auVar340._16_4_ = 0x3d2aa9c1;
                    auVar340._20_4_ = 0x3d2aa9c1;
                    auVar340._24_4_ = 0x3d2aa9c1;
                    auVar340._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar340);
                    auVar358 = ZEXT3264(auVar482);
                    auVar410 = ZEXT3264(auVar157);
                    auVar110._8_4_ = 0x3e2aaaaa;
                    auVar110._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar110._12_4_ = 0x3e2aaaaa;
                    auVar110._16_4_ = 0x3e2aaaaa;
                    auVar110._20_4_ = 0x3e2aaaaa;
                    auVar110._24_4_ = 0x3e2aaaaa;
                    auVar110._28_4_ = 0x3e2aaaaa;
                    auVar159 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar110);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar159,auVar482);
                    auVar372 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar38,auVar159);
                    auVar386._0_4_ = (int)auVar163._0_4_;
                    auVar386._4_4_ = (int)auVar163._4_4_;
                    auVar386._8_4_ = (int)auVar163._8_4_;
                    auVar386._12_4_ = (int)auVar163._12_4_;
                    auVar229._16_4_ = (int)auVar163._16_4_;
                    auVar229._0_16_ = auVar386;
                    auVar229._20_4_ = (int)auVar163._20_4_;
                    auVar229._24_4_ = (int)auVar163._24_4_;
                    auVar229._28_4_ = (int)auVar163._28_4_;
                    auVar423 = vpslld_avx(auVar386,0x17);
                    auVar246 = vpslld_avx(auVar229._16_16_,0x17);
                    auVar86._8_4_ = 0x3f800000;
                    auVar86._0_8_ = 0x3f8000003f800000;
                    auVar86._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar246,auVar86);
                    auVar423 = vpaddd_avx(auVar423,auVar86);
                    auVar230._16_16_ = auVar246;
                    auVar230._0_16_ = auVar423;
                    auVar267._0_4_ = auVar372._0_4_ + fVar82;
                    auVar267._4_4_ = auVar372._4_4_ + fVar81;
                    auVar267._8_4_ = auVar372._8_4_ + fVar512;
                    auVar267._12_4_ = auVar372._12_4_ + fVar244;
                    auVar267._16_4_ = fVar245 + 0.0;
                    auVar267._20_4_ = fVar30 + 0.0;
                    auVar267._24_4_ = fVar170 + 0.0;
                    auVar267._28_4_ = fVar31 + 0.0;
                    auVar246 = vfmadd213ps_fma(auVar230,auVar267,auVar157);
                    auVar163 = vrcpps_avx(ZEXT1632(auVar246));
                    auVar246 = vfmsub213ps_fma(ZEXT1632(auVar246),auVar163,auVar157);
                    auVar246 = vfnmadd132ps_fma(ZEXT1632(auVar246),auVar163,auVar163);
                    auVar111._8_4_ = 0xbf800000;
                    auVar111._0_8_ = 0xbf800000bf800000;
                    auVar111._12_4_ = 0xbf800000;
                    auVar111._16_4_ = 0xbf800000;
                    auVar111._20_4_ = 0xbf800000;
                    auVar111._24_4_ = 0xbf800000;
                    auVar111._28_4_ = 0xbf800000;
                    auVar246 = vfnmadd213ps_fma(ZEXT1632(auVar246),auVar399,auVar111);
                    auVar210 = ZEXT1628(auVar246);
                    goto LAB_0029212b;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar233._4_4_ = uVar1;
                    auVar233._0_4_ = uVar1;
                    auVar233._8_4_ = uVar1;
                    auVar233._12_4_ = uVar1;
                    auVar233._16_4_ = uVar1;
                    auVar233._20_4_ = uVar1;
                    auVar233._24_4_ = uVar1;
                    auVar233._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar271._4_4_ = uVar1;
                    auVar271._0_4_ = uVar1;
                    auVar271._8_4_ = uVar1;
                    auVar271._12_4_ = uVar1;
                    auVar271._16_4_ = uVar1;
                    auVar271._20_4_ = uVar1;
                    auVar271._24_4_ = uVar1;
                    auVar271._28_4_ = uVar1;
                    auVar246 = vfmadd231ps_fma(auVar271,auVar163,auVar233);
                    auVar163 = vmaxps_avx(ZEXT1632(auVar246),_DAT_00596c20);
                    auVar163 = vminps_avx(auVar163,auVar157);
                    auVar210 = auVar163._0_28_;
LAB_0029212b:
                    auVar479._0_4_ = auVar210._0_4_ * auVar169._0_4_;
                    auVar479._4_4_ = auVar210._4_4_ * auVar169._4_4_;
                    auVar479._8_4_ = auVar210._8_4_ * auVar169._8_4_;
                    auVar479._12_4_ = auVar210._12_4_ * auVar169._12_4_;
                    auVar479._16_4_ = auVar210._16_4_ * auVar169._16_4_;
                    auVar479._20_4_ = auVar210._20_4_ * auVar169._20_4_;
                    auVar479._24_4_ = auVar210._24_4_ * auVar169._24_4_;
                    auVar163 = auVar479._0_32_;
                  }
                  *(undefined1 (*) [32])pAVar67 = auVar163;
                  pAVar67 = pAVar67 + 4;
                  uVar74 = uVar74 + 1;
                  iVar50 = iVar50 + 1;
                } while (uVar74 != local_1a8.w);
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 8) && (uVar73 == 4)) && (0 < (long)local_1a8.c)) {
        p_Var19 = local_148[-3];
        iVar13 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_270 = 0;
        auVar410 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar342._8_4_ = 0x3f000000;
        auVar342._0_8_ = 0x3f0000003f000000;
        auVar342._12_4_ = 0x3f000000;
        auVar358 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar480._8_4_ = 0x3ab743ce;
        auVar480._0_8_ = 0x3ab743ce3ab743ce;
        auVar480._12_4_ = 0x3ab743ce;
        do {
          if (0 < local_1a8.h) {
            iVar69 = bottom_blob->w;
            iVar75 = bottom_blob->h;
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar18 = bottom_blob->c;
            iVar61 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar74 = 0;
                iVar50 = (1 - uVar15) * iVar13;
                do {
                  if (lVar76 == 0) {
                    auVar129 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar129 = *(undefined1 (*) [16])(lVar76 + local_270 * 0x10);
                  }
                  auVar420 = ZEXT1664(auVar129);
                  if (0 < (int)uVar18) {
                    pvVar80 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar23 = bottom_blob->data;
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar48 = (((int)uVar77 - uVar16) + 1) * iVar14 + iVar61;
                          if (((-1 < iVar48) && (iVar49 = iVar48 / iVar60, iVar48 % iVar60 == 0)) &&
                             ((0 < (int)uVar15 && (iVar49 < iVar75)))) {
                            lVar70 = (long)iVar49 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                            uVar71 = uVar79;
                            uVar64 = (ulong)uVar15;
                            iVar48 = iVar50;
                            do {
                              if (((-1 < iVar48) && (iVar49 = iVar48 / iVar58, iVar48 % iVar58 == 0)
                                  ) && (iVar49 < iVar69)) {
                                lVar55 = (long)(iVar49 << 3);
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70);
                                auVar171._4_4_ = uVar1;
                                auVar171._0_4_ = uVar1;
                                auVar171._8_4_ = uVar1;
                                auVar171._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 4);
                                auVar282._4_4_ = uVar1;
                                auVar282._0_4_ = uVar1;
                                auVar282._8_4_ = uVar1;
                                auVar282._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 8);
                                auVar370._4_4_ = uVar1;
                                auVar370._0_4_ = uVar1;
                                auVar370._8_4_ = uVar1;
                                auVar370._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0xc);
                                auVar413._4_4_ = uVar1;
                                auVar413._0_4_ = uVar1;
                                auVar413._8_4_ = uVar1;
                                auVar413._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x10);
                                auVar424._4_4_ = uVar1;
                                auVar424._0_4_ = uVar1;
                                auVar424._8_4_ = uVar1;
                                auVar424._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x14);
                                auVar487._4_4_ = uVar1;
                                auVar487._0_4_ = uVar1;
                                auVar487._8_4_ = uVar1;
                                auVar487._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x18);
                                auVar447._4_4_ = uVar1;
                                auVar447._0_4_ = uVar1;
                                auVar447._8_4_ = uVar1;
                                auVar447._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0x1c);
                                auVar466._4_4_ = uVar1;
                                auVar466._0_4_ = uVar1;
                                auVar466._8_4_ = uVar1;
                                auVar466._12_4_ = uVar1;
                                uVar56 = uVar71 & 0xffffffff;
                                auVar246 = vfmadd231ps_fma(auVar420._0_16_,auVar171,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar282,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x10));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar370,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x20));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar413,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x30));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar424,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x40));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar487,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x50));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar447,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x60));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar466,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x70));
                                auVar420 = ZEXT1664(auVar246);
                              }
                              uVar71 = uVar71 + 0x20;
                              iVar48 = iVar48 + iVar13;
                              uVar64 = uVar64 - 1;
                            } while (uVar64 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 0x20;
                        } while (uVar77 != uVar16);
                      }
                      auVar129 = auVar420._0_16_;
                      pvVar80 = (void *)((long)pvVar80 + (long)(int)(uVar15 * uVar16 * 0x20) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar423 = auVar410._0_16_;
                  auVar246 = auVar358._0_16_;
                  fVar82 = auVar358._0_4_;
                  fVar81 = auVar358._4_4_;
                  fVar512 = auVar358._8_4_;
                  fVar244 = auVar358._12_4_;
                  fVar170 = auVar129._4_4_;
                  fVar245 = auVar129._8_4_;
                  fVar30 = auVar129._12_4_;
                  switch(uVar17) {
                  case 1:
                    auVar129 = vmaxps_avx(auVar129,auVar423);
                    break;
                  case 2:
                    auVar246 = vmaxps_avx(auVar129,auVar423);
                    auVar423 = vminps_avx(auVar129,auVar423);
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar132._4_4_ = uVar1;
                    auVar132._0_4_ = uVar1;
                    auVar132._8_4_ = uVar1;
                    auVar132._12_4_ = uVar1;
                    auVar129 = vfmadd213ps_fma(auVar132,auVar423,auVar246);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar376._4_4_ = uVar1;
                    auVar376._0_4_ = uVar1;
                    auVar376._8_4_ = uVar1;
                    auVar376._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar490._4_4_ = uVar1;
                    auVar490._0_4_ = uVar1;
                    auVar490._8_4_ = uVar1;
                    auVar490._12_4_ = uVar1;
                    auVar246 = vmaxps_avx(auVar376,auVar129);
                    auVar129 = vminps_avx(auVar490,auVar246);
                    break;
                  case 4:
                    auVar130._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
                    auVar130._8_4_ = -fVar245;
                    auVar130._12_4_ = -fVar30;
                    auVar177._8_4_ = 0x42b0c0a5;
                    auVar177._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar177._12_4_ = 0x42b0c0a5;
                    auVar423 = vminps_avx(auVar130,auVar177);
                    auVar178._8_4_ = 0xc2b0c0a5;
                    auVar178._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar178._12_4_ = 0xc2b0c0a5;
                    auVar143 = vmaxps_avx(auVar423,auVar178);
                    auVar377._8_4_ = 0x3fb8aa3b;
                    auVar377._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar377._12_4_ = 0x3fb8aa3b;
                    auVar423 = vfmadd213ps_fma(auVar377,auVar143,auVar342);
                    auVar491._0_4_ = (int)auVar423._0_4_;
                    auVar491._4_4_ = (int)auVar423._4_4_;
                    auVar491._8_4_ = (int)auVar423._8_4_;
                    auVar491._12_4_ = (int)auVar423._12_4_;
                    auVar372 = vcvtdq2ps_avx(auVar491);
                    auVar423 = vcmpps_avx(auVar423,auVar372,1);
                    auVar423 = vandps_avx(auVar423,auVar246);
                    auVar423 = vsubps_avx(auVar372,auVar423);
                    auVar89._8_4_ = 0x3f318000;
                    auVar89._0_8_ = 0x3f3180003f318000;
                    auVar89._12_4_ = 0x3f318000;
                    auVar372 = vfmsub231ps_fma(auVar143,auVar423,auVar89);
                    auVar179._8_4_ = 0x395e8083;
                    auVar179._0_8_ = 0x395e8083395e8083;
                    auVar179._12_4_ = 0x395e8083;
                    auVar143 = vfmsub231ps_fma(auVar372,auVar423,auVar179);
                    auVar492._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar492._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar492._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar492._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar426._8_4_ = 0x39506967;
                    auVar426._0_8_ = 0x3950696739506967;
                    auVar426._12_4_ = 0x39506967;
                    auVar180._8_4_ = 0x3ab743ce;
                    auVar180._0_8_ = 0x3ab743ce3ab743ce;
                    auVar180._12_4_ = 0x3ab743ce;
                    auVar372 = vfmadd213ps_fma(auVar426,auVar143,auVar180);
                    auVar181._8_4_ = 0x3c088908;
                    auVar181._0_8_ = 0x3c0889083c088908;
                    auVar181._12_4_ = 0x3c088908;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar181);
                    auVar90._8_4_ = 0x3d2aa9c1;
                    auVar90._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar90._12_4_ = 0x3d2aa9c1;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar90);
                    auVar91._8_4_ = 0x3e2aaaaa;
                    auVar91._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar91._12_4_ = 0x3e2aaaaa;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar91);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar342);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar492,auVar143);
                    auVar427._0_4_ = auVar372._0_4_ + fVar82;
                    auVar427._4_4_ = auVar372._4_4_ + fVar81;
                    auVar427._8_4_ = auVar372._8_4_ + fVar512;
                    auVar427._12_4_ = auVar372._12_4_ + fVar244;
                    auVar131._0_4_ = (int)auVar423._0_4_;
                    auVar131._4_4_ = (int)auVar423._4_4_;
                    auVar131._8_4_ = (int)auVar423._8_4_;
                    auVar131._12_4_ = (int)auVar423._12_4_;
                    auVar423 = vpslld_avx(auVar131,0x17);
                    auVar423 = vpaddd_avx(auVar423,auVar246);
                    auVar372 = vfmadd213ps_fma(auVar423,auVar427,auVar246);
                    auVar423 = vrcpps_avx(auVar372);
                    auVar246 = vfmsub213ps_fma(auVar372,auVar423,auVar246);
                    auVar129 = vfnmadd132ps_fma(auVar246,auVar423,auVar423);
                    break;
                  case 5:
                    auVar448._8_4_ = 0x42b0c0a5;
                    auVar448._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar448._12_4_ = 0x42b0c0a5;
                    auVar423 = vminps_avx(auVar448,auVar129);
                    auVar467._8_4_ = 0xc2b0c0a5;
                    auVar467._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar467._12_4_ = 0xc2b0c0a5;
                    auVar143 = vmaxps_avx(auVar423,auVar467);
                    auVar474._8_4_ = 0x3fb8aa3b;
                    auVar474._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar474._12_4_ = 0x3fb8aa3b;
                    auVar423 = vfmadd213ps_fma(auVar474,auVar143,auVar342);
                    auVar488._0_4_ = (int)auVar423._0_4_;
                    auVar488._4_4_ = (int)auVar423._4_4_;
                    auVar488._8_4_ = (int)auVar423._8_4_;
                    auVar488._12_4_ = (int)auVar423._12_4_;
                    auVar372 = vcvtdq2ps_avx(auVar488);
                    auVar423 = vcmpps_avx(auVar423,auVar372,1);
                    auVar423 = vandps_avx(auVar423,auVar246);
                    auVar423 = vsubps_avx(auVar372,auVar423);
                    auVar449._8_4_ = 0x3f318000;
                    auVar449._0_8_ = 0x3f3180003f318000;
                    auVar449._12_4_ = 0x3f318000;
                    auVar372 = vfmsub231ps_fma(auVar143,auVar423,auVar449);
                    auVar468._8_4_ = 0xb95e8083;
                    auVar468._0_8_ = 0xb95e8083b95e8083;
                    auVar468._12_4_ = 0xb95e8083;
                    auVar143 = vfnmsub231ps_fma(auVar372,auVar423,auVar468);
                    auVar489._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar489._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar489._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar489._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar361._8_4_ = 0x39506967;
                    auVar361._0_8_ = 0x3950696739506967;
                    auVar361._12_4_ = 0x39506967;
                    auVar372 = vfmadd213ps_fma(auVar361,auVar143,auVar480);
                    auVar247._8_4_ = 0x3c088908;
                    auVar247._0_8_ = 0x3c0889083c088908;
                    auVar247._12_4_ = 0x3c088908;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar247);
                    auVar353._8_4_ = 0x3d2aa9c1;
                    auVar353._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar353._12_4_ = 0x3d2aa9c1;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar353);
                    auVar248._8_4_ = 0x3e2aaaaa;
                    auVar248._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar248._12_4_ = 0x3e2aaaaa;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar248);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar342);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar489,auVar143);
                    auVar172._0_4_ = auVar372._0_4_ + fVar82;
                    auVar172._4_4_ = auVar372._4_4_ + fVar81;
                    auVar172._8_4_ = auVar372._8_4_ + fVar512;
                    auVar172._12_4_ = auVar372._12_4_ + fVar244;
                    auVar371._0_4_ = (int)auVar423._0_4_;
                    auVar371._4_4_ = (int)auVar423._4_4_;
                    auVar371._8_4_ = (int)auVar423._8_4_;
                    auVar371._12_4_ = (int)auVar423._12_4_;
                    auVar423 = vpslld_avx(auVar371,0x17);
                    auVar423 = vpaddd_avx(auVar423,auVar246);
                    auVar85 = vfmadd213ps_fma(auVar423,auVar172,auVar246);
                    auVar173._8_4_ = 0x800000;
                    auVar173._0_8_ = 0x80000000800000;
                    auVar173._12_4_ = 0x800000;
                    auVar423 = vmaxps_avx(auVar85,auVar173);
                    auVar372 = vpsrld_avx(auVar423,0x17);
                    auVar283._8_4_ = 0xffffff82;
                    auVar283._0_8_ = 0xffffff82ffffff82;
                    auVar283._12_4_ = 0xffffff82;
                    auVar372 = vpaddd_avx(auVar372,auVar283);
                    auVar284._8_4_ = 0x807fffff;
                    auVar284._0_8_ = 0x807fffff807fffff;
                    auVar284._12_4_ = 0x807fffff;
                    auVar423 = vandps_avx(auVar423,auVar284);
                    auVar445 = vorps_avx(auVar423,auVar342);
                    auVar143 = vcvtdq2ps_avx(auVar372);
                    auVar285._8_4_ = 0x3f3504f3;
                    auVar285._0_8_ = 0x3f3504f33f3504f3;
                    auVar285._12_4_ = 0x3f3504f3;
                    auVar372 = vcmpps_avx(auVar445,auVar285,1);
                    auVar423 = vandps_avx(auVar372,auVar445);
                    auVar174._0_4_ = auVar423._0_4_ + auVar445._0_4_ + -1.0;
                    auVar174._4_4_ = auVar423._4_4_ + auVar445._4_4_ + -1.0;
                    auVar174._8_4_ = auVar423._8_4_ + auVar445._8_4_ + -1.0;
                    auVar174._12_4_ = auVar423._12_4_ + auVar445._12_4_ + -1.0;
                    auVar423 = vandps_avx(auVar372,auVar246);
                    auVar372 = vsubps_avx(auVar143,auVar423);
                    auVar414._0_4_ = auVar174._0_4_ * auVar174._0_4_;
                    auVar414._4_4_ = auVar174._4_4_ * auVar174._4_4_;
                    auVar414._8_4_ = auVar174._8_4_ * auVar174._8_4_;
                    auVar414._12_4_ = auVar174._12_4_ * auVar174._12_4_;
                    auVar425._8_4_ = 0x3d9021bb;
                    auVar425._0_8_ = 0x3d9021bb3d9021bb;
                    auVar425._12_4_ = 0x3d9021bb;
                    auVar286._8_4_ = 0xbdebd1b8;
                    auVar286._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar286._12_4_ = 0xbdebd1b8;
                    auVar423 = vfmadd213ps_fma(auVar425,auVar174,auVar286);
                    auVar287._8_4_ = 0x3def251a;
                    auVar287._0_8_ = 0x3def251a3def251a;
                    auVar287._12_4_ = 0x3def251a;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar287);
                    auVar288._8_4_ = 0xbdfe5d4f;
                    auVar288._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar288._12_4_ = 0xbdfe5d4f;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar288);
                    auVar289._8_4_ = 0x3e11e9bf;
                    auVar289._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar289._12_4_ = 0x3e11e9bf;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar289);
                    auVar290._8_4_ = 0xbe2aae50;
                    auVar290._0_8_ = 0xbe2aae50be2aae50;
                    auVar290._12_4_ = 0xbe2aae50;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar290);
                    auVar291._8_4_ = 0x3e4cceac;
                    auVar291._0_8_ = 0x3e4cceac3e4cceac;
                    auVar291._12_4_ = 0x3e4cceac;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar291);
                    auVar292._8_4_ = 0xbe7ffffc;
                    auVar292._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar292._12_4_ = 0xbe7ffffc;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar292);
                    auVar293._8_4_ = 0x3eaaaaaa;
                    auVar293._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar293._12_4_ = 0x3eaaaaaa;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar174,auVar293);
                    auVar294._0_4_ = auVar423._0_4_ * auVar414._0_4_ * auVar174._0_4_;
                    auVar294._4_4_ = auVar423._4_4_ * auVar414._4_4_ * auVar174._4_4_;
                    auVar294._8_4_ = auVar423._8_4_ * auVar414._8_4_ * auVar174._8_4_;
                    auVar294._12_4_ = auVar423._12_4_ * auVar414._12_4_ * auVar174._12_4_;
                    auVar423 = vfmadd231ps_fma(auVar294,auVar372,auVar468);
                    auVar143 = vfmsub231ps_fma(auVar423,auVar342,auVar414);
                    auVar423 = vcmpps_avx(auVar85,_DAT_00592010,2);
                    auVar143 = vsubps_avx(auVar143,auVar174);
                    auVar372 = vfnmadd231ps_fma(auVar143,auVar449,auVar372);
                    auVar175._0_4_ = auVar372._0_4_ + auVar372._0_4_;
                    auVar175._4_4_ = auVar372._4_4_ + auVar372._4_4_;
                    auVar175._8_4_ = auVar372._8_4_ + auVar372._8_4_;
                    auVar175._12_4_ = auVar372._12_4_ + auVar372._12_4_;
                    auVar295._8_4_ = 0x7fffffff;
                    auVar295._0_8_ = 0x7fffffff7fffffff;
                    auVar295._12_4_ = 0x7fffffff;
                    auVar423 = vblendvps_avx(auVar175,auVar295,auVar423);
                    auVar296._8_4_ = 0x42b0c0a5;
                    auVar296._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar296._12_4_ = 0x42b0c0a5;
                    auVar423 = vminps_avx(auVar423,auVar296);
                    auVar297._8_4_ = 0xc2b0c0a5;
                    auVar297._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar297._12_4_ = 0xc2b0c0a5;
                    auVar143 = vmaxps_avx(auVar423,auVar297);
                    auVar423 = vfmadd213ps_fma(auVar474,auVar143,auVar342);
                    auVar373._0_4_ = (int)auVar423._0_4_;
                    auVar373._4_4_ = (int)auVar423._4_4_;
                    auVar373._8_4_ = (int)auVar423._8_4_;
                    auVar373._12_4_ = (int)auVar423._12_4_;
                    auVar372 = vcvtdq2ps_avx(auVar373);
                    auVar423 = vcmpps_avx(auVar423,auVar372,1);
                    auVar423 = vandps_avx(auVar423,auVar246);
                    auVar423 = vsubps_avx(auVar372,auVar423);
                    auVar372 = vfmsub231ps_fma(auVar143,auVar423,auVar449);
                    auVar143 = vfnmsub231ps_fma(auVar372,auVar423,auVar468);
                    auVar374._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar374._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar374._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar374._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar372 = vfmadd213ps_fma(auVar361,auVar143,auVar480);
                    auVar362._8_4_ = 0x3c088908;
                    auVar362._0_8_ = 0x3c0889083c088908;
                    auVar362._12_4_ = 0x3c088908;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar362);
                    auVar410 = ZEXT864(0);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar353);
                    auVar358 = ZEXT1664(auVar246);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar248);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar342);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar374,auVar143);
                    auVar176._0_4_ = auVar372._0_4_ + fVar82;
                    auVar176._4_4_ = auVar372._4_4_ + fVar81;
                    auVar176._8_4_ = auVar372._8_4_ + fVar512;
                    auVar176._12_4_ = auVar372._12_4_ + fVar244;
                    auVar298._0_4_ = (int)auVar423._0_4_;
                    auVar298._4_4_ = (int)auVar423._4_4_;
                    auVar298._8_4_ = (int)auVar423._8_4_;
                    auVar298._12_4_ = (int)auVar423._12_4_;
                    auVar423 = vpslld_avx(auVar298,0x17);
                    auVar423 = vpaddd_avx(auVar423,auVar246);
                    auVar423 = vfmadd213ps_fma(auVar423,auVar176,auVar246);
                    auVar246 = vrcpps_avx(auVar423);
                    auVar375._0_4_ = auVar246._0_4_ + auVar246._0_4_;
                    auVar375._4_4_ = auVar246._4_4_ + auVar246._4_4_;
                    auVar375._8_4_ = auVar246._8_4_ + auVar246._8_4_;
                    auVar375._12_4_ = auVar246._12_4_ + auVar246._12_4_;
                    auVar88._8_4_ = 0x40000000;
                    auVar88._0_8_ = 0x4000000040000000;
                    auVar88._12_4_ = 0x40000000;
                    auVar423 = vfmsub213ps_fma(auVar423,auVar375,auVar88);
                    auVar246 = vfnmadd213ps_fma(auVar423,auVar246,auVar375);
                    auVar129 = vfmsub231ps_fma(auVar129,auVar129,auVar246);
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar182._4_4_ = uVar1;
                    auVar182._0_4_ = uVar1;
                    auVar182._8_4_ = uVar1;
                    auVar182._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar299._4_4_ = uVar1;
                    auVar299._0_4_ = uVar1;
                    auVar299._8_4_ = uVar1;
                    auVar299._12_4_ = uVar1;
                    auVar372 = vfmadd231ps_fma(auVar299,auVar129,auVar182);
                    auVar423 = vmaxps_avx(auVar372,auVar423);
                    auVar246 = vminps_avx(auVar423,auVar246);
                    auVar129._0_4_ = auVar246._0_4_ * auVar129._0_4_;
                    auVar129._4_4_ = auVar246._4_4_ * fVar170;
                    auVar129._8_4_ = auVar246._8_4_ * fVar245;
                    auVar129._12_4_ = auVar246._12_4_ * fVar30;
                  }
                  *(undefined1 (*) [16])pAVar67 = auVar129;
                  pAVar67 = pAVar67 + 2;
                  uVar74 = uVar74 + 1;
                  iVar50 = iVar50 + 1;
                } while (uVar74 != local_1a8.w);
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 1) && (uVar73 == 8)) && (0 < (long)local_1a8.c)) {
        p_Var19 = local_148[-3];
        iVar13 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_270 = 0;
        auVar410 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                      CONCAT424(0xc2b0c0a5,
                                                CONCAT420(0xc2b0c0a5,
                                                          CONCAT416(0xc2b0c0a5,
                                                                    CONCAT412(0xc2b0c0a5,
                                                                              CONCAT48(0xc2b0c0a5,
                                                                                                                                                                              
                                                  0xc2b0c0a5c2b0c0a5)))))));
        auVar357._8_4_ = 0x3f000000;
        auVar357._0_8_ = 0x3f0000003f000000;
        auVar357._12_4_ = 0x3f000000;
        auVar357._16_4_ = 0x3f000000;
        auVar357._20_4_ = 0x3f000000;
        auVar357._24_4_ = 0x3f000000;
        auVar357._28_4_ = 0x3f000000;
        auVar420 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(0x3fb8aa3b,
                                                CONCAT420(0x3fb8aa3b,
                                                          CONCAT416(0x3fb8aa3b,
                                                                    CONCAT412(0x3fb8aa3b,
                                                                              CONCAT48(0x3fb8aa3b,
                                                                                                                                                                              
                                                  0x3fb8aa3b3fb8aa3b)))))));
        auVar358 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar168 = ZEXT3264(CONCAT428(0x39506967,
                                      CONCAT424(0x39506967,
                                                CONCAT420(0x39506967,
                                                          CONCAT416(0x39506967,
                                                                    CONCAT412(0x39506967,
                                                                              CONCAT48(0x39506967,
                                                                                                                                                                              
                                                  0x3950696739506967)))))));
        do {
          if (0 < local_1a8.h) {
            iVar69 = bottom_blob->w;
            iVar75 = bottom_blob->h;
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar18 = bottom_blob->c;
            local_250._0_4_ = 0;
            do {
              if (0 < local_1a8.w) {
                uVar74 = 0;
                iVar61 = (1 - uVar15) * iVar13;
                do {
                  if (lVar76 == 0) {
                    auVar485 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar485 = ZEXT3264(*(undefined1 (*) [32])(lVar76 + local_270 * 0x20));
                  }
                  if (0 < (int)uVar18) {
                    pvVar80 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar77 = 0;
                        uVar79 = 0;
                        do {
                          iVar50 = (((int)uVar79 - uVar16) + 1) * iVar14 + (int)local_250;
                          if (((-1 < iVar50) && (iVar48 = iVar50 / iVar60, iVar50 % iVar60 == 0)) &&
                             ((iVar48 < iVar75 && (0 < (int)uVar15)))) {
                            uVar71 = uVar77;
                            uVar64 = (ulong)uVar15;
                            iVar50 = iVar61;
                            do {
                              if (((-1 < iVar50) && (iVar49 = iVar50 / iVar58, iVar50 % iVar58 == 0)
                                  ) && (iVar49 < iVar69)) {
                                uVar1 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar49 * 4 +
                                         (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize
                                         + bottom_blob->cstep * bottom_blob->elemsize * uVar59);
                                auVar234._4_4_ = uVar1;
                                auVar234._0_4_ = uVar1;
                                auVar234._8_4_ = uVar1;
                                auVar234._12_4_ = uVar1;
                                auVar234._16_4_ = uVar1;
                                auVar234._20_4_ = uVar1;
                                auVar234._24_4_ = uVar1;
                                auVar234._28_4_ = uVar1;
                                auVar246 = vfmadd231ps_fma(auVar485._0_32_,auVar234,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar80 +
                                                            (uVar71 & 0xffffffff) * 4));
                                auVar485 = ZEXT1664(auVar246);
                              }
                              uVar71 = uVar71 + 8;
                              iVar50 = iVar50 + iVar13;
                              uVar64 = uVar64 - 1;
                            } while (uVar64 != 0);
                          }
                          uVar79 = uVar79 + 1;
                          uVar77 = uVar77 + (ulong)uVar15 * 8;
                        } while (uVar79 != uVar16);
                      }
                      pvVar80 = (void *)((long)pvVar80 + (long)(int)(uVar15 * uVar16 * 8) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar163 = auVar485._0_32_;
                  auVar482 = auVar358._0_32_;
                  auVar153 = auVar168._0_32_;
                  auVar157 = auVar410._0_32_;
                  auVar159 = auVar420._0_32_;
                  fVar82 = auVar358._0_4_;
                  fVar81 = auVar358._4_4_;
                  fVar512 = auVar358._8_4_;
                  fVar244 = auVar358._12_4_;
                  fVar245 = auVar358._16_4_;
                  fVar30 = auVar358._20_4_;
                  fVar170 = auVar358._24_4_;
                  fVar31 = auVar358._28_4_;
                  auVar169._28_36_ = auVar485._28_36_;
                  switch(uVar17) {
                  case 1:
                    auVar163 = vmaxps_avx(auVar163,_DAT_00596c20);
                    break;
                  case 2:
                    auVar482 = vmaxps_avx(auVar163,ZEXT1632(ZEXT816(0) << 0x40));
                    auVar163 = vminps_avx(auVar163,ZEXT1632(ZEXT816(0) << 0x40));
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar167._4_4_ = uVar1;
                    auVar167._0_4_ = uVar1;
                    auVar167._8_4_ = uVar1;
                    auVar167._12_4_ = uVar1;
                    auVar167._16_4_ = uVar1;
                    auVar167._20_4_ = uVar1;
                    auVar167._24_4_ = uVar1;
                    auVar167._28_4_ = uVar1;
                    auVar246 = vfmadd213ps_fma(auVar167,auVar163,auVar482);
                    auVar163 = ZEXT1632(auVar246);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar241._4_4_ = uVar1;
                    auVar241._0_4_ = uVar1;
                    auVar241._8_4_ = uVar1;
                    auVar241._12_4_ = uVar1;
                    auVar241._16_4_ = uVar1;
                    auVar241._20_4_ = uVar1;
                    auVar241._24_4_ = uVar1;
                    auVar241._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar510._4_4_ = uVar1;
                    auVar510._0_4_ = uVar1;
                    auVar510._8_4_ = uVar1;
                    auVar510._12_4_ = uVar1;
                    auVar510._16_4_ = uVar1;
                    auVar510._20_4_ = uVar1;
                    auVar510._24_4_ = uVar1;
                    auVar510._28_4_ = uVar1;
                    auVar163 = vmaxps_avx(auVar163,auVar241);
                    auVar163 = vminps_avx(auVar510,auVar163);
                    break;
                  case 4:
                    auVar164._0_8_ = auVar485._0_8_ ^ 0x8000000080000000;
                    auVar164._8_4_ = -auVar485._8_4_;
                    auVar164._12_4_ = -auVar485._12_4_;
                    auVar164._16_4_ = -auVar485._16_4_;
                    auVar164._20_4_ = -auVar485._20_4_;
                    auVar164._24_4_ = -auVar485._24_4_;
                    auVar164._28_4_ = auVar485._28_4_ ^ 0x80000000;
                    auVar124._8_4_ = 0x42b0c0a5;
                    auVar124._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar124._12_4_ = 0x42b0c0a5;
                    auVar124._16_4_ = 0x42b0c0a5;
                    auVar124._20_4_ = 0x42b0c0a5;
                    auVar124._24_4_ = 0x42b0c0a5;
                    auVar124._28_4_ = 0x42b0c0a5;
                    auVar163 = vminps_avx(auVar164,auVar124);
                    auVar157 = vmaxps_avx(auVar157,auVar163);
                    auVar246 = vfmadd213ps_fma(auVar159,auVar157,auVar357);
                    auVar159 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar246),auVar159,1);
                    auVar163 = vandps_avx(auVar163,auVar482);
                    auVar163 = vsubps_avx(auVar159,auVar163);
                    auVar125._8_4_ = 0x3f318000;
                    auVar125._0_8_ = 0x3f3180003f318000;
                    auVar125._12_4_ = 0x3f318000;
                    auVar125._16_4_ = 0x3f318000;
                    auVar125._20_4_ = 0x3f318000;
                    auVar125._24_4_ = 0x3f318000;
                    auVar125._28_4_ = 0x3f318000;
                    auVar246 = vfmsub231ps_fma(auVar157,auVar163,auVar125);
                    auVar276._8_4_ = 0x395e8083;
                    auVar276._0_8_ = 0x395e8083395e8083;
                    auVar276._12_4_ = 0x395e8083;
                    auVar276._16_4_ = 0x395e8083;
                    auVar276._20_4_ = 0x395e8083;
                    auVar276._24_4_ = 0x395e8083;
                    auVar276._28_4_ = 0x395e8083;
                    auVar423 = vfmsub231ps_fma(ZEXT1632(auVar246),auVar163,auVar276);
                    auVar157 = ZEXT1632(auVar423);
                    auVar43._28_4_ = auVar159._28_4_;
                    auVar43._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar126._8_4_ = 0x3ab743ce;
                    auVar126._0_8_ = 0x3ab743ce3ab743ce;
                    auVar126._12_4_ = 0x3ab743ce;
                    auVar126._16_4_ = 0x3ab743ce;
                    auVar126._20_4_ = 0x3ab743ce;
                    auVar126._24_4_ = 0x3ab743ce;
                    auVar126._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar153,auVar157,auVar126);
                    auVar277._8_4_ = 0x3c088908;
                    auVar277._0_8_ = 0x3c0889083c088908;
                    auVar277._12_4_ = 0x3c088908;
                    auVar277._16_4_ = 0x3c088908;
                    auVar277._20_4_ = 0x3c088908;
                    auVar277._24_4_ = 0x3c088908;
                    auVar277._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar277);
                    auVar278._8_4_ = 0x3d2aa9c1;
                    auVar278._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar278._12_4_ = 0x3d2aa9c1;
                    auVar278._16_4_ = 0x3d2aa9c1;
                    auVar278._20_4_ = 0x3d2aa9c1;
                    auVar278._24_4_ = 0x3d2aa9c1;
                    auVar278._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar278);
                    auVar279._8_4_ = 0x3e2aaaaa;
                    auVar279._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar279._12_4_ = 0x3e2aaaaa;
                    auVar279._16_4_ = 0x3e2aaaaa;
                    auVar279._20_4_ = 0x3e2aaaaa;
                    auVar279._24_4_ = 0x3e2aaaaa;
                    auVar279._28_4_ = 0x3e2aaaaa;
                    auVar157 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar279);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar357);
                    auVar372 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar43,auVar157);
                    auVar133._0_4_ = (int)auVar163._0_4_;
                    auVar133._4_4_ = (int)auVar163._4_4_;
                    auVar133._8_4_ = (int)auVar163._8_4_;
                    auVar133._12_4_ = (int)auVar163._12_4_;
                    auVar165._16_4_ = (int)auVar163._16_4_;
                    auVar165._0_16_ = auVar133;
                    auVar165._20_4_ = (int)auVar163._20_4_;
                    auVar165._24_4_ = (int)auVar163._24_4_;
                    auVar165._28_4_ = (int)auVar163._28_4_;
                    auVar423 = vpslld_avx(auVar133,0x17);
                    auVar246 = vpslld_avx(auVar165._16_16_,0x17);
                    auVar250._8_4_ = 0x3f800000;
                    auVar250._0_8_ = 0x3f8000003f800000;
                    auVar250._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar246,auVar250);
                    auVar423 = vpaddd_avx(auVar423,auVar250);
                    auVar166._16_16_ = auVar246;
                    auVar166._0_16_ = auVar423;
                    auVar242._0_4_ = auVar372._0_4_ + fVar82;
                    auVar242._4_4_ = auVar372._4_4_ + fVar81;
                    auVar242._8_4_ = auVar372._8_4_ + fVar512;
                    auVar242._12_4_ = auVar372._12_4_ + fVar244;
                    auVar242._16_4_ = fVar245 + 0.0;
                    auVar242._20_4_ = fVar30 + 0.0;
                    auVar242._24_4_ = fVar170 + 0.0;
                    auVar242._28_4_ = fVar31 + 0.0;
                    auVar246 = vfmadd213ps_fma(auVar166,auVar242,auVar482);
                    auVar163 = vrcpps_avx(ZEXT1632(auVar246));
                    auVar246 = vfmsub213ps_fma(ZEXT1632(auVar246),auVar163,auVar482);
                    auVar246 = vfnmadd132ps_fma(ZEXT1632(auVar246),auVar163,auVar163);
                    auVar163 = ZEXT1632(auVar246);
                    break;
                  case 5:
                    auVar464._8_4_ = 0x42b0c0a5;
                    auVar464._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar464._12_4_ = 0x42b0c0a5;
                    auVar464._16_4_ = 0x42b0c0a5;
                    auVar464._20_4_ = 0x42b0c0a5;
                    auVar464._24_4_ = 0x42b0c0a5;
                    auVar464._28_4_ = 0x42b0c0a5;
                    auVar163 = vminps_avx(auVar464,auVar163);
                    auVar235 = vmaxps_avx(auVar157,auVar163);
                    auVar246 = vfmadd213ps_fma(auVar159,auVar235,auVar357);
                    auVar224 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar246),auVar224,1);
                    auVar163 = vandps_avx(auVar163,auVar482);
                    auVar163 = vsubps_avx(auVar224,auVar163);
                    auVar367._8_4_ = 0x3f318000;
                    auVar367._0_8_ = 0x3f3180003f318000;
                    auVar367._12_4_ = 0x3f318000;
                    auVar367._16_4_ = 0x3f318000;
                    auVar367._20_4_ = 0x3f318000;
                    auVar367._24_4_ = 0x3f318000;
                    auVar367._28_4_ = 0x3f318000;
                    auVar246 = vfmsub231ps_fma(auVar235,auVar163,auVar367);
                    auVar116._8_4_ = 0xb95e8083;
                    auVar116._0_8_ = 0xb95e8083b95e8083;
                    auVar116._12_4_ = 0xb95e8083;
                    auVar116._16_4_ = 0xb95e8083;
                    auVar116._20_4_ = 0xb95e8083;
                    auVar116._24_4_ = 0xb95e8083;
                    auVar116._28_4_ = 0xb95e8083;
                    auVar423 = vfnmsub231ps_fma(ZEXT1632(auVar246),auVar163,auVar116);
                    auVar235 = ZEXT1632(auVar423);
                    auVar40._28_4_ = auVar224._28_4_;
                    auVar40._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar484._8_4_ = 0x3ab743ce;
                    auVar484._0_8_ = 0x3ab743ce3ab743ce;
                    auVar484._12_4_ = 0x3ab743ce;
                    auVar484._16_4_ = 0x3ab743ce;
                    auVar484._20_4_ = 0x3ab743ce;
                    auVar484._24_4_ = 0x3ab743ce;
                    auVar484._28_4_ = 0x3ab743ce;
                    auVar246 = vfmadd213ps_fma(auVar153,auVar235,auVar484);
                    auVar400._8_4_ = 0x3c088908;
                    auVar400._0_8_ = 0x3c0889083c088908;
                    auVar400._12_4_ = 0x3c088908;
                    auVar400._16_4_ = 0x3c088908;
                    auVar400._20_4_ = 0x3c088908;
                    auVar400._24_4_ = 0x3c088908;
                    auVar400._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar235,auVar400);
                    auVar341._8_4_ = 0x3d2aa9c1;
                    auVar341._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar341._12_4_ = 0x3d2aa9c1;
                    auVar341._16_4_ = 0x3d2aa9c1;
                    auVar341._20_4_ = 0x3d2aa9c1;
                    auVar341._24_4_ = 0x3d2aa9c1;
                    auVar341._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar235,auVar341);
                    auVar117._8_4_ = 0x3e2aaaaa;
                    auVar117._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar117._12_4_ = 0x3e2aaaaa;
                    auVar117._16_4_ = 0x3e2aaaaa;
                    auVar117._20_4_ = 0x3e2aaaaa;
                    auVar117._24_4_ = 0x3e2aaaaa;
                    auVar117._28_4_ = 0x3e2aaaaa;
                    auVar235 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar235,auVar117);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar235,auVar357);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar40,auVar235);
                    auVar236._0_4_ = auVar246._0_4_ + fVar82;
                    auVar236._4_4_ = auVar246._4_4_ + fVar81;
                    auVar236._8_4_ = auVar246._8_4_ + fVar512;
                    auVar236._12_4_ = auVar246._12_4_ + fVar244;
                    auVar236._16_4_ = fVar245 + 0.0;
                    auVar236._20_4_ = fVar30 + 0.0;
                    auVar236._24_4_ = fVar170 + 0.0;
                    auVar236._28_4_ = fVar31 + 0.0;
                    auVar249._0_4_ = (int)auVar163._0_4_;
                    auVar249._4_4_ = (int)auVar163._4_4_;
                    auVar249._8_4_ = (int)auVar163._8_4_;
                    auVar249._12_4_ = (int)auVar163._12_4_;
                    auVar272._16_4_ = (int)auVar163._16_4_;
                    auVar272._0_16_ = auVar249;
                    auVar272._20_4_ = (int)auVar163._20_4_;
                    auVar272._24_4_ = (int)auVar163._24_4_;
                    auVar272._28_4_ = (int)auVar163._28_4_;
                    auVar423 = vpslld_avx(auVar249,0x17);
                    auVar246 = vpslld_avx(auVar272._16_16_,0x17);
                    auVar378._8_4_ = 0x3f800000;
                    auVar378._0_8_ = 0x3f8000003f800000;
                    auVar378._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar378,auVar246);
                    auVar423 = vpaddd_avx(auVar423,auVar378);
                    auVar508._16_16_ = auVar246;
                    auVar508._0_16_ = auVar423;
                    auVar372 = vfmadd213ps_fma(auVar508,auVar236,auVar482);
                    auVar118._8_4_ = 0x800000;
                    auVar118._0_8_ = 0x80000000800000;
                    auVar118._12_4_ = 0x800000;
                    auVar118._16_4_ = 0x800000;
                    auVar118._20_4_ = 0x800000;
                    auVar118._24_4_ = 0x800000;
                    auVar118._28_4_ = 0x800000;
                    auVar163 = vmaxps_avx(ZEXT1632(auVar372),auVar118);
                    auVar423 = vpsrld_avx(auVar163._0_16_,0x17);
                    auVar246 = vpsrld_avx(auVar163._16_16_,0x17);
                    auVar119._8_4_ = 0x807fffff;
                    auVar119._0_8_ = 0x807fffff807fffff;
                    auVar119._12_4_ = 0x807fffff;
                    auVar119._16_4_ = 0x807fffff;
                    auVar119._20_4_ = 0x807fffff;
                    auVar119._24_4_ = 0x807fffff;
                    auVar119._28_4_ = 0x807fffff;
                    auVar163 = vandps_avx(auVar163,auVar119);
                    auVar224 = vorps_avx(auVar163,auVar357);
                    auVar120._8_4_ = 0x3f3504f3;
                    auVar120._0_8_ = 0x3f3504f33f3504f3;
                    auVar120._12_4_ = 0x3f3504f3;
                    auVar120._16_4_ = 0x3f3504f3;
                    auVar120._20_4_ = 0x3f3504f3;
                    auVar120._24_4_ = 0x3f3504f3;
                    auVar120._28_4_ = 0x3f3504f3;
                    auVar235 = vcmpps_avx(auVar120,auVar224,2);
                    auVar163 = vandnps_avx(auVar235,auVar224);
                    auVar237._0_4_ = auVar163._0_4_ + auVar224._0_4_ + -1.0;
                    auVar237._4_4_ = auVar163._4_4_ + auVar224._4_4_ + -1.0;
                    auVar237._8_4_ = auVar163._8_4_ + auVar224._8_4_ + -1.0;
                    auVar237._12_4_ = auVar163._12_4_ + auVar224._12_4_ + -1.0;
                    auVar237._16_4_ = auVar163._16_4_ + auVar224._16_4_ + -1.0;
                    auVar237._20_4_ = auVar163._20_4_ + auVar224._20_4_ + -1.0;
                    auVar237._24_4_ = auVar163._24_4_ + auVar224._24_4_ + -1.0;
                    auVar237._28_4_ = auVar163._28_4_ + auVar224._28_4_ + -1.0;
                    auVar246 = vpsubd_avx(auVar246,auVar235._16_16_);
                    auVar450._8_4_ = 0xffffff81;
                    auVar450._0_8_ = 0xffffff81ffffff81;
                    auVar450._12_4_ = 0xffffff81;
                    auVar246 = vpaddd_avx(auVar246,auVar450);
                    auVar423 = vpsubd_avx(auVar423,auVar235._0_16_);
                    auVar423 = vpaddd_avx(auVar450,auVar423);
                    auVar273._16_16_ = auVar246;
                    auVar273._0_16_ = auVar423;
                    auVar41._4_4_ = auVar237._4_4_ * auVar237._4_4_;
                    auVar41._0_4_ = auVar237._0_4_ * auVar237._0_4_;
                    auVar41._8_4_ = auVar237._8_4_ * auVar237._8_4_;
                    auVar41._12_4_ = auVar237._12_4_ * auVar237._12_4_;
                    auVar41._16_4_ = auVar237._16_4_ * auVar237._16_4_;
                    auVar41._20_4_ = auVar237._20_4_ * auVar237._20_4_;
                    auVar41._24_4_ = auVar237._24_4_ * auVar237._24_4_;
                    auVar41._28_4_ = auVar235._28_4_;
                    auVar443._8_4_ = 0x3d9021bb;
                    auVar443._0_8_ = 0x3d9021bb3d9021bb;
                    auVar443._12_4_ = 0x3d9021bb;
                    auVar443._16_4_ = 0x3d9021bb;
                    auVar443._20_4_ = 0x3d9021bb;
                    auVar443._24_4_ = 0x3d9021bb;
                    auVar443._28_4_ = 0x3d9021bb;
                    auVar401._8_4_ = 0xbdebd1b8;
                    auVar401._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar401._12_4_ = 0xbdebd1b8;
                    auVar401._16_4_ = 0xbdebd1b8;
                    auVar401._20_4_ = 0xbdebd1b8;
                    auVar401._24_4_ = 0xbdebd1b8;
                    auVar401._28_4_ = 0xbdebd1b8;
                    auVar246 = vfmadd213ps_fma(auVar443,auVar237,auVar401);
                    auVar402._8_4_ = 0x3def251a;
                    auVar402._0_8_ = 0x3def251a3def251a;
                    auVar402._12_4_ = 0x3def251a;
                    auVar402._16_4_ = 0x3def251a;
                    auVar402._20_4_ = 0x3def251a;
                    auVar402._24_4_ = 0x3def251a;
                    auVar402._28_4_ = 0x3def251a;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar402);
                    auVar403._8_4_ = 0xbdfe5d4f;
                    auVar403._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar403._12_4_ = 0xbdfe5d4f;
                    auVar403._16_4_ = 0xbdfe5d4f;
                    auVar403._20_4_ = 0xbdfe5d4f;
                    auVar403._24_4_ = 0xbdfe5d4f;
                    auVar403._28_4_ = 0xbdfe5d4f;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar403);
                    auVar404._8_4_ = 0x3e11e9bf;
                    auVar404._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar404._12_4_ = 0x3e11e9bf;
                    auVar404._16_4_ = 0x3e11e9bf;
                    auVar404._20_4_ = 0x3e11e9bf;
                    auVar404._24_4_ = 0x3e11e9bf;
                    auVar404._28_4_ = 0x3e11e9bf;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar404);
                    auVar405._8_4_ = 0xbe2aae50;
                    auVar405._0_8_ = 0xbe2aae50be2aae50;
                    auVar405._12_4_ = 0xbe2aae50;
                    auVar405._16_4_ = 0xbe2aae50;
                    auVar405._20_4_ = 0xbe2aae50;
                    auVar405._24_4_ = 0xbe2aae50;
                    auVar405._28_4_ = 0xbe2aae50;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar405);
                    auVar406._8_4_ = 0x3e4cceac;
                    auVar406._0_8_ = 0x3e4cceac3e4cceac;
                    auVar406._12_4_ = 0x3e4cceac;
                    auVar406._16_4_ = 0x3e4cceac;
                    auVar406._20_4_ = 0x3e4cceac;
                    auVar406._24_4_ = 0x3e4cceac;
                    auVar406._28_4_ = 0x3e4cceac;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar406);
                    auVar407._8_4_ = 0xbe7ffffc;
                    auVar407._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar407._12_4_ = 0xbe7ffffc;
                    auVar407._16_4_ = 0xbe7ffffc;
                    auVar407._20_4_ = 0xbe7ffffc;
                    auVar407._24_4_ = 0xbe7ffffc;
                    auVar407._28_4_ = 0xbe7ffffc;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar407);
                    auVar408._8_4_ = 0x3eaaaaaa;
                    auVar408._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar408._12_4_ = 0x3eaaaaaa;
                    auVar408._16_4_ = 0x3eaaaaaa;
                    auVar408._20_4_ = 0x3eaaaaaa;
                    auVar408._24_4_ = 0x3eaaaaaa;
                    auVar408._28_4_ = 0x3eaaaaaa;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar237,auVar408);
                    auVar444._0_4_ =
                         auVar237._0_4_ * auVar237._0_4_ * auVar237._0_4_ * auVar246._0_4_;
                    auVar444._4_4_ =
                         auVar237._4_4_ * auVar237._4_4_ * auVar237._4_4_ * auVar246._4_4_;
                    auVar444._8_4_ =
                         auVar237._8_4_ * auVar237._8_4_ * auVar237._8_4_ * auVar246._8_4_;
                    auVar444._12_4_ =
                         auVar237._12_4_ * auVar237._12_4_ * auVar237._12_4_ * auVar246._12_4_;
                    auVar444._16_4_ = auVar237._16_4_ * auVar237._16_4_ * auVar237._16_4_ * 0.0;
                    auVar444._20_4_ = auVar237._20_4_ * auVar237._20_4_ * auVar237._20_4_ * 0.0;
                    auVar444._24_4_ = auVar237._24_4_ * auVar237._24_4_ * auVar237._24_4_ * 0.0;
                    auVar444._28_4_ = 0;
                    auVar235 = vcvtdq2ps_avx(auVar273);
                    auVar465._8_4_ = 0xb95e8083;
                    auVar465._0_8_ = 0xb95e8083b95e8083;
                    auVar465._12_4_ = 0xb95e8083;
                    auVar465._16_4_ = 0xb95e8083;
                    auVar465._20_4_ = 0xb95e8083;
                    auVar465._24_4_ = 0xb95e8083;
                    auVar465._28_4_ = 0xb95e8083;
                    auVar246 = vfmadd231ps_fma(auVar444,auVar235,auVar465);
                    auVar246 = vfmsub231ps_fma(ZEXT1632(auVar246),auVar357,auVar41);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar372),ZEXT832(0) << 0x20,2);
                    auVar224 = vsubps_avx(ZEXT1632(auVar246),auVar237);
                    auVar246 = vfmsub231ps_fma(auVar224,auVar367,auVar235);
                    auVar409._8_4_ = 0xc0000000;
                    auVar409._0_8_ = 0xc0000000c0000000;
                    auVar409._12_4_ = 0xc0000000;
                    auVar409._16_4_ = 0xc0000000;
                    auVar409._20_4_ = 0xc0000000;
                    auVar409._24_4_ = 0xc0000000;
                    auVar409._28_4_ = 0xc0000000;
                    auVar238._0_4_ = auVar246._0_4_ * -2.0;
                    auVar238._4_4_ = auVar246._4_4_ * -2.0;
                    auVar238._8_4_ = auVar246._8_4_ * -2.0;
                    auVar238._12_4_ = auVar246._12_4_ * -2.0;
                    auVar238._16_4_ = 0x80000000;
                    auVar238._20_4_ = 0x80000000;
                    auVar238._24_4_ = 0x80000000;
                    auVar238._28_4_ = 0;
                    auVar274._8_4_ = 0x7fffffff;
                    auVar274._0_8_ = 0x7fffffff7fffffff;
                    auVar274._12_4_ = 0x7fffffff;
                    auVar274._16_4_ = 0x7fffffff;
                    auVar274._20_4_ = 0x7fffffff;
                    auVar274._24_4_ = 0x7fffffff;
                    auVar274._28_4_ = 0x7fffffff;
                    auVar163 = vblendvps_avx(auVar238,auVar274,auVar163);
                    auVar163 = vminps_avx(auVar464,auVar163);
                    auVar410 = ZEXT3264(auVar157);
                    auVar157 = vmaxps_avx(auVar157,auVar163);
                    auVar420 = ZEXT3264(auVar159);
                    auVar246 = vfmadd213ps_fma(auVar159,auVar157,auVar357);
                    auVar159 = vroundps_avx(ZEXT1632(auVar246),1);
                    auVar163 = vcmpps_avx(ZEXT1632(auVar246),auVar159,1);
                    auVar163 = vandps_avx(auVar163,auVar482);
                    auVar163 = vsubps_avx(auVar159,auVar163);
                    auVar246 = vfmsub231ps_fma(auVar157,auVar163,auVar367);
                    auVar423 = vfnmsub231ps_fma(ZEXT1632(auVar246),auVar163,auVar465);
                    auVar157 = ZEXT1632(auVar423);
                    auVar42._28_4_ = auVar159._28_4_;
                    auVar42._0_28_ =
                         ZEXT1628(CONCAT412(auVar423._12_4_ * auVar423._12_4_,
                                            CONCAT48(auVar423._8_4_ * auVar423._8_4_,
                                                     CONCAT44(auVar423._4_4_ * auVar423._4_4_,
                                                              auVar423._0_4_ * auVar423._0_4_))));
                    auVar168 = ZEXT3264(auVar153);
                    auVar246 = vfmadd213ps_fma(auVar153,auVar157,auVar484);
                    auVar509._8_4_ = 0x3c088908;
                    auVar509._0_8_ = 0x3c0889083c088908;
                    auVar509._12_4_ = 0x3c088908;
                    auVar509._16_4_ = 0x3c088908;
                    auVar509._20_4_ = 0x3c088908;
                    auVar509._24_4_ = 0x3c088908;
                    auVar509._28_4_ = 0x3c088908;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar509);
                    auVar121._8_4_ = 0x3d2aa9c1;
                    auVar121._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar121._12_4_ = 0x3d2aa9c1;
                    auVar121._16_4_ = 0x3d2aa9c1;
                    auVar121._20_4_ = 0x3d2aa9c1;
                    auVar121._24_4_ = 0x3d2aa9c1;
                    auVar121._28_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar121);
                    auVar122._8_4_ = 0x3e2aaaaa;
                    auVar122._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar122._12_4_ = 0x3e2aaaaa;
                    auVar122._16_4_ = 0x3e2aaaaa;
                    auVar122._20_4_ = 0x3e2aaaaa;
                    auVar122._24_4_ = 0x3e2aaaaa;
                    auVar122._28_4_ = 0x3e2aaaaa;
                    auVar157 = ZEXT1632(auVar423);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar122);
                    auVar246 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar157,auVar357);
                    auVar372 = vfmadd213ps_fma(ZEXT1632(auVar246),auVar42,auVar157);
                    auVar358 = ZEXT3264(auVar482);
                    auVar183._0_4_ = (int)auVar163._0_4_;
                    auVar183._4_4_ = (int)auVar163._4_4_;
                    auVar183._8_4_ = (int)auVar163._8_4_;
                    auVar183._12_4_ = (int)auVar163._12_4_;
                    auVar239._16_4_ = (int)auVar163._16_4_;
                    auVar239._0_16_ = auVar183;
                    auVar239._20_4_ = (int)auVar163._20_4_;
                    auVar239._24_4_ = (int)auVar163._24_4_;
                    auVar239._28_4_ = (int)auVar163._28_4_;
                    auVar423 = vpslld_avx(auVar183,0x17);
                    auVar246 = vpslld_avx(auVar239._16_16_,0x17);
                    auVar300._8_4_ = 0x3f800000;
                    auVar300._0_8_ = 0x3f8000003f800000;
                    auVar300._12_4_ = 0x3f800000;
                    auVar246 = vpaddd_avx(auVar246,auVar300);
                    auVar423 = vpaddd_avx(auVar423,auVar300);
                    auVar240._16_16_ = auVar246;
                    auVar240._0_16_ = auVar423;
                    auVar275._0_4_ = auVar372._0_4_ + fVar82;
                    auVar275._4_4_ = auVar372._4_4_ + fVar81;
                    auVar275._8_4_ = auVar372._8_4_ + fVar512;
                    auVar275._12_4_ = auVar372._12_4_ + fVar244;
                    auVar275._16_4_ = fVar245 + 0.0;
                    auVar275._20_4_ = fVar30 + 0.0;
                    auVar275._24_4_ = fVar170 + 0.0;
                    auVar275._28_4_ = fVar31 + 0.0;
                    auVar246 = vfmadd213ps_fma(auVar240,auVar275,auVar482);
                    auVar163 = vrcpps_avx(ZEXT1632(auVar246));
                    auVar246 = vfmsub213ps_fma(ZEXT1632(auVar246),auVar163,auVar482);
                    auVar246 = vfnmadd132ps_fma(ZEXT1632(auVar246),auVar163,auVar163);
                    auVar123._8_4_ = 0xbf800000;
                    auVar123._0_8_ = 0xbf800000bf800000;
                    auVar123._12_4_ = 0xbf800000;
                    auVar123._16_4_ = 0xbf800000;
                    auVar123._20_4_ = 0xbf800000;
                    auVar123._24_4_ = 0xbf800000;
                    auVar123._28_4_ = 0xbf800000;
                    auVar246 = vfnmadd213ps_fma(ZEXT1632(auVar246),auVar409,auVar123);
                    auVar210 = ZEXT1628(auVar246);
                    goto LAB_002930d9;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar243._4_4_ = uVar1;
                    auVar243._0_4_ = uVar1;
                    auVar243._8_4_ = uVar1;
                    auVar243._12_4_ = uVar1;
                    auVar243._16_4_ = uVar1;
                    auVar243._20_4_ = uVar1;
                    auVar243._24_4_ = uVar1;
                    auVar243._28_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar280._4_4_ = uVar1;
                    auVar280._0_4_ = uVar1;
                    auVar280._8_4_ = uVar1;
                    auVar280._12_4_ = uVar1;
                    auVar280._16_4_ = uVar1;
                    auVar280._20_4_ = uVar1;
                    auVar280._24_4_ = uVar1;
                    auVar280._28_4_ = uVar1;
                    auVar246 = vfmadd231ps_fma(auVar280,auVar163,auVar243);
                    auVar163 = vmaxps_avx(ZEXT1632(auVar246),_DAT_00596c20);
                    auVar163 = vminps_avx(auVar163,auVar482);
                    auVar210 = auVar163._0_28_;
LAB_002930d9:
                    auVar169._0_4_ = auVar210._0_4_ * auVar485._0_4_;
                    auVar169._4_4_ = auVar210._4_4_ * auVar485._4_4_;
                    auVar169._8_4_ = auVar210._8_4_ * auVar485._8_4_;
                    auVar169._12_4_ = auVar210._12_4_ * auVar485._12_4_;
                    auVar169._16_4_ = auVar210._16_4_ * auVar485._16_4_;
                    auVar169._20_4_ = auVar210._20_4_ * auVar485._20_4_;
                    auVar169._24_4_ = auVar210._24_4_ * auVar485._24_4_;
                    auVar163 = auVar169._0_32_;
                  }
                  *(undefined1 (*) [32])pAVar67 = auVar163;
                  pAVar67 = pAVar67 + 4;
                  uVar74 = uVar74 + 1;
                  iVar61 = iVar61 + 1;
                } while (uVar74 != local_1a8.w);
              }
              local_250._0_4_ = (int)local_250 + 1;
            } while ((int)local_250 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 8) && (uVar73 == 1)) && (local_120 = (long)local_1a8.c, 0 < local_120)
         ) {
        p_Var19 = local_148[-3];
        iVar13 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar14 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        iVar69 = *(int *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_130 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize) * local_1a8.cstep;
        local_138 = (Allocator *)local_1a8.data;
        iVar75 = bottom_blob->w;
        iVar61 = bottom_blob->h;
        uVar18 = bottom_blob->c;
        local_270 = 0;
        do {
          if (0 < iVar57) {
            sVar24 = (this->weight_data_tm).cstep;
            sVar25 = (this->weight_data_tm).elemsize;
            local_228 = (Allocator *)((long)&local_138->_vptr_Allocator + local_130 * local_270);
            pvVar80 = (this->weight_data_tm).data;
            iVar50 = 0;
            do {
              if (0 < iVar78) {
                iVar49 = bottom_blob->w;
                pvVar23 = bottom_blob->data;
                sVar26 = bottom_blob->elemsize;
                sVar27 = bottom_blob->cstep;
                pfVar62 = *(float **)(&this->field_0x118 + (long)p_Var19);
                uVar74 = 0;
                iVar48 = (1 - uVar15) * iVar13;
                do {
                  if (lVar76 == 0) {
                    fVar82 = 0.0;
                  }
                  else {
                    fVar82 = *(float *)(lVar76 + local_270 * 4);
                  }
                  if ((int)uVar18 < 1) {
                    auVar163 = SUB6432(ZEXT864(0),0);
                  }
                  else {
                    auVar358 = ZEXT864(0);
                    uVar59 = 0;
                    pvVar68 = (void *)(sVar24 * local_270 * sVar25 + (long)pvVar80);
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar51 = (((int)uVar77 - uVar16) + 1) * iVar14 + iVar50;
                          if (((-1 < iVar51) && (iVar52 = iVar51 / iVar60, iVar51 % iVar60 == 0)) &&
                             ((0 < (int)uVar15 && (iVar52 < iVar61)))) {
                            uVar71 = (ulong)uVar15;
                            uVar64 = uVar79;
                            iVar51 = iVar48;
                            do {
                              if (((-1 < iVar51) && (iVar53 = iVar51 / iVar58, iVar51 % iVar58 == 0)
                                  ) && (iVar53 < iVar75)) {
                                auVar246 = vfmadd231ps_fma(auVar358._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar23 +
                                                            (long)(iVar53 << 3) * 4 +
                                                            (long)iVar52 * (long)iVar49 * sVar26 +
                                                            sVar27 * sVar26 * uVar59),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar68 +
                                                            (uVar64 & 0xffffffff) * 4));
                                auVar358 = ZEXT1664(auVar246);
                              }
                              uVar64 = uVar64 + 8;
                              iVar51 = iVar51 + iVar13;
                              uVar71 = uVar71 - 1;
                            } while (uVar71 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 8;
                        } while (uVar77 != uVar16);
                      }
                      auVar163 = auVar358._0_32_;
                      pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar15 * uVar16 * 8) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar134._0_4_ = auVar163._16_4_ + auVar163._0_4_;
                  auVar134._4_4_ = auVar163._20_4_ + auVar163._4_4_;
                  auVar134._8_4_ = auVar163._24_4_ + auVar163._8_4_;
                  auVar134._12_4_ = auVar163._28_4_ + auVar163._12_4_;
                  auVar246 = vshufpd_avx(auVar134,auVar134,1);
                  auVar135._0_4_ = auVar246._0_4_ + auVar134._0_4_;
                  auVar135._4_4_ = auVar246._4_4_ + auVar134._4_4_;
                  auVar135._8_4_ = auVar246._8_4_ + auVar134._8_4_;
                  auVar135._12_4_ = auVar246._12_4_ + auVar134._12_4_;
                  auVar246 = vmovshdup_avx(auVar135);
                  fVar82 = auVar246._0_4_ + fVar82 + auVar135._0_4_;
                  auVar246 = ZEXT416((uint)fVar82);
                  fVar81 = fVar82;
                  if (iVar69 - 1U < 6) {
                    switch(iVar69) {
                    case 1:
                      auVar246 = vmaxss_avx(ZEXT416((uint)fVar82),ZEXT416(0));
                      fVar81 = auVar246._0_4_;
                      break;
                    case 2:
                      auVar92._0_12_ = ZEXT812(0);
                      auVar92._12_4_ = 0;
                      auVar246 = vcmpss_avx(auVar92,ZEXT416((uint)fVar82),1);
                      auVar185._8_4_ = 0x3f800000;
                      auVar185._0_8_ = 0x3f8000003f800000;
                      auVar185._12_4_ = 0x3f800000;
                      auVar246 = vblendvps_avx(ZEXT416((uint)*pfVar62),auVar185,auVar246);
                      fVar81 = auVar246._0_4_ * fVar82;
                      break;
                    case 3:
                      auVar246 = vmaxss_avx(auVar246,ZEXT416((uint)*pfVar62));
                      fVar81 = auVar246._0_4_;
                      if (pfVar62[1] < auVar246._0_4_) {
                        fVar81 = pfVar62[1];
                      }
                      break;
                    case 4:
                      auVar246 = vminss_avx(auVar246,ZEXT416(0x42b0c0a5));
                      auVar136._0_8_ = auVar246._0_8_ ^ 0x8000000080000000;
                      auVar136._8_4_ = auVar246._8_4_ ^ 0x80000000;
                      auVar136._12_4_ = auVar246._12_4_ ^ 0x80000000;
                      auVar246 = vcmpss_avx(auVar246,ZEXT416(0xc2b0c0a5),1);
                      auVar184._8_4_ = 0x42b0c0a5;
                      auVar184._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar184._12_4_ = 0x42b0c0a5;
                      auVar246 = vblendvps_avx(auVar136,auVar184,auVar246);
                      fVar82 = expf(auVar246._0_4_);
                      fVar81 = 1.0 / (fVar82 + 1.0);
                      break;
                    case 5:
                      fVar81 = expf(fVar82);
                      fVar81 = logf(fVar81 + 1.0);
                      fVar81 = tanhf(fVar81);
                      fVar81 = fVar81 * fVar82;
                      break;
                    case 6:
                      fVar512 = *pfVar62;
                      fVar244 = -pfVar62[1] / fVar512;
                      fVar81 = 0.0;
                      if ((fVar244 <= fVar82) &&
                         (fVar81 = fVar82, fVar82 <= fVar244 + 1.0 / fVar512)) {
                        auVar246 = vfmadd213ss_fma(ZEXT416((uint)fVar512),auVar246,
                                                   ZEXT416((uint)pfVar62[1]));
                        fVar81 = auVar246._0_4_ * fVar82;
                      }
                    }
                  }
                  *(float *)&local_228->_vptr_Allocator = fVar81;
                  local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + 4);
                  uVar74 = uVar74 + 1;
                  iVar48 = iVar48 + 1;
                } while (uVar74 != iVar78);
              }
              iVar50 = iVar50 + 1;
            } while (iVar50 != iVar57);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_120);
      }
      iVar14 = local_1a8.h;
      iVar13 = local_1a8.w;
      if ((((int)local_160 == 4) && (uVar73 == 4)) && (0 < (long)local_1a8.c)) {
        p_Var19 = local_148[-3];
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar57 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_270 = 0;
        auVar410 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar354._8_4_ = 0x3f000000;
        auVar354._0_8_ = 0x3f0000003f000000;
        auVar354._12_4_ = 0x3f000000;
        auVar358 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar481._8_4_ = 0x3ab743ce;
        auVar481._0_8_ = 0x3ab743ce3ab743ce;
        auVar481._12_4_ = 0x3ab743ce;
        auVar251._8_4_ = 0x3c088908;
        auVar251._0_8_ = 0x3c0889083c088908;
        auVar251._12_4_ = 0x3c088908;
        do {
          if (0 < local_1a8.h) {
            iVar69 = bottom_blob->w;
            iVar75 = bottom_blob->h;
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar18 = bottom_blob->c;
            iVar61 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar74 = 0;
                iVar50 = (1 - uVar15) * iVar78;
                do {
                  if (lVar76 == 0) {
                    auVar137 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar137 = *(undefined1 (*) [16])(lVar76 + local_270 * 0x10);
                  }
                  auVar420 = ZEXT1664(auVar137);
                  if (0 < (int)uVar18) {
                    pvVar80 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar23 = bottom_blob->data;
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar48 = (((int)uVar77 - uVar16) + 1) * iVar57 + iVar61;
                          if (((-1 < iVar48) && (iVar49 = iVar48 / iVar60, iVar48 % iVar60 == 0)) &&
                             ((0 < (int)uVar15 && (iVar49 < iVar75)))) {
                            lVar70 = (long)iVar49 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                            uVar71 = uVar79;
                            uVar64 = (ulong)uVar15;
                            iVar48 = iVar50;
                            do {
                              if (((-1 < iVar48) && (iVar49 = iVar48 / iVar58, iVar48 % iVar58 == 0)
                                  ) && (iVar49 < iVar69)) {
                                lVar55 = (long)(iVar49 << 2);
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70);
                                auVar186._4_4_ = uVar1;
                                auVar186._0_4_ = uVar1;
                                auVar186._8_4_ = uVar1;
                                auVar186._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 4);
                                auVar301._4_4_ = uVar1;
                                auVar301._0_4_ = uVar1;
                                auVar301._8_4_ = uVar1;
                                auVar301._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 8);
                                auVar379._4_4_ = uVar1;
                                auVar379._0_4_ = uVar1;
                                auVar379._8_4_ = uVar1;
                                auVar379._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar23 + lVar55 * 4 + lVar70 + 0xc);
                                auVar415._4_4_ = uVar1;
                                auVar415._0_4_ = uVar1;
                                auVar415._8_4_ = uVar1;
                                auVar415._12_4_ = uVar1;
                                uVar56 = uVar71 & 0xffffffff;
                                auVar246 = vfmadd231ps_fma(auVar420._0_16_,auVar186,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar301,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x10));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar379,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x20));
                                auVar246 = vfmadd231ps_fma(auVar246,auVar415,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 + uVar56 * 4 + 0x30));
                                auVar420 = ZEXT1664(auVar246);
                              }
                              uVar71 = uVar71 + 0x10;
                              iVar48 = iVar48 + iVar78;
                              uVar64 = uVar64 - 1;
                            } while (uVar64 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 0x10;
                        } while (uVar77 != uVar16);
                      }
                      auVar137 = auVar420._0_16_;
                      pvVar80 = (void *)((long)pvVar80 + (long)(int)(uVar15 * uVar16 * 0x10) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar423 = auVar410._0_16_;
                  auVar246 = auVar358._0_16_;
                  fVar82 = auVar358._0_4_;
                  fVar81 = auVar358._4_4_;
                  fVar512 = auVar358._8_4_;
                  fVar244 = auVar358._12_4_;
                  fVar170 = auVar137._4_4_;
                  fVar245 = auVar137._8_4_;
                  fVar30 = auVar137._12_4_;
                  switch(uVar17) {
                  case 1:
                    auVar137 = vmaxps_avx(auVar423,auVar137);
                    break;
                  case 2:
                    auVar246 = vmaxps_avx(auVar423,auVar137);
                    auVar423 = vminps_avx(auVar423,auVar137);
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar140._4_4_ = uVar1;
                    auVar140._0_4_ = uVar1;
                    auVar140._8_4_ = uVar1;
                    auVar140._12_4_ = uVar1;
                    auVar137 = vfmadd213ps_fma(auVar140,auVar423,auVar246);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar384._4_4_ = uVar1;
                    auVar384._0_4_ = uVar1;
                    auVar384._8_4_ = uVar1;
                    auVar384._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar495._4_4_ = uVar1;
                    auVar495._0_4_ = uVar1;
                    auVar495._8_4_ = uVar1;
                    auVar495._12_4_ = uVar1;
                    auVar246 = vmaxps_avx(auVar384,auVar137);
                    auVar137 = vminps_avx(auVar495,auVar246);
                    break;
                  case 4:
                    auVar138._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
                    auVar138._8_4_ = -fVar245;
                    auVar138._12_4_ = -fVar30;
                    auVar192._8_4_ = 0x42b0c0a5;
                    auVar192._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar192._12_4_ = 0x42b0c0a5;
                    auVar423 = vminps_avx(auVar138,auVar192);
                    auVar193._8_4_ = 0xc2b0c0a5;
                    auVar193._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar193._12_4_ = 0xc2b0c0a5;
                    auVar143 = vmaxps_avx(auVar423,auVar193);
                    auVar385._8_4_ = 0x3fb8aa3b;
                    auVar385._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar385._12_4_ = 0x3fb8aa3b;
                    auVar423 = vfmadd213ps_fma(auVar385,auVar143,auVar354);
                    auVar496._0_4_ = (int)auVar423._0_4_;
                    auVar496._4_4_ = (int)auVar423._4_4_;
                    auVar496._8_4_ = (int)auVar423._8_4_;
                    auVar496._12_4_ = (int)auVar423._12_4_;
                    auVar372 = vcvtdq2ps_avx(auVar496);
                    auVar423 = vcmpps_avx(auVar423,auVar372,1);
                    auVar423 = vandps_avx(auVar423,auVar246);
                    auVar423 = vsubps_avx(auVar372,auVar423);
                    auVar95._8_4_ = 0x3f318000;
                    auVar95._0_8_ = 0x3f3180003f318000;
                    auVar95._12_4_ = 0x3f318000;
                    auVar372 = vfmsub231ps_fma(auVar143,auVar423,auVar95);
                    auVar194._8_4_ = 0x395e8083;
                    auVar194._0_8_ = 0x395e8083395e8083;
                    auVar194._12_4_ = 0x395e8083;
                    auVar143 = vfmsub231ps_fma(auVar372,auVar423,auVar194);
                    auVar497._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar497._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar497._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar497._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar429._8_4_ = 0x39506967;
                    auVar429._0_8_ = 0x3950696739506967;
                    auVar429._12_4_ = 0x39506967;
                    auVar195._8_4_ = 0x3ab743ce;
                    auVar195._0_8_ = 0x3ab743ce3ab743ce;
                    auVar195._12_4_ = 0x3ab743ce;
                    auVar372 = vfmadd213ps_fma(auVar429,auVar143,auVar195);
                    auVar196._8_4_ = 0x3c088908;
                    auVar196._0_8_ = 0x3c0889083c088908;
                    auVar196._12_4_ = 0x3c088908;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar196);
                    auVar96._8_4_ = 0x3d2aa9c1;
                    auVar96._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar96._12_4_ = 0x3d2aa9c1;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar96);
                    auVar97._8_4_ = 0x3e2aaaaa;
                    auVar97._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar97._12_4_ = 0x3e2aaaaa;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar97);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar354);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar497,auVar143);
                    auVar430._0_4_ = auVar372._0_4_ + fVar82;
                    auVar430._4_4_ = auVar372._4_4_ + fVar81;
                    auVar430._8_4_ = auVar372._8_4_ + fVar512;
                    auVar430._12_4_ = auVar372._12_4_ + fVar244;
                    auVar139._0_4_ = (int)auVar423._0_4_;
                    auVar139._4_4_ = (int)auVar423._4_4_;
                    auVar139._8_4_ = (int)auVar423._8_4_;
                    auVar139._12_4_ = (int)auVar423._12_4_;
                    auVar423 = vpslld_avx(auVar139,0x17);
                    auVar423 = vpaddd_avx(auVar423,auVar246);
                    auVar372 = vfmadd213ps_fma(auVar423,auVar430,auVar246);
                    auVar410 = ZEXT464(0) << 0x20;
                    auVar423 = vrcpps_avx(auVar372);
                    auVar246 = vfmsub213ps_fma(auVar372,auVar423,auVar246);
                    auVar137 = vfnmadd132ps_fma(auVar246,auVar423,auVar423);
                    break;
                  case 5:
                    auVar451._8_4_ = 0x42b0c0a5;
                    auVar451._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar451._12_4_ = 0x42b0c0a5;
                    auVar423 = vminps_avx(auVar451,auVar137);
                    auVar469._8_4_ = 0xc2b0c0a5;
                    auVar469._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar469._12_4_ = 0xc2b0c0a5;
                    auVar143 = vmaxps_avx(auVar423,auVar469);
                    auVar475._8_4_ = 0x3fb8aa3b;
                    auVar475._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar475._12_4_ = 0x3fb8aa3b;
                    auVar423 = vfmadd213ps_fma(auVar475,auVar143,auVar354);
                    auVar493._0_4_ = (int)auVar423._0_4_;
                    auVar493._4_4_ = (int)auVar423._4_4_;
                    auVar493._8_4_ = (int)auVar423._8_4_;
                    auVar493._12_4_ = (int)auVar423._12_4_;
                    auVar372 = vcvtdq2ps_avx(auVar493);
                    auVar423 = vcmpps_avx(auVar423,auVar372,1);
                    auVar423 = vandps_avx(auVar423,auVar246);
                    auVar423 = vsubps_avx(auVar372,auVar423);
                    auVar452._8_4_ = 0x3f318000;
                    auVar452._0_8_ = 0x3f3180003f318000;
                    auVar452._12_4_ = 0x3f318000;
                    auVar372 = vfmsub231ps_fma(auVar143,auVar423,auVar452);
                    auVar470._8_4_ = 0xb95e8083;
                    auVar470._0_8_ = 0xb95e8083b95e8083;
                    auVar470._12_4_ = 0xb95e8083;
                    auVar143 = vfnmsub231ps_fma(auVar372,auVar423,auVar470);
                    auVar494._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar494._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar494._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar494._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar363._8_4_ = 0x39506967;
                    auVar363._0_8_ = 0x3950696739506967;
                    auVar363._12_4_ = 0x39506967;
                    auVar372 = vfmadd213ps_fma(auVar363,auVar143,auVar481);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar251);
                    auVar343._8_4_ = 0x3d2aa9c1;
                    auVar343._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar343._12_4_ = 0x3d2aa9c1;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar343);
                    auVar302._8_4_ = 0x3e2aaaaa;
                    auVar302._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar302._12_4_ = 0x3e2aaaaa;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar302);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar354);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar494,auVar143);
                    auVar187._0_4_ = auVar372._0_4_ + fVar82;
                    auVar187._4_4_ = auVar372._4_4_ + fVar81;
                    auVar187._8_4_ = auVar372._8_4_ + fVar512;
                    auVar187._12_4_ = auVar372._12_4_ + fVar244;
                    auVar380._0_4_ = (int)auVar423._0_4_;
                    auVar380._4_4_ = (int)auVar423._4_4_;
                    auVar380._8_4_ = (int)auVar423._8_4_;
                    auVar380._12_4_ = (int)auVar423._12_4_;
                    auVar423 = vpslld_avx(auVar380,0x17);
                    auVar423 = vpaddd_avx(auVar423,auVar246);
                    auVar85 = vfmadd213ps_fma(auVar423,auVar187,auVar246);
                    auVar188._8_4_ = 0x800000;
                    auVar188._0_8_ = 0x80000000800000;
                    auVar188._12_4_ = 0x800000;
                    auVar423 = vmaxps_avx(auVar85,auVar188);
                    auVar372 = vpsrld_avx(auVar423,0x17);
                    auVar303._8_4_ = 0xffffff82;
                    auVar303._0_8_ = 0xffffff82ffffff82;
                    auVar303._12_4_ = 0xffffff82;
                    auVar372 = vpaddd_avx(auVar372,auVar303);
                    auVar304._8_4_ = 0x807fffff;
                    auVar304._0_8_ = 0x807fffff807fffff;
                    auVar304._12_4_ = 0x807fffff;
                    auVar423 = vandps_avx(auVar423,auVar304);
                    auVar445 = vorps_avx(auVar423,auVar354);
                    auVar143 = vcvtdq2ps_avx(auVar372);
                    auVar305._8_4_ = 0x3f3504f3;
                    auVar305._0_8_ = 0x3f3504f33f3504f3;
                    auVar305._12_4_ = 0x3f3504f3;
                    auVar372 = vcmpps_avx(auVar445,auVar305,1);
                    auVar423 = vandps_avx(auVar372,auVar445);
                    auVar189._0_4_ = auVar423._0_4_ + auVar445._0_4_ + -1.0;
                    auVar189._4_4_ = auVar423._4_4_ + auVar445._4_4_ + -1.0;
                    auVar189._8_4_ = auVar423._8_4_ + auVar445._8_4_ + -1.0;
                    auVar189._12_4_ = auVar423._12_4_ + auVar445._12_4_ + -1.0;
                    auVar423 = vandps_avx(auVar372,auVar246);
                    auVar372 = vsubps_avx(auVar143,auVar423);
                    auVar416._0_4_ = auVar189._0_4_ * auVar189._0_4_;
                    auVar416._4_4_ = auVar189._4_4_ * auVar189._4_4_;
                    auVar416._8_4_ = auVar189._8_4_ * auVar189._8_4_;
                    auVar416._12_4_ = auVar189._12_4_ * auVar189._12_4_;
                    auVar428._8_4_ = 0x3d9021bb;
                    auVar428._0_8_ = 0x3d9021bb3d9021bb;
                    auVar428._12_4_ = 0x3d9021bb;
                    auVar306._8_4_ = 0xbdebd1b8;
                    auVar306._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar306._12_4_ = 0xbdebd1b8;
                    auVar423 = vfmadd213ps_fma(auVar428,auVar189,auVar306);
                    auVar307._8_4_ = 0x3def251a;
                    auVar307._0_8_ = 0x3def251a3def251a;
                    auVar307._12_4_ = 0x3def251a;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar307);
                    auVar308._8_4_ = 0xbdfe5d4f;
                    auVar308._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar308._12_4_ = 0xbdfe5d4f;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar308);
                    auVar309._8_4_ = 0x3e11e9bf;
                    auVar309._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar309._12_4_ = 0x3e11e9bf;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar309);
                    auVar310._8_4_ = 0xbe2aae50;
                    auVar310._0_8_ = 0xbe2aae50be2aae50;
                    auVar310._12_4_ = 0xbe2aae50;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar310);
                    auVar311._8_4_ = 0x3e4cceac;
                    auVar311._0_8_ = 0x3e4cceac3e4cceac;
                    auVar311._12_4_ = 0x3e4cceac;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar311);
                    auVar312._8_4_ = 0xbe7ffffc;
                    auVar312._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar312._12_4_ = 0xbe7ffffc;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar312);
                    auVar313._8_4_ = 0x3eaaaaaa;
                    auVar313._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar313._12_4_ = 0x3eaaaaaa;
                    auVar423 = vfmadd213ps_fma(auVar423,auVar189,auVar313);
                    auVar314._0_4_ = auVar423._0_4_ * auVar416._0_4_ * auVar189._0_4_;
                    auVar314._4_4_ = auVar423._4_4_ * auVar416._4_4_ * auVar189._4_4_;
                    auVar314._8_4_ = auVar423._8_4_ * auVar416._8_4_ * auVar189._8_4_;
                    auVar314._12_4_ = auVar423._12_4_ * auVar416._12_4_ * auVar189._12_4_;
                    auVar410 = ZEXT864(0) << 0x20;
                    auVar423 = vfmadd231ps_fma(auVar314,auVar372,auVar470);
                    auVar143 = vfmsub231ps_fma(auVar423,auVar354,auVar416);
                    auVar423 = vcmpps_avx(auVar85,ZEXT816(0) << 0x20,2);
                    auVar143 = vsubps_avx(auVar143,auVar189);
                    auVar372 = vfnmadd231ps_fma(auVar143,auVar452,auVar372);
                    auVar190._0_4_ = auVar372._0_4_ + auVar372._0_4_;
                    auVar190._4_4_ = auVar372._4_4_ + auVar372._4_4_;
                    auVar190._8_4_ = auVar372._8_4_ + auVar372._8_4_;
                    auVar190._12_4_ = auVar372._12_4_ + auVar372._12_4_;
                    auVar315._8_4_ = 0x7fffffff;
                    auVar315._0_8_ = 0x7fffffff7fffffff;
                    auVar315._12_4_ = 0x7fffffff;
                    auVar423 = vblendvps_avx(auVar190,auVar315,auVar423);
                    auVar316._8_4_ = 0x42b0c0a5;
                    auVar316._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar316._12_4_ = 0x42b0c0a5;
                    auVar423 = vminps_avx(auVar423,auVar316);
                    auVar317._8_4_ = 0xc2b0c0a5;
                    auVar317._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar317._12_4_ = 0xc2b0c0a5;
                    auVar143 = vmaxps_avx(auVar423,auVar317);
                    auVar423 = vfmadd213ps_fma(auVar475,auVar143,auVar354);
                    auVar381._0_4_ = (int)auVar423._0_4_;
                    auVar381._4_4_ = (int)auVar423._4_4_;
                    auVar381._8_4_ = (int)auVar423._8_4_;
                    auVar381._12_4_ = (int)auVar423._12_4_;
                    auVar372 = vcvtdq2ps_avx(auVar381);
                    auVar423 = vcmpps_avx(auVar423,auVar372,1);
                    auVar423 = vandps_avx(auVar423,auVar246);
                    auVar423 = vsubps_avx(auVar372,auVar423);
                    auVar372 = vfmsub231ps_fma(auVar143,auVar423,auVar452);
                    auVar143 = vfnmsub231ps_fma(auVar372,auVar423,auVar470);
                    auVar382._0_4_ = auVar143._0_4_ * auVar143._0_4_;
                    auVar382._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                    auVar382._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                    auVar382._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                    auVar372 = vfmadd213ps_fma(auVar363,auVar143,auVar481);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar251);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar343);
                    auVar358 = ZEXT1664(auVar246);
                    auVar93._8_4_ = 0x3e2aaaaa;
                    auVar93._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar93._12_4_ = 0x3e2aaaaa;
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar93);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar143,auVar354);
                    auVar372 = vfmadd213ps_fma(auVar372,auVar382,auVar143);
                    auVar191._0_4_ = auVar372._0_4_ + fVar82;
                    auVar191._4_4_ = auVar372._4_4_ + fVar81;
                    auVar191._8_4_ = auVar372._8_4_ + fVar512;
                    auVar191._12_4_ = auVar372._12_4_ + fVar244;
                    auVar318._0_4_ = (int)auVar423._0_4_;
                    auVar318._4_4_ = (int)auVar423._4_4_;
                    auVar318._8_4_ = (int)auVar423._8_4_;
                    auVar318._12_4_ = (int)auVar423._12_4_;
                    auVar423 = vpslld_avx(auVar318,0x17);
                    auVar423 = vpaddd_avx(auVar423,auVar246);
                    auVar423 = vfmadd213ps_fma(auVar423,auVar191,auVar246);
                    auVar246 = vrcpps_avx(auVar423);
                    auVar383._0_4_ = auVar246._0_4_ + auVar246._0_4_;
                    auVar383._4_4_ = auVar246._4_4_ + auVar246._4_4_;
                    auVar383._8_4_ = auVar246._8_4_ + auVar246._8_4_;
                    auVar383._12_4_ = auVar246._12_4_ + auVar246._12_4_;
                    auVar94._8_4_ = 0x40000000;
                    auVar94._0_8_ = 0x4000000040000000;
                    auVar94._12_4_ = 0x40000000;
                    auVar423 = vfmsub213ps_fma(auVar423,auVar383,auVar94);
                    auVar246 = vfnmadd213ps_fma(auVar423,auVar246,auVar383);
                    auVar137 = vfmsub231ps_fma(auVar137,auVar137,auVar246);
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar197._4_4_ = uVar1;
                    auVar197._0_4_ = uVar1;
                    auVar197._8_4_ = uVar1;
                    auVar197._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar319._4_4_ = uVar1;
                    auVar319._0_4_ = uVar1;
                    auVar319._8_4_ = uVar1;
                    auVar319._12_4_ = uVar1;
                    auVar372 = vfmadd231ps_fma(auVar319,auVar137,auVar197);
                    auVar423 = vmaxps_avx(auVar423,auVar372);
                    auVar246 = vminps_avx(auVar423,auVar246);
                    auVar137._0_4_ = auVar246._0_4_ * auVar137._0_4_;
                    auVar137._4_4_ = auVar246._4_4_ * fVar170;
                    auVar137._8_4_ = auVar246._8_4_ * fVar245;
                    auVar137._12_4_ = auVar246._12_4_ * fVar30;
                  }
                  *(undefined1 (*) [16])pAVar67 = auVar137;
                  pAVar67 = pAVar67 + 2;
                  uVar74 = uVar74 + 1;
                  iVar50 = iVar50 + 1;
                } while (uVar74 != local_1a8.w);
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 1) && (uVar73 == 4)) && (0 < (long)local_1a8.c)) {
        p_Var19 = local_148[-3];
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar57 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        uVar17 = *(undefined4 *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_270 = 0;
        auVar168 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar485 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar169 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar410 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar355._8_4_ = 0x3f800000;
        auVar355._0_8_ = 0x3f8000003f800000;
        auVar355._12_4_ = 0x3f800000;
        auVar420 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar479 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar358 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar486 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        do {
          if (0 < local_1a8.h) {
            iVar69 = bottom_blob->w;
            iVar75 = bottom_blob->h;
            pAVar67 = (Allocator *)
                      ((long)(_func_int ***)local_1a8.data +
                      local_1a8.cstep * local_270 *
                      CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize));
            uVar18 = bottom_blob->c;
            iVar61 = 0;
            do {
              if (0 < local_1a8.w) {
                uVar74 = 0;
                iVar50 = (1 - uVar15) * iVar78;
                do {
                  if (lVar76 == 0) {
                    auVar498 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar498 = *(undefined1 (*) [16])(lVar76 + local_270 * 0x10);
                  }
                  auVar511 = ZEXT1664(auVar498);
                  if (0 < (int)uVar18) {
                    pvVar80 = (void *)((this->weight_data_tm).cstep * local_270 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar48 = (((int)uVar77 - uVar16) + 1) * iVar57 + iVar61;
                          if (((-1 < iVar48) && (iVar49 = iVar48 / iVar60, iVar48 % iVar60 == 0)) &&
                             ((iVar49 < iVar75 && (0 < (int)uVar15)))) {
                            uVar71 = uVar79;
                            uVar64 = (ulong)uVar15;
                            iVar48 = iVar50;
                            do {
                              if (((-1 < iVar48) && (iVar51 = iVar48 / iVar58, iVar48 % iVar58 == 0)
                                  ) && (iVar51 < iVar69)) {
                                uVar1 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar51 * 4 +
                                         (long)iVar49 * (long)bottom_blob->w * bottom_blob->elemsize
                                         + bottom_blob->cstep * bottom_blob->elemsize * uVar59);
                                auVar141._4_4_ = uVar1;
                                auVar141._0_4_ = uVar1;
                                auVar141._8_4_ = uVar1;
                                auVar141._12_4_ = uVar1;
                                auVar246 = vfmadd231ps_fma(auVar511._0_16_,auVar141,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar80 +
                                                            (uVar71 & 0xffffffff) * 4));
                                auVar511 = ZEXT1664(auVar246);
                              }
                              uVar71 = uVar71 + 4;
                              iVar48 = iVar48 + iVar78;
                              uVar64 = uVar64 - 1;
                            } while (uVar64 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 4;
                        } while (uVar77 != uVar16);
                      }
                      auVar498 = auVar511._0_16_;
                      pvVar80 = (void *)((long)pvVar80 + (long)(int)(uVar15 * uVar16 * 4) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar143 = auVar168._0_16_;
                  auVar423 = auVar410._0_16_;
                  auVar372 = auVar420._0_16_;
                  auVar246 = auVar358._0_16_;
                  auVar86 = auVar486._0_16_;
                  auVar127 = auVar479._0_16_;
                  auVar85 = auVar169._0_16_;
                  auVar445 = auVar485._0_16_;
                  fVar82 = auVar498._4_4_;
                  fVar81 = auVar498._8_4_;
                  fVar512 = auVar498._12_4_;
                  switch(uVar17) {
                  case 1:
                    auVar498 = vmaxps_avx(auVar498,auVar143);
                    break;
                  case 2:
                    auVar246 = vmaxps_avx(auVar498,auVar143);
                    auVar423 = vminps_avx(auVar498,auVar143);
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar501._4_4_ = uVar1;
                    auVar501._0_4_ = uVar1;
                    auVar501._8_4_ = uVar1;
                    auVar501._12_4_ = uVar1;
                    auVar498 = vfmadd213ps_fma(auVar501,auVar423,auVar246);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar145._4_4_ = uVar1;
                    auVar145._0_4_ = uVar1;
                    auVar145._8_4_ = uVar1;
                    auVar145._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar387._4_4_ = uVar1;
                    auVar387._0_4_ = uVar1;
                    auVar387._8_4_ = uVar1;
                    auVar387._12_4_ = uVar1;
                    auVar246 = vmaxps_avx(auVar498,auVar145);
                    auVar498 = vminps_avx(auVar387,auVar246);
                    break;
                  case 4:
                    auVar146._0_8_ = auVar498._0_8_ ^ 0x8000000080000000;
                    auVar146._8_4_ = -fVar81;
                    auVar146._12_4_ = -fVar512;
                    auVar101._8_4_ = 0x42b0c0a5;
                    auVar101._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar101._12_4_ = 0x42b0c0a5;
                    auVar143 = vminps_avx(auVar146,auVar101);
                    auVar386 = vmaxps_avx(auVar445,auVar143);
                    auVar143 = vfmadd213ps_fma(auVar85,auVar386,auVar423);
                    auVar499._0_4_ = (int)auVar143._0_4_;
                    auVar499._4_4_ = (int)auVar143._4_4_;
                    auVar499._8_4_ = (int)auVar143._8_4_;
                    auVar499._12_4_ = (int)auVar143._12_4_;
                    auVar445 = vcvtdq2ps_avx(auVar499);
                    auVar143 = vcmpps_avx(auVar143,auVar445,1);
                    auVar143 = vandps_avx(auVar143,auVar355);
                    auVar143 = vsubps_avx(auVar445,auVar143);
                    auVar372 = vfmsub231ps_fma(auVar386,auVar143,auVar372);
                    auVar203._8_4_ = 0x395e8083;
                    auVar203._0_8_ = 0x395e8083395e8083;
                    auVar203._12_4_ = 0x395e8083;
                    auVar372 = vfmsub231ps_fma(auVar372,auVar143,auVar203);
                    auVar500._0_4_ = auVar372._0_4_ * auVar372._0_4_;
                    auVar500._4_4_ = auVar372._4_4_ * auVar372._4_4_;
                    auVar500._8_4_ = auVar372._8_4_ * auVar372._8_4_;
                    auVar500._12_4_ = auVar372._12_4_ * auVar372._12_4_;
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar127);
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar86);
                    auVar204._8_4_ = 0x3d2aa9c1;
                    auVar204._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar204._12_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar204);
                    auVar102._8_4_ = 0x3e2aaaaa;
                    auVar102._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar102._12_4_ = 0x3e2aaaaa;
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar102);
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar423);
                    auVar246 = vfmadd213ps_fma(auVar246,auVar500,auVar372);
                    auVar147._0_4_ = auVar246._0_4_ + 1.0;
                    auVar147._4_4_ = auVar246._4_4_ + 1.0;
                    auVar147._8_4_ = auVar246._8_4_ + 1.0;
                    auVar147._12_4_ = auVar246._12_4_ + 1.0;
                    auVar388._0_4_ = (int)auVar143._0_4_;
                    auVar388._4_4_ = (int)auVar143._4_4_;
                    auVar388._8_4_ = (int)auVar143._8_4_;
                    auVar388._12_4_ = (int)auVar143._12_4_;
                    auVar246 = vpslld_avx(auVar388,0x17);
                    auVar246 = vpaddd_avx(auVar246,auVar355);
                    auVar423 = vfmadd213ps_fma(auVar246,auVar147,auVar355);
                    auVar246 = vrcpps_avx(auVar423);
                    auVar423 = vfmsub213ps_fma(auVar423,auVar246,auVar355);
                    auVar498 = vfnmadd132ps_fma(auVar423,auVar246,auVar246);
                    break;
                  case 5:
                    auVar320._8_4_ = 0x42b0c0a5;
                    auVar320._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar320._12_4_ = 0x42b0c0a5;
                    auVar143 = vminps_avx(auVar498,auVar320);
                    auVar369 = vmaxps_avx(auVar445,auVar143);
                    auVar143 = vfmadd213ps_fma(auVar85,auVar369,auVar423);
                    auVar431._0_4_ = (int)auVar143._0_4_;
                    auVar431._4_4_ = (int)auVar143._4_4_;
                    auVar431._8_4_ = (int)auVar143._8_4_;
                    auVar431._12_4_ = (int)auVar143._12_4_;
                    auVar386 = vcvtdq2ps_avx(auVar431);
                    auVar143 = vcmpps_avx(auVar143,auVar386,1);
                    auVar143 = vandps_avx(auVar143,auVar355);
                    auVar143 = vsubps_avx(auVar386,auVar143);
                    auVar386 = vfmsub231ps_fma(auVar369,auVar143,auVar372);
                    auVar98._8_4_ = 0xb95e8083;
                    auVar98._0_8_ = 0xb95e8083b95e8083;
                    auVar98._12_4_ = 0xb95e8083;
                    auVar369 = vfnmsub231ps_fma(auVar386,auVar143,auVar98);
                    auVar432._0_4_ = auVar369._0_4_ * auVar369._0_4_;
                    auVar432._4_4_ = auVar369._4_4_ * auVar369._4_4_;
                    auVar432._8_4_ = auVar369._8_4_ * auVar369._8_4_;
                    auVar432._12_4_ = auVar369._12_4_ * auVar369._12_4_;
                    auVar386 = vfmadd213ps_fma(auVar246,auVar369,auVar127);
                    auVar386 = vfmadd213ps_fma(auVar386,auVar369,auVar86);
                    auVar344._8_4_ = 0x3d2aa9c1;
                    auVar344._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar344._12_4_ = 0x3d2aa9c1;
                    auVar386 = vfmadd213ps_fma(auVar386,auVar369,auVar344);
                    auVar345._8_4_ = 0x3e2aaaaa;
                    auVar345._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar345._12_4_ = 0x3e2aaaaa;
                    auVar386 = vfmadd213ps_fma(auVar386,auVar369,auVar345);
                    auVar386 = vfmadd213ps_fma(auVar386,auVar369,auVar423);
                    auVar386 = vfmadd213ps_fma(auVar386,auVar432,auVar369);
                    auVar198._0_4_ = auVar386._0_4_ + 1.0;
                    auVar198._4_4_ = auVar386._4_4_ + 1.0;
                    auVar198._8_4_ = auVar386._8_4_ + 1.0;
                    auVar198._12_4_ = auVar386._12_4_ + 1.0;
                    auVar142._0_4_ = (int)auVar143._0_4_;
                    auVar142._4_4_ = (int)auVar143._4_4_;
                    auVar142._8_4_ = (int)auVar143._8_4_;
                    auVar142._12_4_ = (int)auVar143._12_4_;
                    auVar143 = vpslld_avx(auVar142,0x17);
                    auVar143 = vpaddd_avx(auVar143,auVar355);
                    auVar87 = vfmadd213ps_fma(auVar143,auVar198,auVar355);
                    auVar199._8_4_ = 0x800000;
                    auVar199._0_8_ = 0x80000000800000;
                    auVar199._12_4_ = 0x800000;
                    auVar143 = vmaxps_avx(auVar87,auVar199);
                    auVar386 = vpsrld_avx(auVar143,0x17);
                    auVar346._8_4_ = 0xffffff82;
                    auVar346._0_8_ = 0xffffff82ffffff82;
                    auVar346._12_4_ = 0xffffff82;
                    auVar386 = vpaddd_avx(auVar386,auVar346);
                    auVar347._8_4_ = 0x807fffff;
                    auVar347._0_8_ = 0x807fffff807fffff;
                    auVar347._12_4_ = 0x807fffff;
                    auVar143 = vandps_avx(auVar143,auVar347);
                    auVar446 = vorps_avx(auVar143,auVar423);
                    auVar369 = vcvtdq2ps_avx(auVar386);
                    auVar348._8_4_ = 0x3f3504f3;
                    auVar348._0_8_ = 0x3f3504f33f3504f3;
                    auVar348._12_4_ = 0x3f3504f3;
                    auVar386 = vcmpps_avx(auVar446,auVar348,1);
                    auVar143 = vandps_avx(auVar386,auVar446);
                    auVar200._0_4_ = auVar143._0_4_ + auVar446._0_4_ + -1.0;
                    auVar200._4_4_ = auVar143._4_4_ + auVar446._4_4_ + -1.0;
                    auVar200._8_4_ = auVar143._8_4_ + auVar446._8_4_ + -1.0;
                    auVar200._12_4_ = auVar143._12_4_ + auVar446._12_4_ + -1.0;
                    auVar143 = vandps_avx(auVar386,auVar355);
                    auVar386 = vsubps_avx(auVar369,auVar143);
                    auVar417._0_4_ = auVar200._0_4_ * auVar200._0_4_;
                    auVar417._4_4_ = auVar200._4_4_ * auVar200._4_4_;
                    auVar417._8_4_ = auVar200._8_4_ * auVar200._8_4_;
                    auVar417._12_4_ = auVar200._12_4_ * auVar200._12_4_;
                    auVar433._8_4_ = 0x3d9021bb;
                    auVar433._0_8_ = 0x3d9021bb3d9021bb;
                    auVar433._12_4_ = 0x3d9021bb;
                    auVar321._8_4_ = 0xbdebd1b8;
                    auVar321._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar321._12_4_ = 0xbdebd1b8;
                    auVar143 = vfmadd213ps_fma(auVar433,auVar200,auVar321);
                    auVar322._8_4_ = 0x3def251a;
                    auVar322._0_8_ = 0x3def251a3def251a;
                    auVar322._12_4_ = 0x3def251a;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar322);
                    auVar323._8_4_ = 0xbdfe5d4f;
                    auVar323._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar323._12_4_ = 0xbdfe5d4f;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar323);
                    auVar324._8_4_ = 0x3e11e9bf;
                    auVar324._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar324._12_4_ = 0x3e11e9bf;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar324);
                    auVar325._8_4_ = 0xbe2aae50;
                    auVar325._0_8_ = 0xbe2aae50be2aae50;
                    auVar325._12_4_ = 0xbe2aae50;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar325);
                    auVar326._8_4_ = 0x3e4cceac;
                    auVar326._0_8_ = 0x3e4cceac3e4cceac;
                    auVar326._12_4_ = 0x3e4cceac;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar326);
                    auVar327._8_4_ = 0xbe7ffffc;
                    auVar327._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar327._12_4_ = 0xbe7ffffc;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar327);
                    auVar328._8_4_ = 0x3eaaaaaa;
                    auVar328._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar328._12_4_ = 0x3eaaaaaa;
                    auVar143 = vfmadd213ps_fma(auVar143,auVar200,auVar328);
                    auVar329._0_4_ = auVar143._0_4_ * auVar417._0_4_ * auVar200._0_4_;
                    auVar329._4_4_ = auVar143._4_4_ * auVar417._4_4_ * auVar200._4_4_;
                    auVar329._8_4_ = auVar143._8_4_ * auVar417._8_4_ * auVar200._8_4_;
                    auVar329._12_4_ = auVar143._12_4_ * auVar417._12_4_ * auVar200._12_4_;
                    auVar434._8_4_ = 0xb95e8083;
                    auVar434._0_8_ = 0xb95e8083b95e8083;
                    auVar434._12_4_ = 0xb95e8083;
                    auVar143 = vfmadd231ps_fma(auVar329,auVar386,auVar434);
                    auVar369 = vfmsub231ps_fma(auVar143,auVar423,auVar417);
                    auVar485 = ZEXT1664(auVar445);
                    auVar169 = ZEXT1664(auVar85);
                    auVar479 = ZEXT1664(auVar127);
                    auVar486 = ZEXT1664(auVar86);
                    auVar358 = ZEXT1664(auVar246);
                    auVar420 = ZEXT1664(auVar372);
                    auVar44._12_4_ = 0;
                    auVar44._0_12_ = ZEXT412(0);
                    auVar168 = ZEXT1264(ZEXT412(0)) << 0x20;
                    auVar143 = vcmpps_avx(auVar87,auVar44 << 0x20,2);
                    auVar369 = vsubps_avx(auVar369,auVar200);
                    auVar386 = vfnmadd231ps_fma(auVar369,auVar372,auVar386);
                    auVar201._0_4_ = auVar386._0_4_ + auVar386._0_4_;
                    auVar201._4_4_ = auVar386._4_4_ + auVar386._4_4_;
                    auVar201._8_4_ = auVar386._8_4_ + auVar386._8_4_;
                    auVar201._12_4_ = auVar386._12_4_ + auVar386._12_4_;
                    auVar330._8_4_ = 0x7fffffff;
                    auVar330._0_8_ = 0x7fffffff7fffffff;
                    auVar330._12_4_ = 0x7fffffff;
                    auVar143 = vblendvps_avx(auVar201,auVar330,auVar143);
                    auVar143 = vminps_avx(auVar320,auVar143);
                    auVar386 = vmaxps_avx(auVar445,auVar143);
                    auVar143 = vfmadd213ps_fma(auVar85,auVar386,auVar423);
                    auVar331._0_4_ = (int)auVar143._0_4_;
                    auVar331._4_4_ = (int)auVar143._4_4_;
                    auVar331._8_4_ = (int)auVar143._8_4_;
                    auVar331._12_4_ = (int)auVar143._12_4_;
                    auVar445 = vcvtdq2ps_avx(auVar331);
                    auVar143 = vcmpps_avx(auVar143,auVar445,1);
                    auVar143 = vandps_avx(auVar143,auVar355);
                    auVar143 = vsubps_avx(auVar445,auVar143);
                    auVar372 = vfmsub231ps_fma(auVar386,auVar143,auVar372);
                    auVar332._8_4_ = 0xb95e8083;
                    auVar332._0_8_ = 0xb95e8083b95e8083;
                    auVar332._12_4_ = 0xb95e8083;
                    auVar372 = vfnmsub231ps_fma(auVar372,auVar143,auVar332);
                    auVar333._0_4_ = auVar372._0_4_ * auVar372._0_4_;
                    auVar333._4_4_ = auVar372._4_4_ * auVar372._4_4_;
                    auVar333._8_4_ = auVar372._8_4_ * auVar372._8_4_;
                    auVar333._12_4_ = auVar372._12_4_ * auVar372._12_4_;
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar127);
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar86);
                    auVar349._8_4_ = 0x3d2aa9c1;
                    auVar349._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar349._12_4_ = 0x3d2aa9c1;
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar349);
                    auVar410 = ZEXT1664(auVar423);
                    auVar99._8_4_ = 0x3e2aaaaa;
                    auVar99._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar99._12_4_ = 0x3e2aaaaa;
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar99);
                    auVar246 = vfmadd213ps_fma(auVar246,auVar372,auVar423);
                    auVar246 = vfmadd213ps_fma(auVar246,auVar333,auVar372);
                    auVar144._0_4_ = auVar246._0_4_ + 1.0;
                    auVar144._4_4_ = auVar246._4_4_ + 1.0;
                    auVar144._8_4_ = auVar246._8_4_ + 1.0;
                    auVar144._12_4_ = auVar246._12_4_ + 1.0;
                    auVar202._0_4_ = (int)auVar143._0_4_;
                    auVar202._4_4_ = (int)auVar143._4_4_;
                    auVar202._8_4_ = (int)auVar143._8_4_;
                    auVar202._12_4_ = (int)auVar143._12_4_;
                    auVar246 = vpslld_avx(auVar202,0x17);
                    auVar246 = vpaddd_avx(auVar246,auVar355);
                    auVar423 = vfmadd213ps_fma(auVar246,auVar144,auVar355);
                    auVar246 = vrcpps_avx(auVar423);
                    auVar334._0_4_ = auVar246._0_4_ + auVar246._0_4_;
                    auVar334._4_4_ = auVar246._4_4_ + auVar246._4_4_;
                    auVar334._8_4_ = auVar246._8_4_ + auVar246._8_4_;
                    auVar334._12_4_ = auVar246._12_4_ + auVar246._12_4_;
                    auVar100._8_4_ = 0x40000000;
                    auVar100._0_8_ = 0x4000000040000000;
                    auVar100._12_4_ = 0x40000000;
                    auVar423 = vfmsub213ps_fma(auVar423,auVar334,auVar100);
                    auVar246 = vfnmadd213ps_fma(auVar423,auVar246,auVar334);
                    auVar498 = vfmsub231ps_fma(auVar498,auVar498,auVar246);
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var19);
                    auVar148._4_4_ = uVar1;
                    auVar148._0_4_ = uVar1;
                    auVar148._8_4_ = uVar1;
                    auVar148._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar205._4_4_ = uVar1;
                    auVar205._0_4_ = uVar1;
                    auVar205._8_4_ = uVar1;
                    auVar205._12_4_ = uVar1;
                    auVar246 = vfmadd231ps_fma(auVar205,auVar498,auVar148);
                    auVar246 = vmaxps_avx(auVar143,auVar246);
                    auVar246 = vminps_avx(auVar246,auVar355);
                    auVar498._0_4_ = auVar498._0_4_ * auVar246._0_4_;
                    auVar498._4_4_ = fVar82 * auVar246._4_4_;
                    auVar498._8_4_ = fVar81 * auVar246._8_4_;
                    auVar498._12_4_ = fVar512 * auVar246._12_4_;
                  }
                  *(undefined1 (*) [16])pAVar67 = auVar498;
                  pAVar67 = pAVar67 + 2;
                  uVar74 = uVar74 + 1;
                  iVar50 = iVar50 + 1;
                } while (uVar74 != local_1a8.w);
              }
              iVar61 = iVar61 + 1;
            } while (iVar61 != local_1a8.h);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_1a8.c);
      }
      if ((((int)local_160 == 4) && (uVar73 == 1)) && (local_120 = (long)local_1a8.c, 0 < local_120)
         ) {
        p_Var19 = local_148[-3];
        iVar78 = *(int *)(&this->field_0xdc + (long)p_Var19);
        iVar57 = *(int *)(&this->field_0xe0 + (long)p_Var19);
        iVar58 = *(int *)(&this->field_0xe4 + (long)p_Var19);
        iVar60 = *(int *)(&this->field_0xe8 + (long)p_Var19);
        iVar69 = *(int *)(&this->field_0x114 + (long)p_Var19);
        lVar76 = *(long *)(&this->field_0x1a8 + (long)p_Var19);
        uVar15 = *(uint *)(&this->field_0xd4 + (long)p_Var19);
        uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var19);
        local_130 = CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize) * local_1a8.cstep;
        local_138 = (Allocator *)local_1a8.data;
        iVar75 = bottom_blob->w;
        iVar61 = bottom_blob->h;
        uVar18 = bottom_blob->c;
        local_270 = 0;
        do {
          if (0 < iVar14) {
            sVar24 = (this->weight_data_tm).cstep;
            sVar25 = (this->weight_data_tm).elemsize;
            local_228 = (Allocator *)((long)&local_138->_vptr_Allocator + local_130 * local_270);
            pvVar80 = (this->weight_data_tm).data;
            iVar50 = 0;
            do {
              if (0 < iVar13) {
                iVar49 = bottom_blob->w;
                pvVar23 = bottom_blob->data;
                sVar26 = bottom_blob->elemsize;
                sVar27 = bottom_blob->cstep;
                pfVar62 = *(float **)(&this->field_0x118 + (long)p_Var19);
                uVar74 = 0;
                iVar48 = (1 - uVar15) * iVar78;
                do {
                  if (lVar76 == 0) {
                    fVar82 = 0.0;
                  }
                  else {
                    fVar82 = *(float *)(lVar76 + local_270 * 4);
                  }
                  if ((int)uVar18 < 1) {
                    auVar246 = SUB6416(ZEXT864(0),0);
                  }
                  else {
                    auVar358 = ZEXT864(0);
                    uVar59 = 0;
                    pvVar68 = (void *)(sVar24 * local_270 * sVar25 + (long)pvVar80);
                    do {
                      if (0 < (int)uVar16) {
                        uVar79 = 0;
                        uVar77 = 0;
                        do {
                          iVar51 = (((int)uVar77 - uVar16) + 1) * iVar57 + iVar50;
                          if (((-1 < iVar51) && (iVar52 = iVar51 / iVar60, iVar51 % iVar60 == 0)) &&
                             ((0 < (int)uVar15 && (iVar52 < iVar61)))) {
                            uVar71 = (ulong)uVar15;
                            uVar64 = uVar79;
                            iVar51 = iVar48;
                            do {
                              if (((-1 < iVar51) && (iVar53 = iVar51 / iVar58, iVar51 % iVar58 == 0)
                                  ) && (iVar53 < iVar75)) {
                                auVar246 = vfmadd231ps_fma(auVar358._0_16_,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar23 +
                                                            (long)(iVar53 << 2) * 4 +
                                                            (long)iVar52 * (long)iVar49 * sVar26 +
                                                            sVar27 * sVar26 * uVar59),
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar68 +
                                                            (uVar64 & 0xffffffff) * 4));
                                auVar358 = ZEXT1664(auVar246);
                              }
                              uVar64 = uVar64 + 4;
                              iVar51 = iVar51 + iVar78;
                              uVar71 = uVar71 - 1;
                            } while (uVar71 != 0);
                          }
                          uVar77 = uVar77 + 1;
                          uVar79 = uVar79 + (ulong)uVar15 * 4;
                        } while (uVar77 != uVar16);
                      }
                      auVar246 = auVar358._0_16_;
                      pvVar68 = (void *)((long)pvVar68 + (long)(int)(uVar15 * uVar16 * 4) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar423 = vshufpd_avx(auVar246,auVar246,1);
                  auVar149._0_4_ = auVar423._0_4_ + auVar246._0_4_;
                  auVar149._4_4_ = auVar423._4_4_ + auVar246._4_4_;
                  auVar149._8_4_ = auVar423._8_4_ + auVar246._8_4_;
                  auVar149._12_4_ = auVar423._12_4_ + auVar246._12_4_;
                  auVar246 = vmovshdup_avx(auVar149);
                  fVar82 = auVar246._0_4_ + fVar82 + auVar149._0_4_;
                  auVar246 = ZEXT416((uint)fVar82);
                  fVar81 = fVar82;
                  if (iVar69 - 1U < 6) {
                    switch(iVar69) {
                    case 1:
                      auVar246 = vmaxss_avx(ZEXT416((uint)fVar82),ZEXT416(0));
                      fVar81 = auVar246._0_4_;
                      break;
                    case 2:
                      auVar103._0_12_ = ZEXT812(0);
                      auVar103._12_4_ = 0;
                      auVar246 = vcmpss_avx(auVar103,ZEXT416((uint)fVar82),1);
                      auVar207._8_4_ = 0x3f800000;
                      auVar207._0_8_ = 0x3f8000003f800000;
                      auVar207._12_4_ = 0x3f800000;
                      auVar246 = vblendvps_avx(ZEXT416((uint)*pfVar62),auVar207,auVar246);
                      fVar81 = auVar246._0_4_ * fVar82;
                      break;
                    case 3:
                      auVar246 = vmaxss_avx(auVar246,ZEXT416((uint)*pfVar62));
                      fVar81 = auVar246._0_4_;
                      if (pfVar62[1] < auVar246._0_4_) {
                        fVar81 = pfVar62[1];
                      }
                      break;
                    case 4:
                      auVar246 = vminss_avx(auVar246,ZEXT416(0x42b0c0a5));
                      auVar150._0_8_ = auVar246._0_8_ ^ 0x8000000080000000;
                      auVar150._8_4_ = auVar246._8_4_ ^ 0x80000000;
                      auVar150._12_4_ = auVar246._12_4_ ^ 0x80000000;
                      auVar246 = vcmpss_avx(auVar246,ZEXT416(0xc2b0c0a5),1);
                      auVar206._8_4_ = 0x42b0c0a5;
                      auVar206._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar206._12_4_ = 0x42b0c0a5;
                      auVar246 = vblendvps_avx(auVar150,auVar206,auVar246);
                      fVar82 = expf(auVar246._0_4_);
                      fVar81 = 1.0 / (fVar82 + 1.0);
                      break;
                    case 5:
                      fVar81 = expf(fVar82);
                      fVar81 = logf(fVar81 + 1.0);
                      fVar81 = tanhf(fVar81);
                      fVar81 = fVar81 * fVar82;
                      break;
                    case 6:
                      fVar512 = *pfVar62;
                      fVar244 = -pfVar62[1] / fVar512;
                      fVar81 = 0.0;
                      if ((fVar244 <= fVar82) &&
                         (fVar81 = fVar82, fVar82 <= fVar244 + 1.0 / fVar512)) {
                        auVar246 = vfmadd213ss_fma(ZEXT416((uint)fVar512),auVar246,
                                                   ZEXT416((uint)pfVar62[1]));
                        fVar81 = auVar246._0_4_ * fVar82;
                      }
                    }
                  }
                  *(float *)&local_228->_vptr_Allocator = fVar81;
                  local_228 = (Allocator *)((long)&local_228->_vptr_Allocator + 4);
                  uVar74 = uVar74 + 1;
                  iVar48 = iVar48 + 1;
                } while (uVar74 != iVar13);
              }
              iVar50 = iVar50 + 1;
            } while (iVar50 != iVar14);
          }
          local_270 = local_270 + 1;
        } while (local_270 != local_120);
      }
      iVar14 = local_1a8.h;
      iVar13 = local_1a8.w;
      pvVar80 = local_1a8.data;
      if ((((int)local_160 == 1) && (uVar73 == 1)) &&
         (pp_Var21 = this->_vptr_Deconvolution_x86_fma,
         0 < *(int *)(&this->field_0xd0 + (long)pp_Var21[-3]))) {
        lVar76 = local_1a8.cstep * CONCAT44(local_1a8.elemsize._4_4_,(int)local_1a8.elemsize);
        iVar78 = bottom_blob->w;
        iVar57 = bottom_blob->h;
        uVar73 = bottom_blob->c;
        uVar59 = (ulong)(uint)local_1a8.w;
        lVar55 = (long)local_154;
        lVar70 = (long)local_1a8.w;
        local_150 = -local_150;
        local_1e8 = 0;
        do {
          if (0 < iVar14) {
            local_1d0 = (Allocator *)((long)(_func_int ***)pvVar80 + lVar76 * local_1e8);
            pp_Var28 = this->_vptr_Deconvolution_x86_fma;
            sVar24 = (this->weight_data_tm).cstep;
            sVar25 = (this->weight_data_tm).elemsize;
            pvVar23 = (this->weight_data_tm).data;
            iVar58 = 0;
            do {
              if (0 < iVar13) {
                iVar60 = bottom_blob->w;
                pvVar68 = bottom_blob->data;
                sVar26 = bottom_blob->elemsize;
                sVar27 = bottom_blob->cstep;
                pp_Var29 = this->_vptr_Deconvolution_x86_fma;
                iVar69 = iVar58 - local_14c;
                local_230 = local_150;
                uVar77 = 0;
                do {
                  p_Var19 = pp_Var28[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var19) == 0) {
                    auVar358 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar358 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1a8 + (long)p_Var19) +
                                                local_1e8 * 4));
                  }
                  auVar246 = auVar358._0_16_;
                  if (0 < (int)uVar73) {
                    p_Var19 = pp_Var29[-3];
                    uVar79 = 0;
                    local_248 = (void *)(sVar24 * sVar25 * local_1e8 + (long)pvVar23);
                    do {
                      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var19)) {
                        iVar75 = 0;
                        do {
                          iVar61 = *(int *)(&this->field_0xe0 + (long)p_Var19) * iVar75 + iVar69;
                          if (((-1 < iVar61) &&
                              (iVar50 = iVar61 / *(int *)(&this->field_0xe8 + (long)p_Var19),
                              iVar61 % *(int *)(&this->field_0xe8 + (long)p_Var19) == 0)) &&
                             (iVar50 < iVar57)) {
                            iVar61 = *(int *)(&this->field_0xd4 + (long)p_Var19);
                            if (0 < (long)iVar61) {
                              lVar72 = 0;
                              iVar48 = local_230;
                              do {
                                if (((-1 < iVar48) &&
                                    (iVar49 = iVar48 / *(int *)(&this->field_0xe4 + (long)p_Var19),
                                    iVar48 % *(int *)(&this->field_0xe4 + (long)p_Var19) == 0)) &&
                                   (iVar49 < iVar78)) {
                                  auVar246 = vfmadd231ss_fma(auVar358._0_16_,
                                                             ZEXT416(*(uint *)((long)local_248 +
                                                                              lVar72 * 4 +
                                                                              (ulong)(uint)(iVar61 *
                                                                                           iVar75) *
                                                                              4)),
                                                             ZEXT416(*(uint *)((long)pvVar68 +
                                                                              (long)iVar49 * 4 +
                                                                              (long)iVar50 *
                                                                              (long)iVar60 * sVar26
                                                                              + sVar27 * sVar26 *
                                                                                uVar79)));
                                  auVar358 = ZEXT1664(auVar246);
                                }
                                lVar72 = lVar72 + 1;
                                iVar48 = iVar48 + *(int *)(&this->field_0xdc + (long)p_Var19);
                              } while (iVar61 != lVar72);
                            }
                          }
                          iVar75 = iVar75 + 1;
                        } while (iVar75 != *(int *)(&this->field_0xd8 + (long)p_Var19));
                      }
                      auVar246 = auVar358._0_16_;
                      uVar79 = uVar79 + 1;
                      local_248 = (void *)((long)local_248 + lVar55 * 4);
                    } while (uVar79 != uVar73);
                  }
                  p_Var19 = pp_Var28[-3];
                  fVar81 = auVar246._0_4_;
                  fVar82 = fVar81;
                  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var19)) {
                  case 1:
                    auVar246 = vmaxss_avx(auVar246,ZEXT416(0));
                    fVar82 = auVar246._0_4_;
                    break;
                  case 2:
                    auVar246 = vcmpss_avx(ZEXT816(0) << 0x40,auVar246,1);
                    auVar209._8_4_ = 0x3f800000;
                    auVar209._0_8_ = 0x3f8000003f800000;
                    auVar209._12_4_ = 0x3f800000;
                    auVar246 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var19)
                                                    ),auVar209,auVar246);
                    fVar82 = auVar246._0_4_ * fVar81;
                    break;
                  case 3:
                    fVar81 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var19))[1];
                    auVar246 = vmaxss_avx(auVar246,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                      (long)p_Var19)));
                    fVar82 = auVar246._0_4_;
                    if (fVar81 < auVar246._0_4_) {
                      fVar82 = fVar81;
                    }
                    break;
                  case 4:
                    auVar246 = vminss_avx(auVar246,ZEXT416(0x42b0c0a5));
                    auVar151._0_8_ = auVar246._0_8_ ^ 0x8000000080000000;
                    auVar151._8_4_ = auVar246._8_4_ ^ 0x80000000;
                    auVar151._12_4_ = auVar246._12_4_ ^ 0x80000000;
                    auVar246 = vcmpss_avx(auVar246,ZEXT416(0xc2b0c0a5),1);
                    auVar208._8_4_ = 0x42b0c0a5;
                    auVar208._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar208._12_4_ = 0x42b0c0a5;
                    auVar246 = vblendvps_avx(auVar151,auVar208,auVar246);
                    fVar82 = expf(auVar246._0_4_);
                    fVar82 = 1.0 / (fVar82 + 1.0);
                    break;
                  case 5:
                    fVar82 = expf(fVar81);
                    fVar82 = logf(fVar82 + 1.0);
                    fVar82 = tanhf(fVar82);
                    fVar82 = fVar82 * fVar81;
                    break;
                  case 6:
                    fVar512 = **(float **)(&this->field_0x118 + (long)p_Var19);
                    fVar244 = (*(float **)(&this->field_0x118 + (long)p_Var19))[1];
                    fVar245 = -fVar244 / fVar512;
                    fVar82 = 0.0;
                    if ((fVar245 <= fVar81) && (fVar82 = fVar81, fVar81 <= fVar245 + 1.0 / fVar512))
                    {
                      auVar246 = vfmadd213ss_fma(ZEXT416((uint)fVar512),auVar246,
                                                 ZEXT416((uint)fVar244));
                      fVar82 = auVar246._0_4_ * fVar81;
                    }
                  }
                  *(float *)((long)&local_1d0->_vptr_Allocator + uVar77 * 4) = fVar82;
                  uVar77 = uVar77 + 1;
                  local_230 = local_230 + 1;
                } while (uVar77 != uVar59);
              }
              local_1d0 = (Allocator *)((long)&local_1d0->_vptr_Allocator + lVar70 * 4);
              iVar58 = iVar58 + 1;
            } while (iVar58 != iVar14);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 < *(int *)(&this->field_0xd0 + (long)pp_Var21[-3]));
      }
    }
    pMVar47 = local_128;
    Deconvolution::cut_padding
              ((Deconvolution *)
               ((long)&this->_vptr_Deconvolution_x86_fma +
               (long)this->_vptr_Deconvolution_x86_fma[-3]),&local_1a8,local_128,local_140);
    iVar58 = -100;
    if ((pMVar47->data != (void *)0x0) && (iVar58 = -100, (long)pMVar47->c * pMVar47->cstep != 0)) {
      iVar58 = 0;
    }
  }
  piVar20 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar58;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}